

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<4,4>::
     intersect_t<embree::avx::SweepCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::avx::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  undefined4 uVar8;
  undefined8 uVar9;
  Primitive PVar10;
  Geometry *pGVar11;
  __int_type_conflict _Var12;
  long lVar13;
  long lVar14;
  RTCFilterFunctionN p_Var15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  uint uVar81;
  uint uVar82;
  ulong uVar83;
  undefined1 (*pauVar84) [32];
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  uint uVar88;
  long lVar89;
  long lVar90;
  float fVar91;
  float fVar117;
  float fVar118;
  vint4 bi_1;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  float fVar119;
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar96 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar116 [32];
  float fVar120;
  undefined8 extraout_XMM1_Qa;
  float fVar150;
  vint4 bi;
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar121;
  float fVar122;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined8 extraout_XMM1_Qa_00;
  undefined1 auVar146 [32];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  float fVar155;
  float fVar173;
  float fVar174;
  vint4 bi_2;
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  float fVar176;
  float fVar177;
  float fVar178;
  undefined1 auVar164 [32];
  float fVar175;
  float fVar179;
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar160 [16];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  float fVar180;
  float fVar201;
  float fVar202;
  vint4 ai_1;
  undefined1 auVar181 [16];
  float fVar203;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  float fVar204;
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar205;
  float fVar223;
  float fVar224;
  vint4 ai_2;
  undefined1 auVar206 [16];
  float fVar225;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [28];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar226;
  float fVar227;
  float fVar237;
  float fVar239;
  undefined1 auVar228 [16];
  float fVar241;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar238;
  float fVar240;
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  float fVar246;
  float fVar259;
  float fVar260;
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  float fVar263;
  float fVar265;
  float fVar267;
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  float fVar261;
  float fVar262;
  float fVar264;
  float fVar266;
  float fVar268;
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  float fVar269;
  float fVar283;
  float fVar286;
  vint4 ai;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  float fVar270;
  float fVar271;
  float fVar284;
  float fVar285;
  float fVar287;
  float fVar288;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar306;
  float fVar307;
  undefined1 auVar277 [32];
  float fVar289;
  float fVar293;
  float fVar297;
  float fVar301;
  float fVar305;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  float fVar308;
  float fVar309;
  float fVar315;
  float fVar316;
  float fVar317;
  float fVar318;
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar324;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar313 [64];
  undefined1 auVar314 [64];
  float s;
  float fVar328;
  float fVar329;
  float fVar332;
  float fVar334;
  undefined1 auVar330 [16];
  float fVar333;
  float fVar335;
  float fVar336;
  float fVar337;
  float fVar338;
  float fVar339;
  float fVar340;
  float fVar341;
  float fVar342;
  float fVar343;
  float fVar344;
  float fVar345;
  undefined1 auVar331 [32];
  float fVar346;
  float fVar354;
  undefined1 auVar347 [16];
  float fVar355;
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [64];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  float fVar362;
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [64];
  float fVar363;
  float fVar364;
  float fVar365;
  float fVar368;
  float fVar369;
  float fVar370;
  float fVar371;
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  float fVar382;
  float fVar391;
  float fVar393;
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  float fVar396;
  float fVar399;
  float fVar401;
  float fVar404;
  undefined1 auVar385 [32];
  float fVar392;
  float fVar394;
  float fVar397;
  float fVar400;
  float fVar402;
  float fVar405;
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  undefined1 auVar388 [32];
  float fVar395;
  float fVar398;
  float fVar403;
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar406 [16];
  undefined1 auVar407 [32];
  undefined1 auVar408 [32];
  undefined1 auVar409 [64];
  undefined1 auVar410 [32];
  undefined1 auVar411 [32];
  undefined1 auVar412 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  uint local_c28;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined4 uStack_b70;
  undefined4 uStack_b6c;
  undefined4 uStack_b68;
  undefined4 uStack_b64;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a40;
  float fStack_a3c;
  float fStack_a38;
  float fStack_a34;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  RTCFilterFunctionNArguments local_a10;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  float fStack_9a4;
  undefined1 (*local_988) [16];
  undefined1 local_980 [32];
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float fStack_948;
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  undefined1 local_910 [8];
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  float local_8e0;
  float fStack_8dc;
  float fStack_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float fStack_8c8;
  float fStack_8c4;
  ulong local_8c0;
  undefined1 auStack_8b8 [24];
  undefined1 local_8a0 [32];
  undefined1 local_870 [16];
  undefined1 local_860 [16];
  Primitive *local_848;
  undefined1 local_840 [8];
  float fStack_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float fStack_828;
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [8];
  float fStack_7b8;
  float fStack_7b4;
  float fStack_7b0;
  float fStack_7ac;
  float fStack_7a8;
  float fStack_7a4;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  undefined4 uStack_784;
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [16];
  undefined1 local_710 [16];
  RTCHitN local_700 [16];
  undefined1 auStack_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [16];
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  uint local_690;
  uint uStack_68c;
  uint uStack_688;
  uint uStack_684;
  undefined1 auStack_680 [16];
  undefined1 local_660 [8];
  float fStack_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float fStack_648;
  float fStack_644;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  undefined4 uStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  float local_4e0;
  float fStack_4dc;
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  undefined1 local_380 [8];
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  
  PVar10 = prim[1];
  uVar83 = (ulong)(byte)PVar10;
  lVar90 = uVar83 * 0x25;
  fVar120 = *(float *)(prim + lVar90 + 0x12);
  auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x10);
  auVar248 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar16 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar16 = vinsertps_avx(auVar16,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar248 = vsubps_avx(auVar248,*(undefined1 (*) [16])(prim + lVar90 + 6));
  auVar123._0_4_ = fVar120 * auVar248._0_4_;
  auVar123._4_4_ = fVar120 * auVar248._4_4_;
  auVar123._8_4_ = fVar120 * auVar248._8_4_;
  auVar123._12_4_ = fVar120 * auVar248._12_4_;
  auVar272._0_4_ = fVar120 * auVar16._0_4_;
  auVar272._4_4_ = fVar120 * auVar16._4_4_;
  auVar272._8_4_ = fVar120 * auVar16._8_4_;
  auVar272._12_4_ = fVar120 * auVar16._12_4_;
  auVar248 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 4 + 6)));
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 5 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 6 + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar127 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0xf + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + 6)));
  auVar127 = vcvtdq2ps_avx(auVar127);
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar10 * 0x10 + uVar83 + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1a + 6)));
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1b + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar193 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar83 * 0x1c + 6)));
  auVar193 = vcvtdq2ps_avx(auVar193);
  auVar190 = vshufps_avx(auVar272,auVar272,0);
  auVar133 = vshufps_avx(auVar272,auVar272,0x55);
  auVar101 = vshufps_avx(auVar272,auVar272,0xaa);
  fVar120 = auVar101._0_4_;
  fVar122 = auVar101._4_4_;
  fVar148 = auVar101._8_4_;
  fVar151 = auVar101._12_4_;
  fVar205 = auVar133._0_4_;
  fVar223 = auVar133._4_4_;
  fVar224 = auVar133._8_4_;
  fVar225 = auVar133._12_4_;
  fVar180 = auVar190._0_4_;
  fVar201 = auVar190._4_4_;
  fVar202 = auVar190._8_4_;
  fVar203 = auVar190._12_4_;
  auVar366._0_4_ = fVar180 * auVar248._0_4_ + fVar205 * auVar16._0_4_ + fVar120 * auVar17._0_4_;
  auVar366._4_4_ = fVar201 * auVar248._4_4_ + fVar223 * auVar16._4_4_ + fVar122 * auVar17._4_4_;
  auVar366._8_4_ = fVar202 * auVar248._8_4_ + fVar224 * auVar16._8_4_ + fVar148 * auVar17._8_4_;
  auVar366._12_4_ = fVar203 * auVar248._12_4_ + fVar225 * auVar16._12_4_ + fVar151 * auVar17._12_4_;
  auVar383._0_4_ = fVar180 * auVar127._0_4_ + fVar205 * auVar18._0_4_ + auVar19._0_4_ * fVar120;
  auVar383._4_4_ = fVar201 * auVar127._4_4_ + fVar223 * auVar18._4_4_ + auVar19._4_4_ * fVar122;
  auVar383._8_4_ = fVar202 * auVar127._8_4_ + fVar224 * auVar18._8_4_ + auVar19._8_4_ * fVar148;
  auVar383._12_4_ = fVar203 * auVar127._12_4_ + fVar225 * auVar18._12_4_ + auVar19._12_4_ * fVar151;
  auVar273._0_4_ = fVar180 * auVar20._0_4_ + fVar205 * auVar21._0_4_ + auVar193._0_4_ * fVar120;
  auVar273._4_4_ = fVar201 * auVar20._4_4_ + fVar223 * auVar21._4_4_ + auVar193._4_4_ * fVar122;
  auVar273._8_4_ = fVar202 * auVar20._8_4_ + fVar224 * auVar21._8_4_ + auVar193._8_4_ * fVar148;
  auVar273._12_4_ = fVar203 * auVar20._12_4_ + fVar225 * auVar21._12_4_ + auVar193._12_4_ * fVar151;
  auVar190 = vshufps_avx(auVar123,auVar123,0);
  auVar133 = vshufps_avx(auVar123,auVar123,0x55);
  auVar101 = vshufps_avx(auVar123,auVar123,0xaa);
  fVar120 = auVar101._0_4_;
  fVar122 = auVar101._4_4_;
  fVar148 = auVar101._8_4_;
  fVar151 = auVar101._12_4_;
  fVar205 = auVar133._0_4_;
  fVar223 = auVar133._4_4_;
  fVar224 = auVar133._8_4_;
  fVar225 = auVar133._12_4_;
  fVar180 = auVar190._0_4_;
  fVar201 = auVar190._4_4_;
  fVar202 = auVar190._8_4_;
  fVar203 = auVar190._12_4_;
  auVar124._0_4_ = fVar180 * auVar248._0_4_ + fVar205 * auVar16._0_4_ + fVar120 * auVar17._0_4_;
  auVar124._4_4_ = fVar201 * auVar248._4_4_ + fVar223 * auVar16._4_4_ + fVar122 * auVar17._4_4_;
  auVar124._8_4_ = fVar202 * auVar248._8_4_ + fVar224 * auVar16._8_4_ + fVar148 * auVar17._8_4_;
  auVar124._12_4_ = fVar203 * auVar248._12_4_ + fVar225 * auVar16._12_4_ + fVar151 * auVar17._12_4_;
  auVar92._0_4_ = fVar180 * auVar127._0_4_ + auVar19._0_4_ * fVar120 + fVar205 * auVar18._0_4_;
  auVar92._4_4_ = fVar201 * auVar127._4_4_ + auVar19._4_4_ * fVar122 + fVar223 * auVar18._4_4_;
  auVar92._8_4_ = fVar202 * auVar127._8_4_ + auVar19._8_4_ * fVar148 + fVar224 * auVar18._8_4_;
  auVar92._12_4_ = fVar203 * auVar127._12_4_ + auVar19._12_4_ * fVar151 + fVar225 * auVar18._12_4_;
  auVar310._8_4_ = 0x7fffffff;
  auVar310._0_8_ = 0x7fffffff7fffffff;
  auVar310._12_4_ = 0x7fffffff;
  auVar248 = vandps_avx(auVar366,auVar310);
  auVar206._8_4_ = 0x219392ef;
  auVar206._0_8_ = 0x219392ef219392ef;
  auVar206._12_4_ = 0x219392ef;
  auVar248 = vcmpps_avx(auVar248,auVar206,1);
  auVar16 = vblendvps_avx(auVar366,auVar206,auVar248);
  auVar248 = vandps_avx(auVar383,auVar310);
  auVar248 = vcmpps_avx(auVar248,auVar206,1);
  auVar17 = vblendvps_avx(auVar383,auVar206,auVar248);
  auVar248 = vandps_avx(auVar310,auVar273);
  auVar248 = vcmpps_avx(auVar248,auVar206,1);
  auVar248 = vblendvps_avx(auVar273,auVar206,auVar248);
  auVar103._0_4_ = fVar180 * auVar20._0_4_ + fVar205 * auVar21._0_4_ + auVar193._0_4_ * fVar120;
  auVar103._4_4_ = fVar201 * auVar20._4_4_ + fVar223 * auVar21._4_4_ + auVar193._4_4_ * fVar122;
  auVar103._8_4_ = fVar202 * auVar20._8_4_ + fVar224 * auVar21._8_4_ + auVar193._8_4_ * fVar148;
  auVar103._12_4_ = fVar203 * auVar20._12_4_ + fVar225 * auVar21._12_4_ + auVar193._12_4_ * fVar151;
  auVar127 = vrcpps_avx(auVar16);
  fVar180 = auVar127._0_4_;
  auVar181._0_4_ = fVar180 * auVar16._0_4_;
  fVar201 = auVar127._4_4_;
  auVar181._4_4_ = fVar201 * auVar16._4_4_;
  fVar202 = auVar127._8_4_;
  auVar181._8_4_ = fVar202 * auVar16._8_4_;
  fVar203 = auVar127._12_4_;
  auVar181._12_4_ = fVar203 * auVar16._12_4_;
  auVar247._8_4_ = 0x3f800000;
  auVar247._0_8_ = 0x3f8000003f800000;
  auVar247._12_4_ = 0x3f800000;
  auVar16 = vsubps_avx(auVar247,auVar181);
  fVar180 = fVar180 + fVar180 * auVar16._0_4_;
  fVar201 = fVar201 + fVar201 * auVar16._4_4_;
  fVar202 = fVar202 + fVar202 * auVar16._8_4_;
  fVar203 = fVar203 + fVar203 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar17);
  fVar205 = auVar16._0_4_;
  auVar228._0_4_ = fVar205 * auVar17._0_4_;
  fVar223 = auVar16._4_4_;
  auVar228._4_4_ = fVar223 * auVar17._4_4_;
  fVar224 = auVar16._8_4_;
  auVar228._8_4_ = fVar224 * auVar17._8_4_;
  fVar225 = auVar16._12_4_;
  auVar228._12_4_ = fVar225 * auVar17._12_4_;
  auVar16 = vsubps_avx(auVar247,auVar228);
  fVar205 = fVar205 + fVar205 * auVar16._0_4_;
  fVar223 = fVar223 + fVar223 * auVar16._4_4_;
  fVar224 = fVar224 + fVar224 * auVar16._8_4_;
  fVar225 = fVar225 + fVar225 * auVar16._12_4_;
  auVar16 = vrcpps_avx(auVar248);
  fVar226 = auVar16._0_4_;
  auVar274._0_4_ = fVar226 * auVar248._0_4_;
  fVar237 = auVar16._4_4_;
  auVar274._4_4_ = fVar237 * auVar248._4_4_;
  fVar239 = auVar16._8_4_;
  auVar274._8_4_ = fVar239 * auVar248._8_4_;
  fVar241 = auVar16._12_4_;
  auVar274._12_4_ = fVar241 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar247,auVar274);
  fVar226 = fVar226 + fVar226 * auVar248._0_4_;
  fVar237 = fVar237 + fVar237 * auVar248._4_4_;
  fVar239 = fVar239 + fVar239 * auVar248._8_4_;
  fVar241 = fVar241 + fVar241 * auVar248._12_4_;
  auVar248 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar90 + 0x16)) *
                           *(float *)(prim + lVar90 + 0x1a)));
  auVar17 = vshufps_avx(auVar248,auVar248,0);
  auVar248._8_8_ = 0;
  auVar248._0_8_ = *(ulong *)(prim + uVar83 * 7 + 6);
  auVar248 = vpmovsxwd_avx(auVar248);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar83 * 0xb + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar127 = vsubps_avx(auVar16,auVar248);
  fVar120 = auVar17._0_4_;
  fVar122 = auVar17._4_4_;
  fVar148 = auVar17._8_4_;
  fVar151 = auVar17._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar83 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar17);
  auVar275._0_4_ = auVar127._0_4_ * fVar120 + auVar248._0_4_;
  auVar275._4_4_ = auVar127._4_4_ * fVar122 + auVar248._4_4_;
  auVar275._8_4_ = auVar127._8_4_ * fVar148 + auVar248._8_4_;
  auVar275._12_4_ = auVar127._12_4_ * fVar151 + auVar248._12_4_;
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar83 * 0xd + 6);
  auVar17 = vpmovsxwd_avx(auVar127);
  auVar248 = vcvtdq2ps_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar17);
  auVar16 = vsubps_avx(auVar16,auVar248);
  auVar311._0_4_ = auVar16._0_4_ * fVar120 + auVar248._0_4_;
  auVar311._4_4_ = auVar16._4_4_ * fVar122 + auVar248._4_4_;
  auVar311._8_4_ = auVar16._8_4_ * fVar148 + auVar248._8_4_;
  auVar311._12_4_ = auVar16._12_4_ * fVar151 + auVar248._12_4_;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar83 * 0x12 + 6);
  auVar248 = vpmovsxwd_avx(auVar18);
  uVar87 = (ulong)(uint)((int)(uVar83 * 5) << 2);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar83 * 2 + uVar87 + 6);
  auVar16 = vpmovsxwd_avx(auVar19);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar248);
  auVar330._0_4_ = auVar16._0_4_ * fVar120 + auVar248._0_4_;
  auVar330._4_4_ = auVar16._4_4_ * fVar122 + auVar248._4_4_;
  auVar330._8_4_ = auVar16._8_4_ * fVar148 + auVar248._8_4_;
  auVar330._12_4_ = auVar16._12_4_ * fVar151 + auVar248._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar87 + 6);
  auVar248 = vpmovsxwd_avx(auVar20);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar83 * 0x18 + 6);
  auVar16 = vpmovsxwd_avx(auVar21);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vsubps_avx(auVar16,auVar248);
  auVar193._8_8_ = 0;
  auVar193._0_8_ = *(ulong *)(prim + uVar83 * 0x1d + 6);
  auVar16 = vpmovsxwd_avx(auVar193);
  auVar347._0_4_ = auVar17._0_4_ * fVar120 + auVar248._0_4_;
  auVar347._4_4_ = auVar17._4_4_ * fVar122 + auVar248._4_4_;
  auVar347._8_4_ = auVar17._8_4_ * fVar148 + auVar248._8_4_;
  auVar347._12_4_ = auVar17._12_4_ * fVar151 + auVar248._12_4_;
  auVar248 = vcvtdq2ps_avx(auVar16);
  auVar190._8_8_ = 0;
  auVar190._0_8_ = *(ulong *)(prim + uVar83 + (ulong)(byte)PVar10 * 0x20 + 6);
  auVar16 = vpmovsxwd_avx(auVar190);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar248);
  auVar356._0_4_ = auVar16._0_4_ * fVar120 + auVar248._0_4_;
  auVar356._4_4_ = auVar16._4_4_ * fVar122 + auVar248._4_4_;
  auVar356._8_4_ = auVar16._8_4_ * fVar148 + auVar248._8_4_;
  auVar356._12_4_ = auVar16._12_4_ * fVar151 + auVar248._12_4_;
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar10 * 0x20 - uVar83) + 6);
  auVar248 = vpmovsxwd_avx(auVar133);
  auVar248 = vcvtdq2ps_avx(auVar248);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar83 * 0x23 + 6);
  auVar16 = vpmovsxwd_avx(auVar101);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar248);
  auVar249._0_4_ = auVar248._0_4_ + auVar16._0_4_ * fVar120;
  auVar249._4_4_ = auVar248._4_4_ + auVar16._4_4_ * fVar122;
  auVar249._8_4_ = auVar248._8_4_ + auVar16._8_4_ * fVar148;
  auVar249._12_4_ = auVar248._12_4_ + auVar16._12_4_ * fVar151;
  auVar248 = vsubps_avx(auVar275,auVar124);
  auVar276._0_4_ = fVar180 * auVar248._0_4_;
  auVar276._4_4_ = fVar201 * auVar248._4_4_;
  auVar276._8_4_ = fVar202 * auVar248._8_4_;
  auVar276._12_4_ = fVar203 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar311,auVar124);
  auVar125._0_4_ = fVar180 * auVar248._0_4_;
  auVar125._4_4_ = fVar201 * auVar248._4_4_;
  auVar125._8_4_ = fVar202 * auVar248._8_4_;
  auVar125._12_4_ = fVar203 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar330,auVar92);
  auVar182._0_4_ = fVar205 * auVar248._0_4_;
  auVar182._4_4_ = fVar223 * auVar248._4_4_;
  auVar182._8_4_ = fVar224 * auVar248._8_4_;
  auVar182._12_4_ = fVar225 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar347,auVar92);
  auVar93._0_4_ = fVar205 * auVar248._0_4_;
  auVar93._4_4_ = fVar223 * auVar248._4_4_;
  auVar93._8_4_ = fVar224 * auVar248._8_4_;
  auVar93._12_4_ = fVar225 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar356,auVar103);
  auVar207._0_4_ = fVar226 * auVar248._0_4_;
  auVar207._4_4_ = fVar237 * auVar248._4_4_;
  auVar207._8_4_ = fVar239 * auVar248._8_4_;
  auVar207._12_4_ = fVar241 * auVar248._12_4_;
  auVar248 = vsubps_avx(auVar249,auVar103);
  auVar156._0_4_ = fVar226 * auVar248._0_4_;
  auVar156._4_4_ = fVar237 * auVar248._4_4_;
  auVar156._8_4_ = fVar239 * auVar248._8_4_;
  auVar156._12_4_ = fVar241 * auVar248._12_4_;
  auVar248 = vpminsd_avx(auVar276,auVar125);
  auVar16 = vpminsd_avx(auVar182,auVar93);
  auVar248 = vmaxps_avx(auVar248,auVar16);
  auVar16 = vpminsd_avx(auVar207,auVar156);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar312._4_4_ = uVar8;
  auVar312._0_4_ = uVar8;
  auVar312._8_4_ = uVar8;
  auVar312._12_4_ = uVar8;
  auVar16 = vmaxps_avx(auVar16,auVar312);
  auVar248 = vmaxps_avx(auVar248,auVar16);
  local_500._0_4_ = auVar248._0_4_ * 0.99999964;
  local_500._4_4_ = auVar248._4_4_ * 0.99999964;
  local_500._8_4_ = auVar248._8_4_ * 0.99999964;
  local_500._12_4_ = auVar248._12_4_ * 0.99999964;
  auVar248 = vpmaxsd_avx(auVar276,auVar125);
  auVar16 = vpmaxsd_avx(auVar182,auVar93);
  auVar248 = vminps_avx(auVar248,auVar16);
  auVar16 = vpmaxsd_avx(auVar207,auVar156);
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = uVar8;
  auVar157._0_4_ = uVar8;
  auVar157._8_4_ = uVar8;
  auVar157._12_4_ = uVar8;
  auVar16 = vminps_avx(auVar16,auVar157);
  auVar248 = vminps_avx(auVar248,auVar16);
  auVar94._0_4_ = auVar248._0_4_ * 1.0000004;
  auVar94._4_4_ = auVar248._4_4_ * 1.0000004;
  auVar94._8_4_ = auVar248._8_4_ * 1.0000004;
  auVar94._12_4_ = auVar248._12_4_ * 1.0000004;
  auVar248 = vpshufd_avx(ZEXT116((byte)PVar10),0);
  auVar16 = vpcmpgtd_avx(auVar248,_DAT_01f7fcf0);
  auVar248 = vcmpps_avx(local_500,auVar94,2);
  auVar248 = vandps_avx(auVar248,auVar16);
  uVar81 = vmovmskps_avx(auVar248);
  if (uVar81 == 0) {
    return;
  }
  uVar81 = uVar81 & 0xff;
  auVar106._16_16_ = mm_lookupmask_ps._240_16_;
  auVar106._0_16_ = mm_lookupmask_ps._240_16_;
  local_480 = vblendps_avx(auVar106,ZEXT832(0) << 0x20,0x80);
  local_988 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_848 = prim;
LAB_00f9576f:
  lVar90 = 0;
  if (uVar81 != 0) {
    for (; (uVar81 >> lVar90 & 1) == 0; lVar90 = lVar90 + 1) {
    }
  }
  uVar86 = *(uint *)(local_848 + 2);
  local_8c0 = (ulong)*(uint *)(local_848 + lVar90 * 4 + 6);
  pGVar11 = (context->scene->geometries).items[uVar86].ptr;
  uVar83 = (ulong)*(uint *)(*(long *)&pGVar11->field_0x58 +
                           local_8c0 *
                           pGVar11[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar120 = (pGVar11->time_range).lower;
  fVar120 = pGVar11->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar120) / ((pGVar11->time_range).upper - fVar120));
  auVar248 = vroundss_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),9);
  auVar248 = vminss_avx(auVar248,ZEXT416((uint)(pGVar11->fnumTimeSegments + -1.0)));
  auVar248 = vmaxss_avx(ZEXT816(0) << 0x20,auVar248);
  fVar120 = fVar120 - auVar248._0_4_;
  _Var12 = pGVar11[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar248._0_4_ * 0x38;
  lVar13 = *(long *)(_Var12 + lVar89);
  lVar14 = *(long *)(_Var12 + 0x10 + lVar89);
  auVar248 = vshufps_avx(ZEXT416((uint)(1.0 - fVar120)),ZEXT416((uint)(1.0 - fVar120)),0);
  pfVar1 = (float *)(lVar13 + lVar14 * uVar83);
  fVar180 = auVar248._0_4_;
  fVar201 = auVar248._4_4_;
  fVar202 = auVar248._8_4_;
  fVar203 = auVar248._12_4_;
  pfVar2 = (float *)(lVar13 + lVar14 * (uVar83 + 1));
  pfVar3 = (float *)(lVar13 + lVar14 * (uVar83 + 2));
  pfVar4 = (float *)(lVar13 + lVar14 * (uVar83 + 3));
  lVar13 = *(long *)(_Var12 + 0x38 + lVar89);
  lVar14 = *(long *)(_Var12 + 0x48 + lVar89);
  auVar248 = vshufps_avx(ZEXT416((uint)fVar120),ZEXT416((uint)fVar120),0);
  pfVar5 = (float *)(lVar13 + uVar83 * lVar14);
  fVar205 = auVar248._0_4_;
  fVar223 = auVar248._4_4_;
  fVar224 = auVar248._8_4_;
  fVar225 = auVar248._12_4_;
  pfVar6 = (float *)(lVar13 + (uVar83 + 1) * lVar14);
  pfVar7 = (float *)(lVar13 + (uVar83 + 2) * lVar14);
  auVar208._0_4_ = fVar205 * *pfVar5 + fVar180 * *pfVar1;
  auVar208._4_4_ = fVar223 * pfVar5[1] + fVar201 * pfVar1[1];
  auVar208._8_4_ = fVar224 * pfVar5[2] + fVar202 * pfVar1[2];
  auVar208._12_4_ = fVar225 * pfVar5[3] + fVar203 * pfVar1[3];
  auVar248 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar16 = vinsertps_avx(auVar248,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar313 = ZEXT1664(auVar16);
  fVar120 = *(float *)(ray + k * 4 + 0x40);
  auVar367._4_4_ = fVar120;
  auVar367._0_4_ = fVar120;
  auVar367._8_4_ = fVar120;
  auVar367._12_4_ = fVar120;
  fStack_7b0 = fVar120;
  _local_7c0 = auVar367;
  fStack_7ac = fVar120;
  fStack_7a8 = fVar120;
  fStack_7a4 = fVar120;
  fVar122 = *(float *)(ray + k * 4 + 0x50);
  auVar384._4_4_ = fVar122;
  auVar384._0_4_ = fVar122;
  auVar384._8_4_ = fVar122;
  auVar384._12_4_ = fVar122;
  fStack_7d0 = fVar122;
  _local_7e0 = auVar384;
  fStack_7cc = fVar122;
  fStack_7c8 = fVar122;
  fStack_7c4 = fVar122;
  auVar229._0_4_ = fVar180 * *pfVar2 + fVar205 * *pfVar6;
  auVar229._4_4_ = fVar201 * pfVar2[1] + fVar223 * pfVar6[1];
  auVar229._8_4_ = fVar202 * pfVar2[2] + fVar224 * pfVar6[2];
  auVar229._12_4_ = fVar203 * pfVar2[3] + fVar225 * pfVar6[3];
  auVar248 = vunpcklps_avx(auVar367,auVar384);
  fVar148 = *(float *)(ray + k * 4 + 0x60);
  auVar406._4_4_ = fVar148;
  auVar406._0_4_ = fVar148;
  auVar406._8_4_ = fVar148;
  auVar406._12_4_ = fVar148;
  fStack_790 = fVar148;
  _local_7a0 = auVar406;
  fStack_78c = fVar148;
  fStack_788 = fVar148;
  uStack_784 = fVar148;
  _local_910 = vinsertps_avx(auVar248,auVar406,0x28);
  auVar353 = ZEXT1664(_local_910);
  auVar95._0_4_ = (auVar208._0_4_ + auVar229._0_4_) * 0.5;
  auVar95._4_4_ = (auVar208._4_4_ + auVar229._4_4_) * 0.5;
  auVar95._8_4_ = (auVar208._8_4_ + auVar229._8_4_) * 0.5;
  auVar95._12_4_ = (auVar208._12_4_ + auVar229._12_4_) * 0.5;
  auVar248 = vsubps_avx(auVar95,auVar16);
  auVar248 = vdpps_avx(auVar248,_local_910,0x7f);
  local_920 = vdpps_avx(_local_910,_local_910,0x7f);
  auVar361 = ZEXT1664(local_920);
  auVar183._0_4_ = fVar180 * *pfVar3 + fVar205 * *pfVar7;
  auVar183._4_4_ = fVar201 * pfVar3[1] + fVar223 * pfVar7[1];
  auVar183._8_4_ = fVar202 * pfVar3[2] + fVar224 * pfVar7[2];
  auVar183._12_4_ = fVar203 * pfVar3[3] + fVar225 * pfVar7[3];
  auVar17 = vrcpss_avx(local_920,local_920);
  fVar151 = auVar248._0_4_ * auVar17._0_4_ * (2.0 - local_920._0_4_ * auVar17._0_4_);
  auVar17 = vshufps_avx(ZEXT416((uint)fVar151),ZEXT416((uint)fVar151),0);
  auVar250._0_4_ = auVar16._0_4_ + local_910._0_4_ * auVar17._0_4_;
  auVar250._4_4_ = auVar16._4_4_ + local_910._4_4_ * auVar17._4_4_;
  auVar250._8_4_ = auVar16._8_4_ + local_910._8_4_ * auVar17._8_4_;
  auVar250._12_4_ = auVar16._12_4_ + local_910._12_4_ * auVar17._12_4_;
  auVar248 = vblendps_avx(auVar250,_DAT_01f7aa10,8);
  auVar18 = vsubps_avx(auVar208,auVar248);
  auVar19 = vsubps_avx(auVar183,auVar248);
  pfVar1 = (float *)(lVar13 + lVar14 * (uVar83 + 3));
  auVar126._0_4_ = fVar180 * *pfVar4 + fVar205 * *pfVar1;
  auVar126._4_4_ = fVar201 * pfVar4[1] + fVar223 * pfVar1[1];
  auVar126._8_4_ = fVar202 * pfVar4[2] + fVar224 * pfVar1[2];
  auVar126._12_4_ = fVar203 * pfVar4[3] + fVar225 * pfVar1[3];
  auVar20 = vsubps_avx(auVar229,auVar248);
  auVar21 = vsubps_avx(auVar126,auVar248);
  auVar248 = vshufps_avx(auVar18,auVar18,0);
  register0x00001250 = auVar248;
  _local_380 = auVar248;
  auVar248 = vshufps_avx(auVar18,auVar18,0x55);
  register0x00001250 = auVar248;
  _local_1e0 = auVar248;
  auVar248 = vshufps_avx(auVar18,auVar18,0xaa);
  register0x00001250 = auVar248;
  _local_200 = auVar248;
  auVar248 = vshufps_avx(auVar18,auVar18,0xff);
  register0x00001290 = auVar248;
  _local_220 = auVar248;
  auVar248 = vshufps_avx(auVar20,auVar20,0);
  register0x00001290 = auVar248;
  _local_3a0 = auVar248;
  auVar248 = vshufps_avx(auVar20,auVar20,0x55);
  register0x00001290 = auVar248;
  _local_3c0 = auVar248;
  auVar248 = vshufps_avx(auVar20,auVar20,0xaa);
  register0x00001290 = auVar248;
  _local_3e0 = auVar248;
  auVar248 = vshufps_avx(auVar20,auVar20,0xff);
  register0x00001290 = auVar248;
  _local_240 = auVar248;
  auVar248 = vshufps_avx(auVar19,auVar19,0);
  auVar16 = vshufps_avx(auVar19,auVar19,0x55);
  register0x00001290 = auVar16;
  _local_400 = auVar16;
  auVar16 = vshufps_avx(auVar19,auVar19,0xaa);
  register0x00001290 = auVar16;
  _local_420 = auVar16;
  auVar16 = vshufps_avx(auVar19,auVar19,0xff);
  register0x00001290 = auVar16;
  _local_440 = auVar16;
  auVar16 = vshufps_avx(auVar21,auVar21,0);
  auVar127 = vshufps_avx(auVar21,auVar21,0x55);
  register0x00001590 = auVar127;
  _local_960 = auVar127;
  auVar409 = ZEXT3264(_local_960);
  auVar127 = vshufps_avx(auVar21,auVar21,0xaa);
  register0x00001290 = auVar127;
  _local_460 = auVar127;
  auVar127 = vshufps_avx(auVar21,auVar21,0xff);
  register0x00001290 = auVar127;
  _local_260 = auVar127;
  auVar127 = ZEXT416((uint)(fVar120 * fVar120 + fVar122 * fVar122 + fVar148 * fVar148));
  auVar127 = vshufps_avx(auVar127,auVar127,0);
  local_280._16_16_ = auVar127;
  local_280._0_16_ = auVar127;
  fVar120 = *(float *)(ray + k * 4 + 0x30);
  local_870 = ZEXT416((uint)fVar151);
  auVar127 = vshufps_avx(ZEXT416((uint)(fVar120 - fVar151)),ZEXT416((uint)(fVar120 - fVar151)),0);
  local_2a0._16_16_ = auVar127;
  local_2a0._0_16_ = auVar127;
  local_710 = vpshufd_avx(ZEXT416(uVar86),0);
  local_720 = vpshufd_avx(ZEXT416(*(uint *)(local_848 + lVar90 * 4 + 6)),0);
  register0x00001210 = auVar17;
  _local_9c0 = auVar17;
  uVar88 = 0;
  local_c28 = 1;
  auVar107._8_4_ = 0x7fffffff;
  auVar107._0_8_ = 0x7fffffff7fffffff;
  auVar107._12_4_ = 0x7fffffff;
  auVar107._16_4_ = 0x7fffffff;
  auVar107._20_4_ = 0x7fffffff;
  auVar107._24_4_ = 0x7fffffff;
  auVar107._28_4_ = 0x7fffffff;
  local_4a0 = vandps_avx(local_280,auVar107);
  auVar17 = vsqrtss_avx(local_920,local_920);
  auVar127 = vsqrtss_avx(local_920,local_920);
  local_4f0 = ZEXT816(0x3f80000000000000);
  do {
    auVar218._8_4_ = 0x3f800000;
    auVar218._0_8_ = 0x3f8000003f800000;
    auVar218._12_4_ = 0x3f800000;
    auVar218._16_4_ = 0x3f800000;
    auVar218._20_4_ = 0x3f800000;
    auVar218._24_4_ = 0x3f800000;
    auVar218._28_4_ = 0x3f800000;
    auVar193 = vmovshdup_avx(local_4f0);
    auVar133 = vsubps_avx(auVar193,local_4f0);
    auVar193 = vshufps_avx(local_4f0,local_4f0,0);
    local_760._16_16_ = auVar193;
    local_760._0_16_ = auVar193;
    auVar190 = vshufps_avx(auVar133,auVar133,0);
    local_780._16_16_ = auVar190;
    local_780._0_16_ = auVar190;
    fVar121 = auVar190._0_4_;
    fVar147 = auVar190._4_4_;
    fVar150 = auVar190._8_4_;
    fVar152 = auVar190._12_4_;
    fVar91 = auVar193._0_4_;
    auVar196._0_4_ = fVar91 + fVar121 * 0.0;
    fVar117 = auVar193._4_4_;
    auVar196._4_4_ = fVar117 + fVar147 * 0.14285715;
    fVar118 = auVar193._8_4_;
    auVar196._8_4_ = fVar118 + fVar150 * 0.2857143;
    fVar119 = auVar193._12_4_;
    auVar196._12_4_ = fVar119 + fVar152 * 0.42857146;
    auVar196._16_4_ = fVar91 + fVar121 * 0.5714286;
    auVar196._20_4_ = fVar117 + fVar147 * 0.71428573;
    auVar196._24_4_ = fVar118 + fVar150 * 0.8571429;
    auVar196._28_4_ = fVar119 + fVar152;
    auVar106 = vsubps_avx(auVar218,auVar196);
    auVar164._0_4_ = auVar196._0_4_ * auVar196._0_4_;
    auVar164._4_4_ = auVar196._4_4_ * auVar196._4_4_;
    auVar164._8_4_ = auVar196._8_4_ * auVar196._8_4_;
    auVar164._12_4_ = auVar196._12_4_ * auVar196._12_4_;
    auVar164._16_4_ = auVar196._16_4_ * auVar196._16_4_;
    auVar164._20_4_ = auVar196._20_4_ * auVar196._20_4_;
    auVar164._24_4_ = auVar196._24_4_ * auVar196._24_4_;
    auVar164._28_4_ = 0;
    fVar205 = auVar196._0_4_ * 3.0;
    fVar223 = auVar196._4_4_ * 3.0;
    fVar224 = auVar196._8_4_ * 3.0;
    fVar226 = auVar196._12_4_ * 3.0;
    fVar237 = auVar196._16_4_ * 3.0;
    fVar239 = auVar196._20_4_ * 3.0;
    fVar241 = auVar196._24_4_ * 3.0;
    fVar122 = auVar106._0_4_;
    auVar314._0_4_ = fVar122 * fVar122;
    fVar148 = auVar106._4_4_;
    auVar314._4_4_ = fVar148 * fVar148;
    fVar151 = auVar106._8_4_;
    auVar314._8_4_ = fVar151 * fVar151;
    fVar180 = auVar106._12_4_;
    auVar314._12_4_ = fVar180 * fVar180;
    fVar201 = auVar106._16_4_;
    auVar314._16_4_ = fVar201 * fVar201;
    fVar202 = auVar106._20_4_;
    auVar314._20_4_ = fVar202 * fVar202;
    fVar203 = auVar106._24_4_;
    auVar314._28_36_ = auVar313._28_36_;
    auVar314._24_4_ = fVar203 * fVar203;
    fVar225 = auVar106._28_4_;
    fVar227 = (auVar314._0_4_ * (fVar122 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar238 = (auVar314._4_4_ * (fVar148 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar240 = (auVar314._8_4_ * (fVar151 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar242 = (auVar314._12_4_ * (fVar180 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar243 = (auVar314._16_4_ * (fVar201 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar244 = (auVar314._20_4_ * (fVar202 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar245 = (auVar314._24_4_ * (fVar203 * 3.0 + -5.0) + 2.0) * 0.5;
    fVar328 = -fVar122 * auVar196._0_4_ * auVar196._0_4_ * 0.5;
    fVar332 = -fVar148 * auVar196._4_4_ * auVar196._4_4_ * 0.5;
    fVar334 = -fVar151 * auVar196._8_4_ * auVar196._8_4_ * 0.5;
    fVar336 = -fVar180 * auVar196._12_4_ * auVar196._12_4_ * 0.5;
    fVar338 = -fVar201 * auVar196._16_4_ * auVar196._16_4_ * 0.5;
    fVar340 = -fVar202 * auVar196._20_4_ * auVar196._20_4_ * 0.5;
    fVar342 = -fVar203 * auVar196._24_4_ * auVar196._24_4_ * 0.5;
    fVar363 = auVar16._0_4_;
    fVar395 = auVar16._4_4_;
    fVar398 = auVar16._8_4_;
    fVar372 = auVar16._12_4_;
    fVar403 = auVar248._0_4_;
    fVar149 = auVar248._4_4_;
    fVar153 = auVar248._8_4_;
    fVar154 = auVar248._12_4_;
    fVar355 = auVar353._28_4_ + fVar154;
    fVar362 = auVar361._28_4_ + fVar154;
    fVar381 = (auVar164._0_4_ * (fVar205 + -5.0) + 2.0) * 0.5;
    fVar391 = (auVar164._4_4_ * (fVar223 + -5.0) + 2.0) * 0.5;
    fVar393 = (auVar164._8_4_ * (fVar224 + -5.0) + 2.0) * 0.5;
    fVar396 = (auVar164._12_4_ * (fVar226 + -5.0) + 2.0) * 0.5;
    fVar399 = (auVar164._16_4_ * (fVar237 + -5.0) + 2.0) * 0.5;
    fVar401 = (auVar164._20_4_ * (fVar239 + -5.0) + 2.0) * 0.5;
    fVar404 = (auVar164._24_4_ * (fVar241 + -5.0) + 2.0) * 0.5;
    fVar364 = -auVar196._0_4_ * fVar122 * fVar122 * 0.5;
    fVar368 = -auVar196._4_4_ * fVar148 * fVar148 * 0.5;
    fVar370 = -auVar196._8_4_ * fVar151 * fVar151 * 0.5;
    fVar373 = -auVar196._12_4_ * fVar180 * fVar180 * 0.5;
    fVar375 = -auVar196._16_4_ * fVar201 * fVar201 * 0.5;
    fVar377 = -auVar196._20_4_ * fVar202 * fVar202 * 0.5;
    fVar379 = -auVar196._24_4_ * fVar203 * fVar203 * 0.5;
    fVar329 = fVar364 * (float)local_380._0_4_ +
              fVar381 * (float)local_3a0._0_4_ + fVar363 * fVar328 + fVar403 * fVar227;
    fVar333 = fVar368 * (float)local_380._4_4_ +
              fVar391 * (float)local_3a0._4_4_ + fVar395 * fVar332 + fVar149 * fVar238;
    fVar335 = fVar370 * fStack_378 + fVar393 * fStack_398 + fVar398 * fVar334 + fVar153 * fVar240;
    fVar337 = fVar373 * fStack_374 + fVar396 * fStack_394 + fVar372 * fVar336 + fVar154 * fVar242;
    fVar339 = fVar375 * fStack_370 + fVar399 * fStack_390 + fVar363 * fVar338 + fVar403 * fVar243;
    fVar341 = fVar377 * fStack_36c + fVar401 * fStack_38c + fVar395 * fVar340 + fVar149 * fVar244;
    fVar343 = fVar379 * fStack_368 + fVar404 * fStack_388 + fVar398 * fVar342 + fVar153 * fVar245;
    fVar345 = fVar154 + 2.0 + -fVar225 + fVar355;
    fVar155 = (float)local_1e0._0_4_ * fVar364 +
              fVar381 * (float)local_3c0._0_4_ +
              auVar409._0_4_ * fVar328 + fVar227 * (float)local_400._0_4_;
    fVar173 = (float)local_1e0._4_4_ * fVar368 +
              fVar391 * (float)local_3c0._4_4_ +
              auVar409._4_4_ * fVar332 + fVar238 * (float)local_400._4_4_;
    fVar174 = fStack_1d8 * fVar370 +
              fVar393 * fStack_3b8 + auVar409._8_4_ * fVar334 + fVar240 * fStack_3f8;
    fVar175 = fStack_1d4 * fVar373 +
              fVar396 * fStack_3b4 + auVar409._12_4_ * fVar336 + fVar242 * fStack_3f4;
    fVar176 = fStack_1d0 * fVar375 +
              fVar399 * fStack_3b0 + auVar409._16_4_ * fVar338 + fVar243 * fStack_3f0;
    fVar177 = fStack_1cc * fVar377 +
              fVar401 * fStack_3ac + auVar409._20_4_ * fVar340 + fVar244 * fStack_3ec;
    fVar178 = fStack_1c8 * fVar379 +
              fVar404 * fStack_3a8 + auVar409._24_4_ * fVar342 + fVar245 * fStack_3e8;
    fVar179 = fVar345 + fVar355 + fVar362;
    local_8e0 = (float)local_200._0_4_ * fVar364 +
                fVar381 * (float)local_3e0._0_4_ +
                fVar328 * (float)local_460._0_4_ + fVar227 * (float)local_420._0_4_;
    fStack_8dc = (float)local_200._4_4_ * fVar368 +
                 fVar391 * (float)local_3e0._4_4_ +
                 fVar332 * (float)local_460._4_4_ + fVar238 * (float)local_420._4_4_;
    fStack_8d8 = fStack_1f8 * fVar370 +
                 fVar393 * fStack_3d8 + fVar334 * fStack_458 + fVar240 * fStack_418;
    fStack_8d4 = fStack_1f4 * fVar373 +
                 fVar396 * fStack_3d4 + fVar336 * fStack_454 + fVar242 * fStack_414;
    fStack_8d0 = fStack_1f0 * fVar375 +
                 fVar399 * fStack_3d0 + fVar338 * fStack_450 + fVar243 * fStack_410;
    fStack_8cc = fStack_1ec * fVar377 +
                 fVar401 * fStack_3cc + fVar340 * fStack_44c + fVar244 * fStack_40c;
    fStack_8c8 = fStack_1e8 * fVar379 +
                 fVar404 * fStack_3c8 + fVar342 * fStack_448 + fVar245 * fStack_408;
    fStack_8c4 = fVar345 + fVar362 + fVar372 + fVar154;
    auVar234._0_4_ =
         (float)local_220._0_4_ * fVar364 +
         (float)local_240._0_4_ * fVar381 +
         fVar328 * (float)local_260._0_4_ + fVar227 * (float)local_440._0_4_;
    auVar234._4_4_ =
         (float)local_220._4_4_ * fVar368 +
         (float)local_240._4_4_ * fVar391 +
         fVar332 * (float)local_260._4_4_ + fVar238 * (float)local_440._4_4_;
    auVar234._8_4_ =
         fStack_218 * fVar370 + fStack_238 * fVar393 + fVar334 * fStack_258 + fVar240 * fStack_438;
    auVar234._12_4_ =
         fStack_214 * fVar373 + fStack_234 * fVar396 + fVar336 * fStack_254 + fVar242 * fStack_434;
    auVar234._16_4_ =
         fStack_210 * fVar375 + fStack_230 * fVar399 + fVar338 * fStack_250 + fVar243 * fStack_430;
    auVar234._20_4_ =
         fStack_20c * fVar377 + fStack_22c * fVar401 + fVar340 * fStack_24c + fVar244 * fStack_42c;
    auVar234._24_4_ =
         fStack_208 * fVar379 + fStack_228 * fVar404 + fVar342 * fStack_248 + fVar245 * fStack_428;
    auVar234._28_4_ = fVar345 + fVar154 + 2.0 + -fVar225 + fVar119 + -5.0 + 2.0;
    fVar370 = auVar196._28_4_ + auVar196._28_4_;
    auVar26._4_4_ = (fVar148 + fVar148) * auVar196._4_4_;
    auVar26._0_4_ = (fVar122 + fVar122) * auVar196._0_4_;
    auVar26._8_4_ = (fVar151 + fVar151) * auVar196._8_4_;
    auVar26._12_4_ = (fVar180 + fVar180) * auVar196._12_4_;
    auVar26._16_4_ = (fVar201 + fVar201) * auVar196._16_4_;
    auVar26._20_4_ = (fVar202 + fVar202) * auVar196._20_4_;
    auVar26._24_4_ = (fVar203 + fVar203) * auVar196._24_4_;
    auVar26._28_4_ = fVar370;
    auVar106 = vsubps_avx(auVar26,auVar314._0_32_);
    auVar22._4_4_ = (fVar148 + fVar148) * (fVar223 + 2.0);
    auVar22._0_4_ = (fVar122 + fVar122) * (fVar205 + 2.0);
    auVar22._8_4_ = (fVar151 + fVar151) * (fVar224 + 2.0);
    auVar22._12_4_ = (fVar180 + fVar180) * (fVar226 + 2.0);
    auVar22._16_4_ = (fVar201 + fVar201) * (fVar237 + 2.0);
    auVar22._20_4_ = (fVar202 + fVar202) * (fVar239 + 2.0);
    auVar22._24_4_ = (fVar203 + fVar203) * (fVar241 + 2.0);
    auVar22._28_4_ = 0x40400000;
    auVar23._4_4_ = fVar148 * fVar148 * 3.0;
    auVar23._0_4_ = fVar122 * fVar122 * 3.0;
    auVar23._8_4_ = fVar151 * fVar151 * 3.0;
    auVar23._12_4_ = fVar180 * fVar180 * 3.0;
    auVar23._16_4_ = fVar201 * fVar201 * 3.0;
    auVar23._20_4_ = fVar202 * fVar202 * 3.0;
    auVar23._24_4_ = fVar203 * fVar203 * 3.0;
    auVar23._28_4_ = fVar225;
    auVar107 = vsubps_avx(auVar22,auVar23);
    auVar26 = vsubps_avx(auVar164,auVar26);
    fVar338 = auVar106._0_4_ * 0.5;
    fVar340 = auVar106._4_4_ * 0.5;
    fVar342 = auVar106._8_4_ * 0.5;
    fVar355 = auVar106._12_4_ * 0.5;
    fVar362 = auVar106._16_4_ * 0.5;
    fVar364 = auVar106._20_4_ * 0.5;
    fVar368 = auVar106._24_4_ * 0.5;
    fVar240 = (auVar196._0_4_ * fVar205 + (auVar196._0_4_ + auVar196._0_4_) * (fVar205 + -5.0)) *
              0.5;
    fVar244 = (auVar196._4_4_ * fVar223 + (auVar196._4_4_ + auVar196._4_4_) * (fVar223 + -5.0)) *
              0.5;
    fVar245 = (auVar196._8_4_ * fVar224 + (auVar196._8_4_ + auVar196._8_4_) * (fVar224 + -5.0)) *
              0.5;
    fVar328 = (auVar196._12_4_ * fVar226 + (auVar196._12_4_ + auVar196._12_4_) * (fVar226 + -5.0)) *
              0.5;
    fVar332 = (auVar196._16_4_ * fVar237 + (auVar196._16_4_ + auVar196._16_4_) * (fVar237 + -5.0)) *
              0.5;
    fVar334 = (auVar196._20_4_ * fVar239 + (auVar196._20_4_ + auVar196._20_4_) * (fVar239 + -5.0)) *
              0.5;
    fVar336 = (auVar196._24_4_ * fVar241 + (auVar196._24_4_ + auVar196._24_4_) * (fVar241 + -5.0)) *
              0.5;
    fVar122 = auVar107._0_4_ * 0.5;
    fVar148 = auVar107._4_4_ * 0.5;
    fVar151 = auVar107._8_4_ * 0.5;
    fVar180 = auVar107._12_4_ * 0.5;
    fVar205 = auVar107._16_4_ * 0.5;
    fVar223 = auVar107._20_4_ * 0.5;
    fVar224 = auVar107._24_4_ * 0.5;
    fVar202 = auVar26._0_4_ * 0.5;
    fVar237 = auVar26._4_4_ * 0.5;
    fVar239 = auVar26._8_4_ * 0.5;
    fVar241 = auVar26._12_4_ * 0.5;
    fVar227 = auVar26._16_4_ * 0.5;
    fVar242 = auVar26._20_4_ * 0.5;
    fVar243 = auVar26._24_4_ * 0.5;
    fVar327 = fVar225 + fVar225 + auVar106._28_4_;
    fVar306 = fVar327 + fVar225 + fVar225 + -4.0;
    auVar193 = vpermilps_avx(ZEXT416((uint)(auVar133._0_4_ * 0.04761905)),0);
    fVar201 = auVar193._0_4_;
    fVar269 = fVar201 * (fVar338 * (float)local_380._0_4_ +
                        fVar240 * (float)local_3a0._0_4_ + fVar122 * fVar403 + fVar202 * fVar363);
    fVar203 = auVar193._4_4_;
    fVar283 = fVar203 * (fVar340 * (float)local_380._4_4_ +
                        fVar244 * (float)local_3a0._4_4_ + fVar148 * fVar149 + fVar237 * fVar395);
    auVar32._4_4_ = fVar283;
    auVar32._0_4_ = fVar269;
    fVar226 = auVar193._8_4_;
    fVar286 = fVar226 * (fVar342 * fStack_378 +
                        fVar245 * fStack_398 + fVar151 * fVar153 + fVar239 * fVar398);
    auVar32._8_4_ = fVar286;
    fVar238 = auVar193._12_4_;
    fVar290 = fVar238 * (fVar355 * fStack_374 +
                        fVar328 * fStack_394 + fVar180 * fVar154 + fVar241 * fVar372);
    auVar32._12_4_ = fVar290;
    fVar294 = fVar201 * (fVar362 * fStack_370 +
                        fVar332 * fStack_390 + fVar205 * fVar403 + fVar227 * fVar363);
    auVar32._16_4_ = fVar294;
    fVar298 = fVar203 * (fVar364 * fStack_36c +
                        fVar334 * fStack_38c + fVar223 * fVar149 + fVar242 * fVar395);
    auVar32._20_4_ = fVar298;
    fVar302 = fVar226 * (fVar368 * fStack_368 +
                        fVar336 * fStack_388 + fVar224 * fVar153 + fVar243 * fVar398);
    auVar32._24_4_ = fVar302;
    auVar32._28_4_ = fVar306;
    fVar308 = fVar201 * ((float)local_1e0._0_4_ * fVar338 +
                        fVar240 * (float)local_3c0._0_4_ +
                        fVar122 * (float)local_400._0_4_ + fVar202 * (float)local_960._0_4_);
    fVar315 = fVar203 * ((float)local_1e0._4_4_ * fVar340 +
                        fVar244 * (float)local_3c0._4_4_ +
                        fVar148 * (float)local_400._4_4_ + fVar237 * (float)local_960._4_4_);
    auVar31._4_4_ = fVar315;
    auVar31._0_4_ = fVar308;
    fVar317 = fVar226 * (fStack_1d8 * fVar342 +
                        fVar245 * fStack_3b8 + fVar151 * fStack_3f8 + fVar239 * fStack_958);
    auVar31._8_4_ = fVar317;
    fVar319 = fVar238 * (fStack_1d4 * fVar355 +
                        fVar328 * fStack_3b4 + fVar180 * fStack_3f4 + fVar241 * fStack_954);
    auVar31._12_4_ = fVar319;
    fVar321 = fVar201 * (fStack_1d0 * fVar362 +
                        fVar332 * fStack_3b0 + fVar205 * fStack_3f0 + fVar227 * fStack_950);
    auVar31._16_4_ = fVar321;
    fVar323 = fVar203 * (fStack_1cc * fVar364 +
                        fVar334 * fStack_3ac + fVar223 * fStack_3ec + fVar242 * fStack_94c);
    auVar31._20_4_ = fVar323;
    fVar325 = fVar226 * (fStack_1c8 * fVar368 +
                        fVar336 * fStack_3a8 + fVar224 * fStack_3e8 + fVar243 * fStack_948);
    auVar31._24_4_ = fVar325;
    auVar31._28_4_ = fVar327;
    fVar365 = fVar201 * ((float)local_200._0_4_ * fVar338 +
                        fVar122 * (float)local_420._0_4_ + fVar202 * (float)local_460._0_4_ +
                        fVar240 * (float)local_3e0._0_4_);
    fVar369 = fVar203 * ((float)local_200._4_4_ * fVar340 +
                        fVar148 * (float)local_420._4_4_ + fVar237 * (float)local_460._4_4_ +
                        fVar244 * (float)local_3e0._4_4_);
    local_740._4_4_ = fVar369;
    local_740._0_4_ = fVar365;
    fVar371 = fVar226 * (fStack_1f8 * fVar342 +
                        fVar151 * fStack_418 + fVar239 * fStack_458 + fVar245 * fStack_3d8);
    local_740._8_4_ = fVar371;
    fVar374 = fVar238 * (fStack_1f4 * fVar355 +
                        fVar180 * fStack_414 + fVar241 * fStack_454 + fVar328 * fStack_3d4);
    local_740._12_4_ = fVar374;
    fVar376 = fVar201 * (fStack_1f0 * fVar362 +
                        fVar205 * fStack_410 + fVar227 * fStack_450 + fVar332 * fStack_3d0);
    local_740._16_4_ = fVar376;
    fVar378 = fVar203 * (fStack_1ec * fVar364 +
                        fVar223 * fStack_40c + fVar242 * fStack_44c + fVar334 * fStack_3cc);
    local_740._20_4_ = fVar378;
    fVar380 = fVar226 * (fStack_1e8 * fVar368 +
                        fVar224 * fStack_408 + fVar243 * fStack_448 + fVar336 * fStack_3c8);
    local_740._24_4_ = fVar380;
    local_740._28_4_ = -auVar196._28_4_;
    fVar202 = fVar201 * ((float)local_220._0_4_ * fVar338 +
                        (float)local_240._0_4_ * fVar240 +
                        fVar122 * (float)local_440._0_4_ + (float)local_260._0_4_ * fVar202);
    fVar225 = fVar203 * ((float)local_220._4_4_ * fVar340 +
                        (float)local_240._4_4_ * fVar244 +
                        fVar148 * (float)local_440._4_4_ + (float)local_260._4_4_ * fVar237);
    auVar24._4_4_ = fVar225;
    auVar24._0_4_ = fVar202;
    fVar237 = fVar226 * (fStack_218 * fVar342 +
                        fStack_238 * fVar245 + fVar151 * fStack_438 + fStack_258 * fVar239);
    auVar24._8_4_ = fVar237;
    fVar240 = fVar238 * (fStack_214 * fVar355 +
                        fStack_234 * fVar328 + fVar180 * fStack_434 + fStack_254 * fVar241);
    auVar24._12_4_ = fVar240;
    fVar201 = fVar201 * (fStack_210 * fVar362 +
                        fStack_230 * fVar332 + fVar205 * fStack_430 + fStack_250 * fVar227);
    auVar24._16_4_ = fVar201;
    fVar203 = fVar203 * (fStack_20c * fVar364 +
                        fStack_22c * fVar334 + fVar223 * fStack_42c + fStack_24c * fVar242);
    auVar24._20_4_ = fVar203;
    fVar226 = fVar226 * (fStack_208 * fVar368 +
                        fStack_228 * fVar336 + fVar224 * fStack_428 + fStack_248 * fVar243);
    auVar24._24_4_ = fVar226;
    auVar24._28_4_ = fVar238;
    auVar74._4_4_ = fVar173;
    auVar74._0_4_ = fVar155;
    auVar74._8_4_ = fVar174;
    auVar74._12_4_ = fVar175;
    auVar74._16_4_ = fVar176;
    auVar74._20_4_ = fVar177;
    auVar74._24_4_ = fVar178;
    auVar74._28_4_ = fVar179;
    auVar106 = vperm2f128_avx(auVar74,auVar74,1);
    auVar106 = vshufps_avx(auVar106,auVar74,0x30);
    auVar22 = vshufps_avx(auVar74,auVar106,0x29);
    auVar78._4_4_ = fStack_8dc;
    auVar78._0_4_ = local_8e0;
    auVar78._8_4_ = fStack_8d8;
    auVar78._12_4_ = fStack_8d4;
    auVar78._16_4_ = fStack_8d0;
    auVar78._20_4_ = fStack_8cc;
    auVar78._24_4_ = fStack_8c8;
    auVar78._28_4_ = fStack_8c4;
    auVar106 = vperm2f128_avx(auVar78,auVar78,1);
    auVar106 = vshufps_avx(auVar106,auVar78,0x30);
    local_980 = vshufps_avx(auVar78,auVar106,0x29);
    auVar107 = vsubps_avx(auVar234,auVar24);
    auVar106 = vperm2f128_avx(auVar107,auVar107,1);
    auVar106 = vshufps_avx(auVar106,auVar107,0x30);
    auVar23 = vshufps_avx(auVar107,auVar106,0x29);
    local_5c0 = vsubps_avx(auVar22,auVar74);
    local_5a0 = vsubps_avx(local_980,auVar78);
    fVar148 = local_5c0._0_4_;
    fVar205 = local_5c0._4_4_;
    auVar27._4_4_ = fVar369 * fVar205;
    auVar27._0_4_ = fVar365 * fVar148;
    fVar239 = local_5c0._8_4_;
    auVar27._8_4_ = fVar371 * fVar239;
    fVar243 = local_5c0._12_4_;
    auVar27._12_4_ = fVar374 * fVar243;
    fVar336 = local_5c0._16_4_;
    auVar27._16_4_ = fVar376 * fVar336;
    fVar364 = local_5c0._20_4_;
    auVar27._20_4_ = fVar378 * fVar364;
    fVar373 = local_5c0._24_4_;
    auVar27._24_4_ = fVar380 * fVar373;
    auVar27._28_4_ = auVar107._28_4_;
    fVar151 = local_5a0._0_4_;
    fVar223 = local_5a0._4_4_;
    auVar28._4_4_ = fVar315 * fVar223;
    auVar28._0_4_ = fVar308 * fVar151;
    fVar241 = local_5a0._8_4_;
    auVar28._8_4_ = fVar317 * fVar241;
    fVar244 = local_5a0._12_4_;
    auVar28._12_4_ = fVar319 * fVar244;
    fVar338 = local_5a0._16_4_;
    auVar28._16_4_ = fVar321 * fVar338;
    fVar368 = local_5a0._20_4_;
    auVar28._20_4_ = fVar323 * fVar368;
    fVar375 = local_5a0._24_4_;
    auVar28._24_4_ = fVar325 * fVar375;
    auVar28._28_4_ = auVar106._28_4_;
    auVar27 = vsubps_avx(auVar28,auVar27);
    auVar76._4_4_ = fVar333;
    auVar76._0_4_ = fVar329;
    auVar76._8_4_ = fVar335;
    auVar76._12_4_ = fVar337;
    auVar76._16_4_ = fVar339;
    auVar76._20_4_ = fVar341;
    auVar76._24_4_ = fVar343;
    auVar76._28_4_ = fVar345;
    auVar106 = vperm2f128_avx(auVar76,auVar76,1);
    auVar106 = vshufps_avx(auVar106,auVar76,0x30);
    auVar24 = vshufps_avx(auVar76,auVar106,0x29);
    local_5e0 = vsubps_avx(auVar24,auVar76);
    auVar29._4_4_ = fVar283 * fVar223;
    auVar29._0_4_ = fVar269 * fVar151;
    auVar29._8_4_ = fVar286 * fVar241;
    auVar29._12_4_ = fVar290 * fVar244;
    auVar29._16_4_ = fVar294 * fVar338;
    auVar29._20_4_ = fVar298 * fVar368;
    auVar29._24_4_ = fVar302 * fVar375;
    auVar29._28_4_ = auVar24._28_4_;
    fVar180 = local_5e0._0_4_;
    fVar224 = local_5e0._4_4_;
    auVar30._4_4_ = fVar369 * fVar224;
    auVar30._0_4_ = fVar365 * fVar180;
    fVar227 = local_5e0._8_4_;
    auVar30._8_4_ = fVar371 * fVar227;
    fVar245 = local_5e0._12_4_;
    auVar30._12_4_ = fVar374 * fVar245;
    fVar340 = local_5e0._16_4_;
    auVar30._16_4_ = fVar376 * fVar340;
    fVar363 = local_5e0._20_4_;
    auVar30._20_4_ = fVar378 * fVar363;
    fVar377 = local_5e0._24_4_;
    auVar30._24_4_ = fVar380 * fVar377;
    auVar30._28_4_ = fVar345;
    auVar28 = vsubps_avx(auVar30,auVar29);
    auVar278._4_4_ = fVar315 * fVar224;
    auVar278._0_4_ = fVar308 * fVar180;
    auVar278._8_4_ = fVar317 * fVar227;
    auVar278._12_4_ = fVar319 * fVar245;
    auVar278._16_4_ = fVar321 * fVar340;
    auVar278._20_4_ = fVar323 * fVar363;
    auVar278._24_4_ = fVar325 * fVar377;
    auVar278._28_4_ = fVar345;
    auVar25._4_4_ = fVar283 * fVar205;
    auVar25._0_4_ = fVar269 * fVar148;
    auVar25._8_4_ = fVar286 * fVar239;
    auVar25._12_4_ = fVar290 * fVar243;
    auVar25._16_4_ = fVar294 * fVar336;
    auVar25._20_4_ = fVar298 * fVar364;
    auVar25._24_4_ = fVar302 * fVar373;
    auVar25._28_4_ = fVar370;
    auVar29 = vsubps_avx(auVar25,auVar278);
    fVar122 = auVar29._28_4_;
    fVar242 = auVar28._28_4_ + fVar122;
    auVar197._0_4_ = fVar180 * fVar180 + fVar148 * fVar148 + fVar151 * fVar151;
    auVar197._4_4_ = fVar224 * fVar224 + fVar205 * fVar205 + fVar223 * fVar223;
    auVar197._8_4_ = fVar227 * fVar227 + fVar239 * fVar239 + fVar241 * fVar241;
    auVar197._12_4_ = fVar245 * fVar245 + fVar243 * fVar243 + fVar244 * fVar244;
    auVar197._16_4_ = fVar340 * fVar340 + fVar336 * fVar336 + fVar338 * fVar338;
    auVar197._20_4_ = fVar363 * fVar363 + fVar364 * fVar364 + fVar368 * fVar368;
    auVar197._24_4_ = fVar377 * fVar377 + fVar373 * fVar373 + fVar375 * fVar375;
    auVar197._28_4_ = fVar122 + fVar122 + fVar242;
    auVar106 = vrcpps_avx(auVar197);
    fVar122 = auVar106._0_4_;
    fVar328 = auVar106._4_4_;
    auVar33._4_4_ = fVar328 * auVar197._4_4_;
    auVar33._0_4_ = fVar122 * auVar197._0_4_;
    fVar332 = auVar106._8_4_;
    auVar33._8_4_ = fVar332 * auVar197._8_4_;
    fVar334 = auVar106._12_4_;
    auVar33._12_4_ = fVar334 * auVar197._12_4_;
    fVar342 = auVar106._16_4_;
    auVar33._16_4_ = fVar342 * auVar197._16_4_;
    fVar355 = auVar106._20_4_;
    auVar33._20_4_ = fVar355 * auVar197._20_4_;
    fVar362 = auVar106._24_4_;
    auVar33._24_4_ = fVar362 * auVar197._24_4_;
    auVar33._28_4_ = fVar370;
    auVar385._8_4_ = 0x3f800000;
    auVar385._0_8_ = 0x3f8000003f800000;
    auVar385._12_4_ = 0x3f800000;
    auVar385._16_4_ = 0x3f800000;
    auVar385._20_4_ = 0x3f800000;
    auVar385._24_4_ = 0x3f800000;
    auVar385._28_4_ = 0x3f800000;
    auVar30 = vsubps_avx(auVar385,auVar33);
    fVar122 = auVar30._0_4_ * fVar122 + fVar122;
    fVar328 = auVar30._4_4_ * fVar328 + fVar328;
    fVar332 = auVar30._8_4_ * fVar332 + fVar332;
    fVar334 = auVar30._12_4_ * fVar334 + fVar334;
    fVar342 = auVar30._16_4_ * fVar342 + fVar342;
    fVar355 = auVar30._20_4_ * fVar355 + fVar355;
    fVar362 = auVar30._24_4_ * fVar362 + fVar362;
    auVar107 = vperm2f128_avx(auVar31,auVar31,1);
    auVar107 = vshufps_avx(auVar107,auVar31,0x30);
    auVar107 = vshufps_avx(auVar31,auVar107,0x29);
    auVar26 = vperm2f128_avx(local_740,local_740,1);
    auVar26 = vshufps_avx(auVar26,local_740,0x30);
    local_940 = vshufps_avx(local_740,auVar26,0x29);
    fVar382 = local_940._0_4_;
    fVar392 = local_940._4_4_;
    auVar34._4_4_ = fVar392 * fVar205;
    auVar34._0_4_ = fVar382 * fVar148;
    fVar394 = local_940._8_4_;
    auVar34._8_4_ = fVar394 * fVar239;
    fVar397 = local_940._12_4_;
    auVar34._12_4_ = fVar397 * fVar243;
    fVar400 = local_940._16_4_;
    auVar34._16_4_ = fVar400 * fVar336;
    fVar402 = local_940._20_4_;
    auVar34._20_4_ = fVar402 * fVar364;
    fVar405 = local_940._24_4_;
    auVar34._24_4_ = fVar405 * fVar373;
    auVar34._28_4_ = auVar26._28_4_;
    fVar309 = auVar107._0_4_;
    fVar316 = auVar107._4_4_;
    auVar35._4_4_ = fVar316 * fVar223;
    auVar35._0_4_ = fVar309 * fVar151;
    fVar318 = auVar107._8_4_;
    auVar35._8_4_ = fVar318 * fVar241;
    fVar320 = auVar107._12_4_;
    auVar35._12_4_ = fVar320 * fVar244;
    fVar322 = auVar107._16_4_;
    auVar35._16_4_ = fVar322 * fVar338;
    fVar324 = auVar107._20_4_;
    auVar35._20_4_ = fVar324 * fVar368;
    fVar326 = auVar107._24_4_;
    auVar35._24_4_ = fVar326 * fVar375;
    auVar35._28_4_ = -auVar196._28_4_;
    auVar31 = vsubps_avx(auVar35,auVar34);
    auVar107 = vperm2f128_avx(auVar32,auVar32,1);
    auVar107 = vshufps_avx(auVar107,auVar32,0x30);
    auVar26 = vshufps_avx(auVar32,auVar107,0x29);
    fVar270 = auVar26._0_4_;
    fVar284 = auVar26._4_4_;
    auVar36._4_4_ = fVar284 * fVar223;
    auVar36._0_4_ = fVar270 * fVar151;
    fVar287 = auVar26._8_4_;
    auVar36._8_4_ = fVar287 * fVar241;
    fVar291 = auVar26._12_4_;
    auVar36._12_4_ = fVar291 * fVar244;
    fVar295 = auVar26._16_4_;
    auVar36._16_4_ = fVar295 * fVar338;
    fVar299 = auVar26._20_4_;
    auVar36._20_4_ = fVar299 * fVar368;
    fVar303 = auVar26._24_4_;
    auVar36._24_4_ = fVar303 * fVar375;
    auVar36._28_4_ = auVar107._28_4_;
    auVar37._4_4_ = fVar392 * fVar224;
    auVar37._0_4_ = fVar382 * fVar180;
    auVar37._8_4_ = fVar394 * fVar227;
    auVar37._12_4_ = fVar397 * fVar245;
    auVar37._16_4_ = fVar400 * fVar340;
    auVar37._20_4_ = fVar402 * fVar363;
    uVar85 = local_940._28_4_;
    auVar37._24_4_ = fVar405 * fVar377;
    auVar37._28_4_ = uVar85;
    auVar107 = vsubps_avx(auVar37,auVar36);
    auVar38._4_4_ = fVar316 * fVar224;
    auVar38._0_4_ = fVar309 * fVar180;
    auVar38._8_4_ = fVar318 * fVar227;
    auVar38._12_4_ = fVar320 * fVar245;
    auVar38._16_4_ = fVar322 * fVar340;
    auVar38._20_4_ = fVar324 * fVar363;
    auVar38._24_4_ = fVar326 * fVar377;
    auVar38._28_4_ = uVar85;
    auVar39._4_4_ = fVar284 * fVar205;
    auVar39._0_4_ = fVar270 * fVar148;
    auVar39._8_4_ = fVar287 * fVar239;
    auVar39._12_4_ = fVar291 * fVar243;
    auVar39._16_4_ = fVar295 * fVar336;
    auVar39._20_4_ = fVar299 * fVar364;
    auVar39._24_4_ = fVar303 * fVar373;
    auVar39._28_4_ = fStack_204;
    auVar32 = vsubps_avx(auVar39,auVar38);
    auVar40._4_4_ =
         (auVar27._4_4_ * auVar27._4_4_ +
         auVar28._4_4_ * auVar28._4_4_ + auVar29._4_4_ * auVar29._4_4_) * fVar328;
    auVar40._0_4_ =
         (auVar27._0_4_ * auVar27._0_4_ +
         auVar28._0_4_ * auVar28._0_4_ + auVar29._0_4_ * auVar29._0_4_) * fVar122;
    auVar40._8_4_ =
         (auVar27._8_4_ * auVar27._8_4_ +
         auVar28._8_4_ * auVar28._8_4_ + auVar29._8_4_ * auVar29._8_4_) * fVar332;
    auVar40._12_4_ =
         (auVar27._12_4_ * auVar27._12_4_ +
         auVar28._12_4_ * auVar28._12_4_ + auVar29._12_4_ * auVar29._12_4_) * fVar334;
    auVar40._16_4_ =
         (auVar27._16_4_ * auVar27._16_4_ +
         auVar28._16_4_ * auVar28._16_4_ + auVar29._16_4_ * auVar29._16_4_) * fVar342;
    auVar40._20_4_ =
         (auVar27._20_4_ * auVar27._20_4_ +
         auVar28._20_4_ * auVar28._20_4_ + auVar29._20_4_ * auVar29._20_4_) * fVar355;
    auVar40._24_4_ =
         (auVar27._24_4_ * auVar27._24_4_ +
         auVar28._24_4_ * auVar28._24_4_ + auVar29._24_4_ * auVar29._24_4_) * fVar362;
    auVar40._28_4_ = auVar27._28_4_ + fVar242;
    auVar41._4_4_ =
         (auVar31._4_4_ * auVar31._4_4_ +
         auVar107._4_4_ * auVar107._4_4_ + auVar32._4_4_ * auVar32._4_4_) * fVar328;
    auVar41._0_4_ =
         (auVar31._0_4_ * auVar31._0_4_ +
         auVar107._0_4_ * auVar107._0_4_ + auVar32._0_4_ * auVar32._0_4_) * fVar122;
    auVar41._8_4_ =
         (auVar31._8_4_ * auVar31._8_4_ +
         auVar107._8_4_ * auVar107._8_4_ + auVar32._8_4_ * auVar32._8_4_) * fVar332;
    auVar41._12_4_ =
         (auVar31._12_4_ * auVar31._12_4_ +
         auVar107._12_4_ * auVar107._12_4_ + auVar32._12_4_ * auVar32._12_4_) * fVar334;
    auVar41._16_4_ =
         (auVar31._16_4_ * auVar31._16_4_ +
         auVar107._16_4_ * auVar107._16_4_ + auVar32._16_4_ * auVar32._16_4_) * fVar342;
    auVar41._20_4_ =
         (auVar31._20_4_ * auVar31._20_4_ +
         auVar107._20_4_ * auVar107._20_4_ + auVar32._20_4_ * auVar32._20_4_) * fVar355;
    auVar41._24_4_ =
         (auVar31._24_4_ * auVar31._24_4_ +
         auVar107._24_4_ * auVar107._24_4_ + auVar32._24_4_ * auVar32._24_4_) * fVar362;
    auVar41._28_4_ = auVar30._28_4_ + auVar106._28_4_;
    auVar106 = vmaxps_avx(auVar40,auVar41);
    auVar107 = vperm2f128_avx(auVar234,auVar234,1);
    auVar107 = vshufps_avx(auVar107,auVar234,0x30);
    auVar27 = vshufps_avx(auVar234,auVar107,0x29);
    auVar108._0_4_ = auVar234._0_4_ + fVar202;
    auVar108._4_4_ = auVar234._4_4_ + fVar225;
    auVar108._8_4_ = auVar234._8_4_ + fVar237;
    auVar108._12_4_ = auVar234._12_4_ + fVar240;
    auVar108._16_4_ = auVar234._16_4_ + fVar201;
    auVar108._20_4_ = auVar234._20_4_ + fVar203;
    auVar108._24_4_ = auVar234._24_4_ + fVar226;
    auVar108._28_4_ = auVar234._28_4_ + fVar238;
    auVar107 = vmaxps_avx(auVar234,auVar108);
    auVar26 = vmaxps_avx(auVar23,auVar27);
    auVar107 = vmaxps_avx(auVar107,auVar26);
    auVar26 = vrsqrtps_avx(auVar197);
    fVar122 = auVar26._0_4_;
    fVar201 = auVar26._4_4_;
    fVar202 = auVar26._8_4_;
    fVar203 = auVar26._12_4_;
    fVar225 = auVar26._16_4_;
    fVar226 = auVar26._20_4_;
    fVar237 = auVar26._24_4_;
    auVar42._4_4_ = fVar201 * fVar201 * fVar201 * auVar197._4_4_ * 0.5;
    auVar42._0_4_ = fVar122 * fVar122 * fVar122 * auVar197._0_4_ * 0.5;
    auVar42._8_4_ = fVar202 * fVar202 * fVar202 * auVar197._8_4_ * 0.5;
    auVar42._12_4_ = fVar203 * fVar203 * fVar203 * auVar197._12_4_ * 0.5;
    auVar42._16_4_ = fVar225 * fVar225 * fVar225 * auVar197._16_4_ * 0.5;
    auVar42._20_4_ = fVar226 * fVar226 * fVar226 * auVar197._20_4_ * 0.5;
    auVar42._24_4_ = fVar237 * fVar237 * fVar237 * auVar197._24_4_ * 0.5;
    auVar42._28_4_ = auVar197._28_4_;
    auVar43._4_4_ = fVar201 * 1.5;
    auVar43._0_4_ = fVar122 * 1.5;
    auVar43._8_4_ = fVar202 * 1.5;
    auVar43._12_4_ = fVar203 * 1.5;
    auVar43._16_4_ = fVar225 * 1.5;
    auVar43._20_4_ = fVar226 * 1.5;
    auVar43._24_4_ = fVar237 * 1.5;
    auVar43._28_4_ = auVar26._28_4_;
    auVar28 = vsubps_avx(auVar43,auVar42);
    auVar313 = ZEXT3264(auVar28);
    auVar75._4_4_ = fVar173;
    auVar75._0_4_ = fVar155;
    auVar75._8_4_ = fVar174;
    auVar75._12_4_ = fVar175;
    auVar75._16_4_ = fVar176;
    auVar75._20_4_ = fVar177;
    auVar75._24_4_ = fVar178;
    auVar75._28_4_ = fVar179;
    auVar29 = vsubps_avx(ZEXT832(0) << 0x20,auVar75);
    auVar30 = vsubps_avx(ZEXT832(0) << 0x20,auVar78);
    fVar201 = auVar30._0_4_;
    fVar225 = auVar30._4_4_;
    fVar238 = auVar30._8_4_;
    fVar328 = auVar30._12_4_;
    fVar342 = auVar30._16_4_;
    fVar370 = auVar30._20_4_;
    fVar379 = auVar30._24_4_;
    fVar202 = auVar29._0_4_;
    fVar226 = auVar29._4_4_;
    fVar240 = auVar29._8_4_;
    fVar332 = auVar29._12_4_;
    fVar355 = auVar29._16_4_;
    fVar395 = auVar29._20_4_;
    fVar403 = auVar29._24_4_;
    auVar77._4_4_ = fVar333;
    auVar77._0_4_ = fVar329;
    auVar77._8_4_ = fVar335;
    auVar77._12_4_ = fVar337;
    auVar77._16_4_ = fVar339;
    auVar77._20_4_ = fVar341;
    auVar77._24_4_ = fVar343;
    auVar77._28_4_ = fVar345;
    auVar31 = vsubps_avx(ZEXT832(0) << 0x20,auVar77);
    fVar203 = auVar31._0_4_;
    fVar237 = auVar31._4_4_;
    fVar242 = auVar31._8_4_;
    fVar334 = auVar31._12_4_;
    fVar362 = auVar31._16_4_;
    fVar398 = auVar31._20_4_;
    fVar381 = auVar31._24_4_;
    auVar386._0_4_ =
         (float)local_7c0._0_4_ * fVar203 +
         (float)local_7e0._0_4_ * fVar202 + (float)local_7a0._0_4_ * fVar201;
    auVar386._4_4_ =
         (float)local_7c0._4_4_ * fVar237 +
         (float)local_7e0._4_4_ * fVar226 + (float)local_7a0._4_4_ * fVar225;
    auVar386._8_4_ = fStack_7b8 * fVar242 + fStack_7d8 * fVar240 + fStack_798 * fVar238;
    auVar386._12_4_ = fStack_7b4 * fVar334 + fStack_7d4 * fVar332 + fStack_794 * fVar328;
    auVar386._16_4_ = fStack_7b0 * fVar362 + fStack_7d0 * fVar355 + fStack_790 * fVar342;
    auVar386._20_4_ = fStack_7ac * fVar398 + fStack_7cc * fVar395 + fStack_78c * fVar370;
    auVar386._24_4_ = fStack_7a8 * fVar381 + fStack_7c8 * fVar403 + fStack_788 * fVar379;
    auVar386._28_4_ = fStack_204 + auVar32._28_4_ + auVar26._28_4_;
    auVar407._0_4_ = fVar203 * fVar203 + fVar202 * fVar202 + fVar201 * fVar201;
    auVar407._4_4_ = fVar237 * fVar237 + fVar226 * fVar226 + fVar225 * fVar225;
    auVar407._8_4_ = fVar242 * fVar242 + fVar240 * fVar240 + fVar238 * fVar238;
    auVar407._12_4_ = fVar334 * fVar334 + fVar332 * fVar332 + fVar328 * fVar328;
    auVar407._16_4_ = fVar362 * fVar362 + fVar355 * fVar355 + fVar342 * fVar342;
    auVar407._20_4_ = fVar398 * fVar398 + fVar395 * fVar395 + fVar370 * fVar370;
    auVar407._24_4_ = fVar381 * fVar381 + fVar403 * fVar403 + fVar379 * fVar379;
    auVar407._28_4_ = auVar234._28_4_ + auVar234._28_4_ + fStack_204;
    fVar401 = auVar28._0_4_;
    fVar404 = auVar28._4_4_;
    fVar261 = auVar28._8_4_;
    fVar262 = auVar28._12_4_;
    fVar264 = auVar28._16_4_;
    fVar266 = auVar28._20_4_;
    fVar268 = auVar28._24_4_;
    fVar399 = fStack_7c4 + local_5a0._28_4_;
    local_4e0 = (float)local_7c0._0_4_ * fVar180 * fVar401 +
                fVar401 * fVar148 * (float)local_7e0._0_4_ +
                (float)local_7a0._0_4_ * fVar401 * fVar151;
    fStack_4dc = (float)local_7c0._4_4_ * fVar224 * fVar404 +
                 fVar404 * fVar205 * (float)local_7e0._4_4_ +
                 (float)local_7a0._4_4_ * fVar404 * fVar223;
    fStack_4d8 = fStack_7b8 * fVar227 * fVar261 +
                 fVar261 * fVar239 * fStack_7d8 + fStack_798 * fVar261 * fVar241;
    fStack_4d4 = fStack_7b4 * fVar245 * fVar262 +
                 fVar262 * fVar243 * fStack_7d4 + fStack_794 * fVar262 * fVar244;
    fStack_4d0 = fStack_7b0 * fVar340 * fVar264 +
                 fVar264 * fVar336 * fStack_7d0 + fStack_790 * fVar264 * fVar338;
    fStack_4cc = fStack_7ac * fVar363 * fVar266 +
                 fVar266 * fVar364 * fStack_7cc + fStack_78c * fVar266 * fVar368;
    fStack_4c8 = fStack_7a8 * fVar377 * fVar268 +
                 fVar268 * fVar373 * fStack_7c8 + fStack_788 * fVar268 * fVar375;
    fVar122 = fStack_7a4 + fVar399;
    fVar271 = fVar203 * fVar180 * fVar401 +
              fVar401 * fVar148 * fVar202 + fVar401 * fVar151 * fVar201;
    fVar285 = fVar237 * fVar224 * fVar404 +
              fVar404 * fVar205 * fVar226 + fVar404 * fVar223 * fVar225;
    fVar288 = fVar242 * fVar227 * fVar261 +
              fVar261 * fVar239 * fVar240 + fVar261 * fVar241 * fVar238;
    fVar292 = fVar334 * fVar245 * fVar262 +
              fVar262 * fVar243 * fVar332 + fVar262 * fVar244 * fVar328;
    fVar296 = fVar362 * fVar340 * fVar264 +
              fVar264 * fVar336 * fVar355 + fVar264 * fVar338 * fVar342;
    fVar300 = fVar398 * fVar363 * fVar266 +
              fVar266 * fVar364 * fVar395 + fVar266 * fVar368 * fVar370;
    fVar304 = fVar381 * fVar377 * fVar268 +
              fVar268 * fVar373 * fVar403 + fVar268 * fVar375 * fVar379;
    fVar307 = fStack_7c4 + fVar122;
    auVar44._4_4_ = fStack_4dc * fVar285;
    auVar44._0_4_ = local_4e0 * fVar271;
    auVar44._8_4_ = fStack_4d8 * fVar288;
    auVar44._12_4_ = fStack_4d4 * fVar292;
    auVar44._16_4_ = fStack_4d0 * fVar296;
    auVar44._20_4_ = fStack_4cc * fVar300;
    auVar44._24_4_ = fStack_4c8 * fVar304;
    auVar44._28_4_ = fVar122;
    auVar26 = vsubps_avx(auVar386,auVar44);
    auVar45._4_4_ = fVar285 * fVar285;
    auVar45._0_4_ = fVar271 * fVar271;
    auVar45._8_4_ = fVar288 * fVar288;
    auVar45._12_4_ = fVar292 * fVar292;
    auVar45._16_4_ = fVar296 * fVar296;
    auVar45._20_4_ = fVar300 * fVar300;
    auVar45._24_4_ = fVar304 * fVar304;
    auVar45._28_4_ = fStack_7c4;
    auVar32 = vsubps_avx(auVar407,auVar45);
    auStack_8b8 = auVar32._8_24_;
    _local_640 = vsqrtps_avx(auVar106);
    fVar122 = (auVar107._0_4_ + local_640._0_4_) * 1.0000002;
    fVar149 = (auVar107._4_4_ + local_640._4_4_) * 1.0000002;
    fVar391 = (auVar107._8_4_ + local_640._8_4_) * 1.0000002;
    fVar153 = (auVar107._12_4_ + local_640._12_4_) * 1.0000002;
    fVar393 = (auVar107._16_4_ + local_640._16_4_) * 1.0000002;
    fVar154 = (auVar107._20_4_ + local_640._20_4_) * 1.0000002;
    fVar396 = (auVar107._24_4_ + local_640._24_4_) * 1.0000002;
    auVar46._4_4_ = fVar149 * fVar149;
    auVar46._0_4_ = fVar122 * fVar122;
    auVar46._8_4_ = fVar391 * fVar391;
    auVar46._12_4_ = fVar153 * fVar153;
    auVar46._16_4_ = fVar393 * fVar393;
    auVar46._20_4_ = fVar154 * fVar154;
    auVar46._24_4_ = fVar396 * fVar396;
    auVar46._28_4_ = auVar107._28_4_ + local_640._28_4_;
    fVar346 = auVar26._0_4_ + auVar26._0_4_;
    fVar354 = auVar26._4_4_ + auVar26._4_4_;
    local_9e0._0_8_ = CONCAT44(fVar354,fVar346);
    local_9e0._8_4_ = auVar26._8_4_ + auVar26._8_4_;
    local_9e0._12_4_ = auVar26._12_4_ + auVar26._12_4_;
    local_9e0._16_4_ = auVar26._16_4_ + auVar26._16_4_;
    local_9e0._20_4_ = auVar26._20_4_ + auVar26._20_4_;
    local_9e0._24_4_ = auVar26._24_4_ + auVar26._24_4_;
    local_9e0._28_4_ = auVar26._28_4_ + auVar26._28_4_;
    auVar26 = vsubps_avx(auVar32,auVar46);
    local_2c0._4_4_ = fStack_4dc * fStack_4dc;
    local_2c0._0_4_ = local_4e0 * local_4e0;
    local_2c0._8_4_ = fStack_4d8 * fStack_4d8;
    local_2c0._12_4_ = fStack_4d4 * fStack_4d4;
    local_2c0._16_4_ = fStack_4d0 * fStack_4d0;
    local_2c0._20_4_ = fStack_4cc * fStack_4cc;
    local_2c0._24_4_ = fStack_4c8 * fStack_4c8;
    local_2c0._28_4_ = uStack_784;
    local_4c0 = vsubps_avx(local_280,local_2c0);
    local_560._4_4_ = fVar354 * fVar354;
    local_560._0_4_ = fVar346 * fVar346;
    local_560._8_4_ = local_9e0._8_4_ * local_9e0._8_4_;
    local_560._12_4_ = local_9e0._12_4_ * local_9e0._12_4_;
    local_560._16_4_ = local_9e0._16_4_ * local_9e0._16_4_;
    local_560._20_4_ = local_9e0._20_4_ * local_9e0._20_4_;
    local_560._24_4_ = local_9e0._24_4_ * local_9e0._24_4_;
    local_560._28_4_ = auVar107._28_4_;
    fVar149 = local_4c0._0_4_;
    local_580._0_4_ = fVar149 * 4.0;
    fVar391 = local_4c0._4_4_;
    local_580._4_4_ = fVar391 * 4.0;
    fVar153 = local_4c0._8_4_;
    fStack_578 = fVar153 * 4.0;
    fVar393 = local_4c0._12_4_;
    fStack_574 = fVar393 * 4.0;
    fVar154 = local_4c0._16_4_;
    fStack_570 = fVar154 * 4.0;
    fVar396 = local_4c0._20_4_;
    fStack_56c = fVar396 * 4.0;
    fVar344 = local_4c0._24_4_;
    fStack_568 = fVar344 * 4.0;
    uStack_564 = 0x40800000;
    auVar47._4_4_ = auVar26._4_4_ * (float)local_580._4_4_;
    auVar47._0_4_ = auVar26._0_4_ * (float)local_580._0_4_;
    auVar47._8_4_ = auVar26._8_4_ * fStack_578;
    auVar47._12_4_ = auVar26._12_4_ * fStack_574;
    auVar47._16_4_ = auVar26._16_4_ * fStack_570;
    auVar47._20_4_ = auVar26._20_4_ * fStack_56c;
    auVar47._24_4_ = auVar26._24_4_ * fStack_568;
    auVar47._28_4_ = 0x40800000;
    auVar107 = vsubps_avx(local_560,auVar47);
    auVar106 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,5);
    fVar122 = local_4c0._28_4_;
    if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar106 >> 0x7f,0) == '\0') &&
          (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar106 >> 0xbf,0) == '\0') &&
        (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar106[0x1f])
    {
      fStack_b78 = INFINITY;
      local_b80 = (undefined1  [8])0x7f8000007f800000;
      fStack_b74 = INFINITY;
      uStack_b70 = 0x7f800000;
      uStack_b6c = 0x7f800000;
      uStack_b68 = 0x7f800000;
      uStack_b64 = 0x7f800000;
      auVar408._8_4_ = 0xff800000;
      auVar408._0_8_ = 0xff800000ff800000;
      auVar408._12_4_ = 0xff800000;
      auVar408._16_4_ = 0xff800000;
      auVar408._20_4_ = 0xff800000;
      auVar408._24_4_ = 0xff800000;
      auVar408._28_4_ = 0xff800000;
    }
    else {
      auVar278 = vcmpps_avx(auVar107,ZEXT832(0) << 0x20,5);
      auVar25 = vsqrtps_avx(auVar107);
      auVar253._0_4_ = fVar149 + fVar149;
      auVar253._4_4_ = fVar391 + fVar391;
      auVar253._8_4_ = fVar153 + fVar153;
      auVar253._12_4_ = fVar393 + fVar393;
      auVar253._16_4_ = fVar154 + fVar154;
      auVar253._20_4_ = fVar396 + fVar396;
      auVar253._24_4_ = fVar344 + fVar344;
      auVar253._28_4_ = fVar122 + fVar122;
      auVar107 = vrcpps_avx(auVar253);
      fVar246 = auVar107._0_4_;
      fVar259 = auVar107._4_4_;
      auVar48._4_4_ = auVar253._4_4_ * fVar259;
      auVar48._0_4_ = auVar253._0_4_ * fVar246;
      fVar260 = auVar107._8_4_;
      auVar48._8_4_ = auVar253._8_4_ * fVar260;
      fVar204 = auVar107._12_4_;
      auVar48._12_4_ = auVar253._12_4_ * fVar204;
      fVar263 = auVar107._16_4_;
      auVar48._16_4_ = auVar253._16_4_ * fVar263;
      fVar265 = auVar107._20_4_;
      auVar48._20_4_ = auVar253._20_4_ * fVar265;
      fVar267 = auVar107._24_4_;
      auVar48._24_4_ = auVar253._24_4_ * fVar267;
      auVar48._28_4_ = auVar253._28_4_;
      auVar165._8_4_ = 0x3f800000;
      auVar165._0_8_ = 0x3f8000003f800000;
      auVar165._12_4_ = 0x3f800000;
      auVar165._16_4_ = 0x3f800000;
      auVar165._20_4_ = 0x3f800000;
      auVar165._24_4_ = 0x3f800000;
      auVar165._28_4_ = 0x3f800000;
      auVar33 = vsubps_avx(auVar165,auVar48);
      fVar246 = fVar246 + fVar246 * auVar33._0_4_;
      fVar259 = fVar259 + fVar259 * auVar33._4_4_;
      fVar260 = fVar260 + fVar260 * auVar33._8_4_;
      fVar204 = fVar204 + fVar204 * auVar33._12_4_;
      fVar263 = fVar263 + fVar263 * auVar33._16_4_;
      fVar265 = fVar265 + fVar265 * auVar33._20_4_;
      fVar267 = fVar267 + fVar267 * auVar33._24_4_;
      auVar277._0_8_ = CONCAT44(fVar354,fVar346) ^ 0x8000000080000000;
      auVar277._8_4_ = -local_9e0._8_4_;
      auVar277._12_4_ = -local_9e0._12_4_;
      auVar277._16_4_ = -local_9e0._16_4_;
      auVar277._20_4_ = -local_9e0._20_4_;
      auVar277._24_4_ = -local_9e0._24_4_;
      auVar277._28_4_ = -local_9e0._28_4_;
      auVar34 = vsubps_avx(auVar277,auVar25);
      fVar346 = auVar34._0_4_ * fVar246;
      fVar354 = auVar34._4_4_ * fVar259;
      auVar49._4_4_ = fVar354;
      auVar49._0_4_ = fVar346;
      fVar289 = auVar34._8_4_ * fVar260;
      auVar49._8_4_ = fVar289;
      fVar293 = auVar34._12_4_ * fVar204;
      auVar49._12_4_ = fVar293;
      fVar297 = auVar34._16_4_ * fVar263;
      auVar49._16_4_ = fVar297;
      fVar301 = auVar34._20_4_ * fVar265;
      auVar49._20_4_ = fVar301;
      fVar305 = auVar34._24_4_ * fVar267;
      auVar49._24_4_ = fVar305;
      auVar49._28_4_ = auVar34._28_4_;
      auVar25 = vsubps_avx(auVar25,local_9e0);
      fVar246 = auVar25._0_4_ * fVar246;
      fVar259 = auVar25._4_4_ * fVar259;
      auVar50._4_4_ = fVar259;
      auVar50._0_4_ = fVar246;
      fVar260 = auVar25._8_4_ * fVar260;
      auVar50._8_4_ = fVar260;
      fVar204 = auVar25._12_4_ * fVar204;
      auVar50._12_4_ = fVar204;
      fVar263 = auVar25._16_4_ * fVar263;
      auVar50._16_4_ = fVar263;
      fVar265 = auVar25._20_4_ * fVar265;
      auVar50._20_4_ = fVar265;
      fVar267 = auVar25._24_4_ * fVar267;
      auVar50._24_4_ = fVar267;
      auVar50._28_4_ = auVar25._28_4_;
      local_620 = fVar401 * (fVar271 + local_4e0 * fVar346);
      fStack_61c = fVar404 * (fVar285 + fStack_4dc * fVar354);
      fStack_618 = fVar261 * (fVar288 + fStack_4d8 * fVar289);
      fStack_614 = fVar262 * (fVar292 + fStack_4d4 * fVar293);
      fStack_610 = fVar264 * (fVar296 + fStack_4d0 * fVar297);
      fStack_60c = fVar266 * (fVar300 + fStack_4cc * fVar301);
      fStack_608 = fVar268 * (fVar304 + fStack_4c8 * fVar305);
      fStack_604 = fVar307 + auVar107._28_4_ + auVar33._28_4_;
      auVar348._8_4_ = 0x7fffffff;
      auVar348._0_8_ = 0x7fffffff7fffffff;
      auVar348._12_4_ = 0x7fffffff;
      auVar348._16_4_ = 0x7fffffff;
      auVar348._20_4_ = 0x7fffffff;
      auVar348._24_4_ = 0x7fffffff;
      auVar348._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(local_2c0,auVar348);
      auVar25 = vmaxps_avx(local_4a0,auVar107);
      auVar51._4_4_ = auVar25._4_4_ * 1.9073486e-06;
      auVar51._0_4_ = auVar25._0_4_ * 1.9073486e-06;
      auVar51._8_4_ = auVar25._8_4_ * 1.9073486e-06;
      auVar51._12_4_ = auVar25._12_4_ * 1.9073486e-06;
      auVar51._16_4_ = auVar25._16_4_ * 1.9073486e-06;
      auVar51._20_4_ = auVar25._20_4_ * 1.9073486e-06;
      auVar51._24_4_ = auVar25._24_4_ * 1.9073486e-06;
      auVar51._28_4_ = auVar25._28_4_;
      auVar107 = vandps_avx(local_4c0,auVar348);
      auVar107 = vcmpps_avx(auVar107,auVar51,1);
      auVar349._8_4_ = 0x7f800000;
      auVar349._0_8_ = 0x7f8000007f800000;
      auVar349._12_4_ = 0x7f800000;
      auVar349._16_4_ = 0x7f800000;
      auVar349._20_4_ = 0x7f800000;
      auVar349._24_4_ = 0x7f800000;
      auVar349._28_4_ = 0x7f800000;
      _local_b80 = vblendvps_avx(auVar349,auVar49,auVar278);
      local_660._4_4_ = fVar404 * (fVar285 + fStack_4dc * fVar259);
      local_660._0_4_ = fVar401 * (fVar271 + local_4e0 * fVar246);
      fStack_658 = fVar261 * (fVar288 + fStack_4d8 * fVar260);
      fStack_654 = fVar262 * (fVar292 + fStack_4d4 * fVar204);
      fStack_650 = fVar264 * (fVar296 + fStack_4d0 * fVar263);
      fStack_64c = fVar266 * (fVar300 + fStack_4cc * fVar265);
      fStack_648 = fVar268 * (fVar304 + fStack_4c8 * fVar267);
      fStack_644 = fVar307 + auVar25._28_4_;
      auVar254._8_4_ = 0xff800000;
      auVar254._0_8_ = 0xff800000ff800000;
      auVar254._12_4_ = 0xff800000;
      auVar254._16_4_ = 0xff800000;
      auVar254._20_4_ = 0xff800000;
      auVar254._24_4_ = 0xff800000;
      auVar254._28_4_ = 0xff800000;
      auVar408 = vblendvps_avx(auVar254,auVar50,auVar278);
      auVar25 = auVar278 & auVar107;
      if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar25 >> 0x7f,0) != '\0') ||
            (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar25 >> 0xbf,0) != '\0') ||
          (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar25[0x1f] < '\0') {
        auVar106 = vandps_avx(auVar107,auVar278);
        auVar193 = vpackssdw_avx(auVar106._0_16_,auVar106._16_16_);
        auVar26 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
        auVar411._8_4_ = 0xff800000;
        auVar411._0_8_ = 0xff800000ff800000;
        auVar411._12_4_ = 0xff800000;
        auVar411._16_4_ = 0xff800000;
        auVar411._20_4_ = 0xff800000;
        auVar411._24_4_ = 0xff800000;
        auVar411._28_4_ = 0xff800000;
        auVar389._8_4_ = 0x7f800000;
        auVar389._0_8_ = 0x7f8000007f800000;
        auVar389._12_4_ = 0x7f800000;
        auVar389._16_4_ = 0x7f800000;
        auVar389._20_4_ = 0x7f800000;
        auVar389._24_4_ = 0x7f800000;
        auVar389._28_4_ = 0x7f800000;
        auVar107 = vblendvps_avx(auVar389,auVar411,auVar26);
        auVar190 = vpmovsxwd_avx(auVar193);
        auVar193 = vpunpckhwd_avx(auVar193,auVar193);
        auVar236._16_16_ = auVar193;
        auVar236._0_16_ = auVar190;
        _local_b80 = vblendvps_avx(_local_b80,auVar107,auVar236);
        auVar107 = vblendvps_avx(auVar411,auVar389,auVar26);
        auVar408 = vblendvps_avx(auVar408,auVar107,auVar236);
        auVar107 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        auVar146._0_4_ = auVar106._0_4_ ^ auVar107._0_4_;
        auVar146._4_4_ = auVar106._4_4_ ^ auVar107._4_4_;
        auVar146._8_4_ = auVar106._8_4_ ^ auVar107._8_4_;
        auVar146._12_4_ = auVar106._12_4_ ^ auVar107._12_4_;
        auVar146._16_4_ = auVar106._16_4_ ^ auVar107._16_4_;
        auVar146._20_4_ = auVar106._20_4_ ^ auVar107._20_4_;
        auVar146._24_4_ = auVar106._24_4_ ^ auVar107._24_4_;
        auVar146._28_4_ = auVar106._28_4_ ^ auVar107._28_4_;
        auVar106 = vorps_avx(auVar26,auVar146);
        auVar106 = vandps_avx(auVar278,auVar106);
      }
    }
    auVar107 = local_480 & auVar106;
    auVar359 = local_2c0;
    auVar350 = local_9e0;
    if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0x7f,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar107 >> 0xbf,0) == '\0') &&
        (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar107[0x1f])
    {
LAB_00f965a9:
      auVar353 = ZEXT3264(auVar350);
      auVar361 = ZEXT3264(auVar359);
      auVar409 = ZEXT3264(_local_960);
LAB_00f965b2:
    }
    else {
      fStack_4c4 = fStack_7a4 + fVar399;
      local_510 = ZEXT416((uint)*(float *)(ray + k * 4 + 0x80));
      auVar193 = ZEXT416((uint)(*(float *)(ray + k * 4 + 0x80) - (float)local_870._0_4_));
      auVar193 = vshufps_avx(auVar193,auVar193,0);
      auVar235._16_16_ = auVar193;
      auVar235._0_16_ = auVar193;
      auVar278 = vminps_avx(auVar235,auVar408);
      fVar204 = auVar29._28_4_ + auVar30._28_4_;
      auVar166._0_4_ =
           (float)local_7c0._0_4_ * fVar269 +
           (float)local_7e0._0_4_ * fVar308 + fVar365 * (float)local_7a0._0_4_;
      auVar166._4_4_ =
           (float)local_7c0._4_4_ * fVar283 +
           (float)local_7e0._4_4_ * fVar315 + fVar369 * (float)local_7a0._4_4_;
      auVar166._8_4_ = fStack_7b8 * fVar286 + fStack_7d8 * fVar317 + fVar371 * fStack_798;
      auVar166._12_4_ = fStack_7b4 * fVar290 + fStack_7d4 * fVar319 + fVar374 * fStack_794;
      auVar166._16_4_ = fStack_7b0 * fVar294 + fStack_7d0 * fVar321 + fVar376 * fStack_790;
      auVar166._20_4_ = fStack_7ac * fVar298 + fStack_7cc * fVar323 + fVar378 * fStack_78c;
      auVar166._24_4_ = fStack_7a8 * fVar302 + fStack_7c8 * fVar325 + fVar380 * fStack_788;
      auVar166._28_4_ = fVar204 + fVar327 + fVar204;
      auVar107 = vrcpps_avx(auVar166);
      fVar399 = auVar107._0_4_;
      fVar327 = auVar107._4_4_;
      auVar52._4_4_ = auVar166._4_4_ * fVar327;
      auVar52._0_4_ = auVar166._0_4_ * fVar399;
      fVar346 = auVar107._8_4_;
      auVar52._8_4_ = auVar166._8_4_ * fVar346;
      fVar354 = auVar107._12_4_;
      auVar52._12_4_ = auVar166._12_4_ * fVar354;
      fVar246 = auVar107._16_4_;
      auVar52._16_4_ = auVar166._16_4_ * fVar246;
      fVar259 = auVar107._20_4_;
      auVar52._20_4_ = auVar166._20_4_ * fVar259;
      fVar260 = auVar107._24_4_;
      auVar52._24_4_ = auVar166._24_4_ * fVar260;
      auVar52._28_4_ = fVar306;
      auVar387._8_4_ = 0x3f800000;
      auVar387._0_8_ = 0x3f8000003f800000;
      auVar387._12_4_ = 0x3f800000;
      auVar387._16_4_ = 0x3f800000;
      auVar387._20_4_ = 0x3f800000;
      auVar387._24_4_ = 0x3f800000;
      auVar387._28_4_ = 0x3f800000;
      auVar29 = vsubps_avx(auVar387,auVar52);
      auVar331._8_4_ = 0x7fffffff;
      auVar331._0_8_ = 0x7fffffff7fffffff;
      auVar331._12_4_ = 0x7fffffff;
      auVar331._16_4_ = 0x7fffffff;
      auVar331._20_4_ = 0x7fffffff;
      auVar331._24_4_ = 0x7fffffff;
      auVar331._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar331,auVar166);
      auVar410._8_4_ = 0x219392ef;
      auVar410._0_8_ = 0x219392ef219392ef;
      auVar410._12_4_ = 0x219392ef;
      auVar410._16_4_ = 0x219392ef;
      auVar410._20_4_ = 0x219392ef;
      auVar410._24_4_ = 0x219392ef;
      auVar410._28_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar107,auVar410,1);
      auVar53._4_4_ =
           (fVar327 + fVar327 * auVar29._4_4_) *
           -(fVar283 * fVar237 + fVar315 * fVar226 + fVar369 * fVar225);
      auVar53._0_4_ =
           (fVar399 + fVar399 * auVar29._0_4_) *
           -(fVar269 * fVar203 + fVar308 * fVar202 + fVar365 * fVar201);
      auVar53._8_4_ =
           (fVar346 + fVar346 * auVar29._8_4_) *
           -(fVar286 * fVar242 + fVar317 * fVar240 + fVar371 * fVar238);
      auVar53._12_4_ =
           (fVar354 + fVar354 * auVar29._12_4_) *
           -(fVar290 * fVar334 + fVar319 * fVar332 + fVar374 * fVar328);
      auVar53._16_4_ =
           (fVar246 + fVar246 * auVar29._16_4_) *
           -(fVar294 * fVar362 + fVar321 * fVar355 + fVar376 * fVar342);
      auVar53._20_4_ =
           (fVar259 + fVar259 * auVar29._20_4_) *
           -(fVar298 * fVar398 + fVar323 * fVar395 + fVar378 * fVar370);
      auVar53._24_4_ =
           (fVar260 + fVar260 * auVar29._24_4_) *
           -(fVar302 * fVar381 + fVar325 * fVar403 + fVar380 * fVar379);
      auVar53._28_4_ = -(auVar31._28_4_ + fVar204);
      auVar107 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,1);
      auVar107 = vorps_avx(auVar26,auVar107);
      auVar350._8_4_ = 0xff800000;
      auVar350._0_8_ = 0xff800000ff800000;
      auVar350._12_4_ = 0xff800000;
      auVar350._16_4_ = 0xff800000;
      auVar350._20_4_ = 0xff800000;
      auVar350._24_4_ = 0xff800000;
      auVar350._28_4_ = 0xff800000;
      auVar107 = vblendvps_avx(auVar53,auVar350,auVar107);
      auVar29 = vcmpps_avx(auVar166,ZEXT832(0) << 0x20,6);
      auVar26 = vorps_avx(auVar26,auVar29);
      auVar359._8_4_ = 0x7f800000;
      auVar359._0_8_ = 0x7f8000007f800000;
      auVar359._12_4_ = 0x7f800000;
      auVar359._16_4_ = 0x7f800000;
      auVar359._20_4_ = 0x7f800000;
      auVar359._24_4_ = 0x7f800000;
      auVar359._28_4_ = 0x7f800000;
      auVar26 = vblendvps_avx(auVar53,auVar359,auVar26);
      auVar29 = vmaxps_avx(local_2a0,_local_b80);
      auVar29 = vmaxps_avx(auVar29,auVar107);
      auVar30 = vminps_avx(auVar278,auVar26);
      auVar278 = ZEXT832(0) << 0x20;
      auVar107 = vsubps_avx(auVar278,auVar22);
      auVar26 = vsubps_avx(auVar278,local_980);
      auVar54._4_4_ = auVar26._4_4_ * -fVar392;
      auVar54._0_4_ = auVar26._0_4_ * -fVar382;
      auVar54._8_4_ = auVar26._8_4_ * -fVar394;
      auVar54._12_4_ = auVar26._12_4_ * -fVar397;
      auVar54._16_4_ = auVar26._16_4_ * -fVar400;
      auVar54._20_4_ = auVar26._20_4_ * -fVar402;
      auVar54._24_4_ = auVar26._24_4_ * -fVar405;
      auVar54._28_4_ = auVar26._28_4_;
      auVar55._4_4_ = fVar316 * auVar107._4_4_;
      auVar55._0_4_ = fVar309 * auVar107._0_4_;
      auVar55._8_4_ = fVar318 * auVar107._8_4_;
      auVar55._12_4_ = fVar320 * auVar107._12_4_;
      auVar55._16_4_ = fVar322 * auVar107._16_4_;
      auVar55._20_4_ = fVar324 * auVar107._20_4_;
      auVar55._24_4_ = fVar326 * auVar107._24_4_;
      auVar55._28_4_ = auVar107._28_4_;
      auVar107 = vsubps_avx(auVar54,auVar55);
      auVar26 = vsubps_avx(auVar278,auVar24);
      auVar56._4_4_ = fVar284 * auVar26._4_4_;
      auVar56._0_4_ = fVar270 * auVar26._0_4_;
      auVar56._8_4_ = fVar287 * auVar26._8_4_;
      auVar56._12_4_ = fVar291 * auVar26._12_4_;
      auVar56._16_4_ = fVar295 * auVar26._16_4_;
      auVar56._20_4_ = fVar299 * auVar26._20_4_;
      uVar8 = auVar26._28_4_;
      auVar56._24_4_ = fVar303 * auVar26._24_4_;
      auVar56._28_4_ = uVar8;
      auVar22 = vsubps_avx(auVar107,auVar56);
      auVar57._4_4_ = -fVar392 * (float)local_7a0._4_4_;
      auVar57._0_4_ = -fVar382 * (float)local_7a0._0_4_;
      auVar57._8_4_ = -fVar394 * fStack_798;
      auVar57._12_4_ = -fVar397 * fStack_794;
      auVar57._16_4_ = -fVar400 * fStack_790;
      auVar57._20_4_ = -fVar402 * fStack_78c;
      auVar57._24_4_ = -fVar405 * fStack_788;
      auVar57._28_4_ = uVar85 ^ 0x80000000;
      auVar58._4_4_ = (float)local_7e0._4_4_ * fVar316;
      auVar58._0_4_ = (float)local_7e0._0_4_ * fVar309;
      auVar58._8_4_ = fStack_7d8 * fVar318;
      auVar58._12_4_ = fStack_7d4 * fVar320;
      auVar58._16_4_ = fStack_7d0 * fVar322;
      auVar58._20_4_ = fStack_7cc * fVar324;
      auVar58._24_4_ = fStack_7c8 * fVar326;
      auVar58._28_4_ = uVar8;
      auVar388._8_4_ = 0x3f800000;
      auVar388._0_8_ = 0x3f8000003f800000;
      auVar388._12_4_ = 0x3f800000;
      auVar388._16_4_ = 0x3f800000;
      auVar388._20_4_ = 0x3f800000;
      auVar388._24_4_ = 0x3f800000;
      auVar388._28_4_ = 0x3f800000;
      auVar107 = vsubps_avx(auVar57,auVar58);
      auVar59._4_4_ = (float)local_7c0._4_4_ * fVar284;
      auVar59._0_4_ = (float)local_7c0._0_4_ * fVar270;
      auVar59._8_4_ = fStack_7b8 * fVar287;
      auVar59._12_4_ = fStack_7b4 * fVar291;
      auVar59._16_4_ = fStack_7b0 * fVar295;
      auVar59._20_4_ = fStack_7ac * fVar299;
      auVar59._24_4_ = fStack_7a8 * fVar303;
      auVar59._28_4_ = uVar8;
      auVar24 = vsubps_avx(auVar107,auVar59);
      auVar107 = vrcpps_avx(auVar24);
      fVar201 = auVar107._0_4_;
      fVar202 = auVar107._4_4_;
      auVar60._4_4_ = auVar24._4_4_ * fVar202;
      auVar60._0_4_ = auVar24._0_4_ * fVar201;
      fVar203 = auVar107._8_4_;
      auVar60._8_4_ = auVar24._8_4_ * fVar203;
      fVar225 = auVar107._12_4_;
      auVar60._12_4_ = auVar24._12_4_ * fVar225;
      fVar226 = auVar107._16_4_;
      auVar60._16_4_ = auVar24._16_4_ * fVar226;
      fVar237 = auVar107._20_4_;
      auVar60._20_4_ = auVar24._20_4_ * fVar237;
      fVar238 = auVar107._24_4_;
      auVar60._24_4_ = auVar24._24_4_ * fVar238;
      auVar60._28_4_ = fStack_7a4;
      auVar31 = vsubps_avx(auVar388,auVar60);
      auVar109._8_4_ = 0x7fffffff;
      auVar109._0_8_ = 0x7fffffff7fffffff;
      auVar109._12_4_ = 0x7fffffff;
      auVar109._16_4_ = 0x7fffffff;
      auVar109._20_4_ = 0x7fffffff;
      auVar109._24_4_ = 0x7fffffff;
      auVar109._28_4_ = 0x7fffffff;
      auVar107 = vandps_avx(auVar24,auVar109);
      auVar26 = vcmpps_avx(auVar107,auVar410,1);
      auVar61._4_4_ = (fVar202 + fVar202 * auVar31._4_4_) * -auVar22._4_4_;
      auVar61._0_4_ = (fVar201 + fVar201 * auVar31._0_4_) * -auVar22._0_4_;
      auVar61._8_4_ = (fVar203 + fVar203 * auVar31._8_4_) * -auVar22._8_4_;
      auVar61._12_4_ = (fVar225 + fVar225 * auVar31._12_4_) * -auVar22._12_4_;
      auVar61._16_4_ = (fVar226 + fVar226 * auVar31._16_4_) * -auVar22._16_4_;
      auVar61._20_4_ = (fVar237 + fVar237 * auVar31._20_4_) * -auVar22._20_4_;
      auVar61._24_4_ = (fVar238 + fVar238 * auVar31._24_4_) * -auVar22._24_4_;
      auVar61._28_4_ = auVar22._28_4_ ^ 0x80000000;
      auVar107 = vcmpps_avx(auVar24,auVar278,1);
      auVar107 = vorps_avx(auVar26,auVar107);
      auVar107 = vblendvps_avx(auVar61,auVar350,auVar107);
      _local_600 = vmaxps_avx(auVar29,auVar107);
      auVar107 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,6);
      auVar107 = vorps_avx(auVar26,auVar107);
      auVar107 = vblendvps_avx(auVar61,auVar359,auVar107);
      auVar106 = vandps_avx(auVar106,local_480);
      local_300 = vminps_avx(auVar30,auVar107);
      auVar107 = vcmpps_avx(_local_600,local_300,2);
      auVar26 = auVar106 & auVar107;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar26 >> 0x7f,0) == '\0') &&
            (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar26 >> 0xbf,0) == '\0') &&
          (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar26[0x1f])
      goto LAB_00f965a9;
      auVar24 = _local_600;
      auVar26 = vminps_avx(auVar234,auVar108);
      auVar22 = vminps_avx(auVar23,auVar27);
      auVar26 = vminps_avx(auVar26,auVar22);
      auVar26 = vsubps_avx(auVar26,_local_640);
      auVar353 = ZEXT1264(ZEXT812(0)) << 0x20;
      auVar106 = vandps_avx(auVar107,auVar106);
      auVar80._4_4_ = fStack_61c;
      auVar80._0_4_ = local_620;
      auVar80._8_4_ = fStack_618;
      auVar80._12_4_ = fStack_614;
      auVar80._16_4_ = fStack_610;
      auVar80._20_4_ = fStack_60c;
      auVar80._24_4_ = fStack_608;
      auVar80._28_4_ = fStack_604;
      auVar107 = vminps_avx(auVar80,auVar388);
      auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
      local_1a0[0] = fVar91 + fVar121 * (auVar107._0_4_ + 0.0) * 0.125;
      local_1a0[1] = fVar117 + fVar147 * (auVar107._4_4_ + 1.0) * 0.125;
      local_1a0[2] = fVar118 + fVar150 * (auVar107._8_4_ + 2.0) * 0.125;
      local_1a0[3] = fVar119 + fVar152 * (auVar107._12_4_ + 3.0) * 0.125;
      fStack_190 = fVar91 + fVar121 * (auVar107._16_4_ + 4.0) * 0.125;
      fStack_18c = fVar117 + fVar147 * (auVar107._20_4_ + 5.0) * 0.125;
      fStack_188 = fVar118 + fVar150 * (auVar107._24_4_ + 6.0) * 0.125;
      fStack_184 = fVar119 + auVar107._28_4_ + 7.0;
      auVar107 = vminps_avx(_local_660,auVar388);
      auVar107 = vmaxps_avx(auVar107,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar91 + fVar121 * (auVar107._0_4_ + 0.0) * 0.125;
      local_1c0[1] = fVar117 + fVar147 * (auVar107._4_4_ + 1.0) * 0.125;
      local_1c0[2] = fVar118 + fVar150 * (auVar107._8_4_ + 2.0) * 0.125;
      local_1c0[3] = fVar119 + fVar152 * (auVar107._12_4_ + 3.0) * 0.125;
      fStack_1b0 = fVar91 + fVar121 * (auVar107._16_4_ + 4.0) * 0.125;
      fStack_1ac = fVar117 + fVar147 * (auVar107._20_4_ + 5.0) * 0.125;
      fStack_1a8 = fVar118 + fVar150 * (auVar107._24_4_ + 6.0) * 0.125;
      fStack_1a4 = fVar119 + auVar107._28_4_ + 7.0;
      auVar62._4_4_ = auVar26._4_4_ * 0.99999976;
      auVar62._0_4_ = auVar26._0_4_ * 0.99999976;
      auVar62._8_4_ = auVar26._8_4_ * 0.99999976;
      auVar62._12_4_ = auVar26._12_4_ * 0.99999976;
      auVar62._16_4_ = auVar26._16_4_ * 0.99999976;
      auVar62._20_4_ = auVar26._20_4_ * 0.99999976;
      auVar62._24_4_ = auVar26._24_4_ * 0.99999976;
      auVar62._28_4_ = 0x3f7ffffc;
      auVar107 = vmaxps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar62);
      auVar63._4_4_ = auVar107._4_4_ * auVar107._4_4_;
      auVar63._0_4_ = auVar107._0_4_ * auVar107._0_4_;
      auVar63._8_4_ = auVar107._8_4_ * auVar107._8_4_;
      auVar63._12_4_ = auVar107._12_4_ * auVar107._12_4_;
      auVar63._16_4_ = auVar107._16_4_ * auVar107._16_4_;
      auVar63._20_4_ = auVar107._20_4_ * auVar107._20_4_;
      auVar63._24_4_ = auVar107._24_4_ * auVar107._24_4_;
      auVar63._28_4_ = auVar107._28_4_;
      auVar26 = vsubps_avx(auVar32,auVar63);
      auVar64._4_4_ = auVar26._4_4_ * (float)local_580._4_4_;
      auVar64._0_4_ = auVar26._0_4_ * (float)local_580._0_4_;
      auVar64._8_4_ = auVar26._8_4_ * fStack_578;
      auVar64._12_4_ = auVar26._12_4_ * fStack_574;
      auVar64._16_4_ = auVar26._16_4_ * fStack_570;
      auVar64._20_4_ = auVar26._20_4_ * fStack_56c;
      auVar64._24_4_ = auVar26._24_4_ * fStack_568;
      auVar64._28_4_ = auVar107._28_4_;
      auVar360 = vsubps_avx(local_560,auVar64);
      auVar107 = vcmpps_avx(auVar360,ZEXT832(0) << 0x20,5);
      auVar409 = ZEXT3264(_local_960);
      if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar107 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar107 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar107 >> 0x7f,0) == '\0') &&
            (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar107 >> 0xbf,0) == '\0') &&
          (auVar107 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar107[0x1f]) {
        _local_820 = ZEXT832(0) << 0x20;
        _local_840 = ZEXT832(0) << 0x20;
        auVar313 = ZEXT864(0) << 0x20;
        auVar217 = ZEXT1628(ZEXT816(0) << 0x40);
        auVar255._8_4_ = 0x7f800000;
        auVar255._0_8_ = 0x7f8000007f800000;
        auVar255._12_4_ = 0x7f800000;
        auVar255._16_4_ = 0x7f800000;
        auVar255._20_4_ = 0x7f800000;
        auVar255._24_4_ = 0x7f800000;
        auVar255._28_4_ = 0x7f800000;
        auVar279._8_4_ = 0xff800000;
        auVar279._0_8_ = 0xff800000ff800000;
        auVar279._12_4_ = 0xff800000;
        auVar279._16_4_ = 0xff800000;
        auVar279._20_4_ = 0xff800000;
        auVar279._24_4_ = 0xff800000;
        auVar279._28_4_ = 0xff800000;
        _local_800 = _local_820;
      }
      else {
        auVar23 = vsqrtps_avx(auVar360);
        auVar198._0_4_ = fVar149 + fVar149;
        auVar198._4_4_ = fVar391 + fVar391;
        auVar198._8_4_ = fVar153 + fVar153;
        auVar198._12_4_ = fVar393 + fVar393;
        auVar198._16_4_ = fVar154 + fVar154;
        auVar198._20_4_ = fVar396 + fVar396;
        auVar198._24_4_ = fVar344 + fVar344;
        auVar198._28_4_ = fVar122 + fVar122;
        auVar22 = vrcpps_avx(auVar198);
        fVar122 = auVar22._0_4_;
        fVar201 = auVar22._4_4_;
        auVar65._4_4_ = auVar198._4_4_ * fVar201;
        auVar65._0_4_ = auVar198._0_4_ * fVar122;
        fVar202 = auVar22._8_4_;
        auVar65._8_4_ = auVar198._8_4_ * fVar202;
        fVar203 = auVar22._12_4_;
        auVar65._12_4_ = auVar198._12_4_ * fVar203;
        fVar225 = auVar22._16_4_;
        auVar65._16_4_ = auVar198._16_4_ * fVar225;
        fVar226 = auVar22._20_4_;
        auVar65._20_4_ = auVar198._20_4_ * fVar226;
        fVar237 = auVar22._24_4_;
        auVar65._24_4_ = auVar198._24_4_ * fVar237;
        auVar65._28_4_ = auVar198._28_4_;
        auVar27 = vsubps_avx(auVar388,auVar65);
        fVar122 = fVar122 + fVar122 * auVar27._0_4_;
        fVar201 = fVar201 + fVar201 * auVar27._4_4_;
        fVar202 = fVar202 + fVar202 * auVar27._8_4_;
        fVar203 = fVar203 + fVar203 * auVar27._12_4_;
        fVar225 = fVar225 + fVar225 * auVar27._16_4_;
        fVar226 = fVar226 + fVar226 * auVar27._20_4_;
        fVar237 = fVar237 + fVar237 * auVar27._24_4_;
        fVar238 = auVar22._28_4_ + auVar27._28_4_;
        auVar219._0_8_ = local_9e0._0_8_ ^ 0x8000000080000000;
        auVar219._8_4_ = -local_9e0._8_4_;
        auVar219._12_4_ = -local_9e0._12_4_;
        auVar219._16_4_ = -local_9e0._16_4_;
        auVar219._20_4_ = -local_9e0._20_4_;
        auVar219._24_4_ = -local_9e0._24_4_;
        auVar219._28_4_ = -local_9e0._28_4_;
        auVar22 = vsubps_avx(auVar219,auVar23);
        fVar362 = auVar22._0_4_ * fVar122;
        fVar370 = auVar22._4_4_ * fVar201;
        auVar66._4_4_ = fVar370;
        auVar66._0_4_ = fVar362;
        fVar395 = auVar22._8_4_ * fVar202;
        auVar66._8_4_ = fVar395;
        fVar398 = auVar22._12_4_ * fVar203;
        auVar66._12_4_ = fVar398;
        fVar379 = auVar22._16_4_ * fVar225;
        auVar66._16_4_ = fVar379;
        fVar403 = auVar22._20_4_ * fVar226;
        auVar66._20_4_ = fVar403;
        fVar381 = auVar22._24_4_ * fVar237;
        auVar66._24_4_ = fVar381;
        auVar66._28_4_ = 0x3f800000;
        auVar23 = vsubps_avx(auVar23,local_9e0);
        fVar122 = auVar23._0_4_ * fVar122;
        fVar201 = auVar23._4_4_ * fVar201;
        auVar67._4_4_ = fVar201;
        auVar67._0_4_ = fVar122;
        fVar202 = auVar23._8_4_ * fVar202;
        auVar67._8_4_ = fVar202;
        fVar203 = auVar23._12_4_ * fVar203;
        auVar67._12_4_ = fVar203;
        fVar225 = auVar23._16_4_ * fVar225;
        auVar67._16_4_ = fVar225;
        fVar226 = auVar23._20_4_ * fVar226;
        auVar67._20_4_ = fVar226;
        fVar237 = auVar23._24_4_ * fVar237;
        auVar67._24_4_ = fVar237;
        auVar67._28_4_ = fVar372;
        local_2e0 = auVar28;
        fVar240 = fVar401 * (fVar362 * local_4e0 + fVar271);
        fVar242 = fVar404 * (fVar370 * fStack_4dc + fVar285);
        fVar328 = fVar261 * (fVar395 * fStack_4d8 + fVar288);
        fVar332 = fVar262 * (fVar398 * fStack_4d4 + fVar292);
        fVar334 = fVar264 * (fVar379 * fStack_4d0 + fVar296);
        fVar342 = fVar266 * (fVar403 * fStack_4cc + fVar300);
        fVar355 = fVar268 * (fVar381 * fStack_4c8 + fVar304);
        auVar140._0_4_ = fVar329 + fVar180 * fVar240;
        auVar140._4_4_ = fVar333 + fVar224 * fVar242;
        auVar140._8_4_ = fVar335 + fVar227 * fVar328;
        auVar140._12_4_ = fVar337 + fVar245 * fVar332;
        auVar140._16_4_ = fVar339 + fVar340 * fVar334;
        auVar140._20_4_ = fVar341 + fVar363 * fVar342;
        auVar140._24_4_ = fVar343 + fVar377 * fVar355;
        auVar140._28_4_ = fVar345 + auVar23._28_4_ + fVar307;
        auVar68._4_4_ = (float)local_7c0._4_4_ * fVar370;
        auVar68._0_4_ = (float)local_7c0._0_4_ * fVar362;
        auVar68._8_4_ = fStack_7b8 * fVar395;
        auVar68._12_4_ = fStack_7b4 * fVar398;
        auVar68._16_4_ = fStack_7b0 * fVar379;
        auVar68._20_4_ = fStack_7ac * fVar403;
        auVar68._24_4_ = fStack_7a8 * fVar381;
        auVar68._28_4_ = fVar238;
        auVar27 = vsubps_avx(auVar68,auVar140);
        auVar199._0_4_ = fVar155 + fVar148 * fVar240;
        auVar199._4_4_ = fVar173 + fVar205 * fVar242;
        auVar199._8_4_ = fVar174 + fVar239 * fVar328;
        auVar199._12_4_ = fVar175 + fVar243 * fVar332;
        auVar199._16_4_ = fVar176 + fVar336 * fVar334;
        auVar199._20_4_ = fVar177 + fVar364 * fVar342;
        auVar199._24_4_ = fVar178 + fVar373 * fVar355;
        auVar199._28_4_ = fVar179 + fVar238;
        auVar256._0_4_ = fVar362 * (float)local_7e0._0_4_;
        auVar256._4_4_ = fVar370 * (float)local_7e0._4_4_;
        auVar256._8_4_ = fVar395 * fStack_7d8;
        auVar256._12_4_ = fVar398 * fStack_7d4;
        auVar256._16_4_ = fVar379 * fStack_7d0;
        auVar256._20_4_ = fVar403 * fStack_7cc;
        auVar256._24_4_ = fVar381 * fStack_7c8;
        auVar256._28_4_ = 0;
        local_980 = vsubps_avx(auVar256,auVar199);
        auVar220._0_4_ = local_8e0 + fVar151 * fVar240;
        auVar220._4_4_ = fStack_8dc + fVar223 * fVar242;
        auVar220._8_4_ = fStack_8d8 + fVar241 * fVar328;
        auVar220._12_4_ = fStack_8d4 + fVar244 * fVar332;
        auVar220._16_4_ = fStack_8d0 + fVar338 * fVar334;
        auVar220._20_4_ = fStack_8cc + fVar368 * fVar342;
        auVar220._24_4_ = fStack_8c8 + fVar375 * fVar355;
        auVar220._28_4_ = fStack_8c4 + auVar22._28_4_;
        auVar69._4_4_ = fVar370 * (float)local_7a0._4_4_;
        auVar69._0_4_ = fVar362 * (float)local_7a0._0_4_;
        auVar69._8_4_ = fVar395 * fStack_798;
        auVar69._12_4_ = fVar398 * fStack_794;
        auVar69._16_4_ = fVar379 * fStack_790;
        auVar69._20_4_ = fVar403 * fStack_78c;
        auVar69._24_4_ = fVar381 * fStack_788;
        auVar69._28_4_ = 0;
        auVar22 = vsubps_avx(auVar69,auVar220);
        auVar217 = auVar22._0_28_;
        fVar401 = (fVar122 * local_4e0 + fVar271) * fVar401;
        fVar404 = (fVar201 * fStack_4dc + fVar285) * fVar404;
        fVar261 = (fVar202 * fStack_4d8 + fVar288) * fVar261;
        fVar262 = (fVar203 * fStack_4d4 + fVar292) * fVar262;
        fVar264 = (fVar225 * fStack_4d0 + fVar296) * fVar264;
        fVar266 = (fVar226 * fStack_4cc + fVar300) * fVar266;
        fVar268 = (fVar237 * fStack_4c8 + fVar304) * fVar268;
        auVar280._0_4_ = fVar329 + fVar180 * fVar401;
        auVar280._4_4_ = fVar333 + fVar224 * fVar404;
        auVar280._8_4_ = fVar335 + fVar227 * fVar261;
        auVar280._12_4_ = fVar337 + fVar245 * fVar262;
        auVar280._16_4_ = fVar339 + fVar340 * fVar264;
        auVar280._20_4_ = fVar341 + fVar363 * fVar266;
        auVar280._24_4_ = fVar343 + fVar377 * fVar268;
        auVar280._28_4_ = fVar345 + (float)local_5e0._28_4_;
        auVar70._4_4_ = (float)local_7c0._4_4_ * fVar201;
        auVar70._0_4_ = (float)local_7c0._0_4_ * fVar122;
        auVar70._8_4_ = fStack_7b8 * fVar202;
        auVar70._12_4_ = fStack_7b4 * fVar203;
        auVar70._16_4_ = fStack_7b0 * fVar225;
        auVar70._20_4_ = fStack_7ac * fVar226;
        auVar70._24_4_ = fStack_7a8 * fVar237;
        auVar70._28_4_ = fVar345;
        _local_800 = vsubps_avx(auVar70,auVar280);
        auVar281._0_4_ = fVar155 + fVar148 * fVar401;
        auVar281._4_4_ = fVar173 + fVar205 * fVar404;
        auVar281._8_4_ = fVar174 + fVar239 * fVar261;
        auVar281._12_4_ = fVar175 + fVar243 * fVar262;
        auVar281._16_4_ = fVar176 + fVar336 * fVar264;
        auVar281._20_4_ = fVar177 + fVar364 * fVar266;
        auVar281._24_4_ = fVar178 + fVar373 * fVar268;
        auVar281._28_4_ = fVar179 + local_800._28_4_;
        auVar71._4_4_ = fVar201 * (float)local_7e0._4_4_;
        auVar71._0_4_ = fVar122 * (float)local_7e0._0_4_;
        auVar71._8_4_ = fVar202 * fStack_7d8;
        auVar71._12_4_ = fVar203 * fStack_7d4;
        auVar71._16_4_ = fVar225 * fStack_7d0;
        auVar71._20_4_ = fVar226 * fStack_7cc;
        auVar71._24_4_ = fVar237 * fStack_7c8;
        auVar71._28_4_ = fVar345;
        _local_820 = vsubps_avx(auVar71,auVar281);
        auVar257._0_4_ = local_8e0 + fVar151 * fVar401;
        auVar257._4_4_ = fStack_8dc + fVar223 * fVar404;
        auVar257._8_4_ = fStack_8d8 + fVar241 * fVar261;
        auVar257._12_4_ = fStack_8d4 + fVar244 * fVar262;
        auVar257._16_4_ = fStack_8d0 + fVar338 * fVar264;
        auVar257._20_4_ = fStack_8cc + fVar368 * fVar266;
        auVar257._24_4_ = fStack_8c8 + fVar375 * fVar268;
        auVar257._28_4_ = fStack_8c4 + fVar307 + 0.0;
        auVar72._4_4_ = fVar201 * (float)local_7a0._4_4_;
        auVar72._0_4_ = fVar122 * (float)local_7a0._0_4_;
        auVar72._8_4_ = fVar202 * fStack_798;
        auVar72._12_4_ = fVar203 * fStack_794;
        auVar72._16_4_ = fVar225 * fStack_790;
        auVar72._20_4_ = fVar226 * fStack_78c;
        auVar72._24_4_ = fVar237 * fStack_788;
        auVar72._28_4_ = auVar281._28_4_;
        _local_840 = vsubps_avx(auVar72,auVar257);
        auVar23 = vcmpps_avx(auVar360,_DAT_01faff00,5);
        auVar258._8_4_ = 0x7f800000;
        auVar258._0_8_ = 0x7f8000007f800000;
        auVar258._12_4_ = 0x7f800000;
        auVar258._16_4_ = 0x7f800000;
        auVar258._20_4_ = 0x7f800000;
        auVar258._24_4_ = 0x7f800000;
        auVar258._28_4_ = 0x7f800000;
        auVar255 = vblendvps_avx(auVar258,auVar66,auVar23);
        auVar351._8_4_ = 0x7fffffff;
        auVar351._0_8_ = 0x7fffffff7fffffff;
        auVar351._12_4_ = 0x7fffffff;
        auVar351._16_4_ = 0x7fffffff;
        auVar351._20_4_ = 0x7fffffff;
        auVar351._24_4_ = 0x7fffffff;
        auVar351._28_4_ = 0x7fffffff;
        auVar22 = vandps_avx(auVar351,local_2c0);
        auVar22 = vmaxps_avx(local_4a0,auVar22);
        auVar360._8_4_ = 0x36000000;
        auVar360._0_8_ = 0x3600000036000000;
        auVar360._12_4_ = 0x36000000;
        auVar360._16_4_ = 0x36000000;
        auVar360._20_4_ = 0x36000000;
        auVar360._24_4_ = 0x36000000;
        auVar360._28_4_ = 0x36000000;
        auVar73._4_4_ = auVar22._4_4_ * 1.9073486e-06;
        auVar73._0_4_ = auVar22._0_4_ * 1.9073486e-06;
        auVar73._8_4_ = auVar22._8_4_ * 1.9073486e-06;
        auVar73._12_4_ = auVar22._12_4_ * 1.9073486e-06;
        auVar73._16_4_ = auVar22._16_4_ * 1.9073486e-06;
        auVar73._20_4_ = auVar22._20_4_ * 1.9073486e-06;
        auVar73._24_4_ = auVar22._24_4_ * 1.9073486e-06;
        auVar73._28_4_ = auVar22._28_4_;
        auVar22 = vandps_avx(auVar351,local_4c0);
        auVar22 = vcmpps_avx(auVar22,auVar73,1);
        auVar282._8_4_ = 0xff800000;
        auVar282._0_8_ = 0xff800000ff800000;
        auVar282._12_4_ = 0xff800000;
        auVar282._16_4_ = 0xff800000;
        auVar282._20_4_ = 0xff800000;
        auVar282._24_4_ = 0xff800000;
        auVar282._28_4_ = 0xff800000;
        auVar279 = vblendvps_avx(auVar282,auVar67,auVar23);
        auVar28 = auVar23 & auVar22;
        if ((((((((auVar28 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar28 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar28 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar28 >> 0x7f,0) != '\0') ||
              (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar28 >> 0xbf,0) != '\0') ||
            (auVar28 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar28[0x1f] < '\0') {
          auVar107 = vandps_avx(auVar22,auVar23);
          auVar193 = vpackssdw_avx(auVar107._0_16_,auVar107._16_16_);
          auVar22 = vcmpps_avx(auVar26,ZEXT832(0) << 0x20,2);
          auVar412._8_4_ = 0xff800000;
          auVar412._0_8_ = 0xff800000ff800000;
          auVar412._12_4_ = 0xff800000;
          auVar412._16_4_ = 0xff800000;
          auVar412._20_4_ = 0xff800000;
          auVar412._24_4_ = 0xff800000;
          auVar412._28_4_ = 0xff800000;
          auVar390._8_4_ = 0x7f800000;
          auVar390._0_8_ = 0x7f8000007f800000;
          auVar390._12_4_ = 0x7f800000;
          auVar390._16_4_ = 0x7f800000;
          auVar390._20_4_ = 0x7f800000;
          auVar390._24_4_ = 0x7f800000;
          auVar390._28_4_ = 0x7f800000;
          auVar26 = vblendvps_avx(auVar390,auVar412,auVar22);
          auVar190 = vpmovsxwd_avx(auVar193);
          auVar193 = vpunpckhwd_avx(auVar193,auVar193);
          auVar352._16_16_ = auVar193;
          auVar352._0_16_ = auVar190;
          auVar255 = vblendvps_avx(auVar255,auVar26,auVar352);
          auVar360 = vblendvps_avx(auVar412,auVar390,auVar22);
          auVar279 = vblendvps_avx(auVar279,auVar360,auVar352);
          auVar26 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
          auVar116._0_4_ = auVar26._0_4_ ^ auVar107._0_4_;
          auVar116._4_4_ = auVar26._4_4_ ^ auVar107._4_4_;
          auVar116._8_4_ = auVar26._8_4_ ^ auVar107._8_4_;
          auVar116._12_4_ = auVar26._12_4_ ^ auVar107._12_4_;
          auVar116._16_4_ = auVar26._16_4_ ^ auVar107._16_4_;
          auVar116._20_4_ = auVar26._20_4_ ^ auVar107._20_4_;
          auVar116._24_4_ = auVar26._24_4_ ^ auVar107._24_4_;
          auVar116._28_4_ = auVar26._28_4_ ^ auVar107._28_4_;
          auVar107 = vorps_avx(auVar22,auVar116);
          auVar107 = vandps_avx(auVar23,auVar107);
        }
        auVar313 = ZEXT3264(auVar27);
        auVar353 = ZEXT3264(local_980);
      }
      auVar361 = ZEXT3264(auVar360);
      _local_360 = _local_600;
      local_340 = vminps_avx(local_300,auVar255);
      local_320 = vmaxps_avx(_local_600,auVar279);
      auVar26 = vcmpps_avx(_local_600,local_340,2);
      local_560 = vandps_avx(auVar106,auVar26);
      auVar26 = vcmpps_avx(local_320,local_300,2);
      local_5a0 = vandps_avx(auVar106,auVar26);
      auVar106 = vorps_avx(local_5a0,local_560);
      if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar106 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar106 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar106 >> 0x7f,0) != '\0') ||
            (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar106 >> 0xbf,0) != '\0') ||
          (auVar106 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar106[0x1f] < '\0') {
        _local_640 = local_320;
        auVar26 = _local_640;
        _local_660 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT832(0) << 0x20,0xf);
        local_5c0._0_4_ = auVar107._0_4_ ^ local_660._0_4_;
        local_5c0._4_4_ = auVar107._4_4_ ^ local_660._4_4_;
        local_5c0._8_4_ = auVar107._8_4_ ^ local_660._8_4_;
        local_5c0._12_4_ = auVar107._12_4_ ^ local_660._12_4_;
        local_5c0._16_4_ = auVar107._16_4_ ^ local_660._16_4_;
        local_5c0._20_4_ = auVar107._20_4_ ^ local_660._20_4_;
        local_5c0._24_4_ = auVar107._24_4_ ^ local_660._24_4_;
        local_5c0._28_4_ = (uint)auVar107._28_4_ ^ (uint)local_660._28_4_;
        auVar112._0_4_ =
             auVar313._0_4_ * (float)local_7c0._0_4_ +
             auVar353._0_4_ * (float)local_7e0._0_4_ + (float)local_7a0._0_4_ * auVar217._0_4_;
        auVar112._4_4_ =
             auVar313._4_4_ * (float)local_7c0._4_4_ +
             auVar353._4_4_ * (float)local_7e0._4_4_ + (float)local_7a0._4_4_ * auVar217._4_4_;
        auVar112._8_4_ =
             auVar313._8_4_ * fStack_7b8 + auVar353._8_4_ * fStack_7d8 + fStack_798 * auVar217._8_4_
        ;
        auVar112._12_4_ =
             auVar313._12_4_ * fStack_7b4 +
             auVar353._12_4_ * fStack_7d4 + fStack_794 * auVar217._12_4_;
        auVar112._16_4_ =
             auVar313._16_4_ * fStack_7b0 +
             auVar353._16_4_ * fStack_7d0 + fStack_790 * auVar217._16_4_;
        auVar112._20_4_ =
             auVar313._20_4_ * fStack_7ac +
             auVar353._20_4_ * fStack_7cc + fStack_78c * auVar217._20_4_;
        auVar112._24_4_ =
             auVar313._24_4_ * fStack_7a8 +
             auVar353._24_4_ * fStack_7c8 + fStack_788 * auVar217._24_4_;
        auVar112._28_4_ = auVar107._28_4_ + local_660._28_4_ + 0.0;
        auVar141._8_4_ = 0x7fffffff;
        auVar141._0_8_ = 0x7fffffff7fffffff;
        auVar141._12_4_ = 0x7fffffff;
        auVar141._16_4_ = 0x7fffffff;
        auVar141._20_4_ = 0x7fffffff;
        auVar141._24_4_ = 0x7fffffff;
        auVar141._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar112,auVar141);
        auVar142._8_4_ = 0x3e99999a;
        auVar142._0_8_ = 0x3e99999a3e99999a;
        auVar142._12_4_ = 0x3e99999a;
        auVar142._16_4_ = 0x3e99999a;
        auVar142._20_4_ = 0x3e99999a;
        auVar142._24_4_ = 0x3e99999a;
        auVar142._28_4_ = 0x3e99999a;
        auVar106 = vcmpps_avx(auVar106,auVar142,1);
        auVar106 = vorps_avx(auVar106,local_5c0);
        auVar143._8_4_ = 3;
        auVar143._0_8_ = 0x300000003;
        auVar143._12_4_ = 3;
        auVar143._16_4_ = 3;
        auVar143._20_4_ = 3;
        auVar143._24_4_ = 3;
        auVar143._28_4_ = 3;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar106 = vblendvps_avx(auVar167,auVar143,auVar106);
        local_5e0 = ZEXT432(local_c28);
        auVar190 = vpshufd_avx(ZEXT416(local_c28),0);
        auVar193 = vpcmpgtd_avx(auVar106._16_16_,auVar190);
        local_620 = auVar190._0_4_;
        fStack_61c = auVar190._4_4_;
        fStack_618 = auVar190._8_4_;
        fStack_614 = auVar190._12_4_;
        auVar190 = vpcmpgtd_avx(auVar106._0_16_,auVar190);
        auVar144._16_16_ = auVar193;
        auVar144._0_16_ = auVar190;
        _local_580 = vblendps_avx(ZEXT1632(auVar190),auVar144,0xf0);
        local_540 = vandnps_avx(_local_580,local_560);
        auVar313 = ZEXT3264(local_540);
        auVar106 = local_560 & ~_local_580;
        local_a50 = auVar21._0_4_;
        fStack_a4c = auVar21._4_4_;
        fStack_a48 = auVar21._8_4_;
        fStack_a44 = auVar21._12_4_;
        local_a30 = auVar19._0_4_;
        fStack_a2c = auVar19._4_4_;
        fStack_a28 = auVar19._8_4_;
        fStack_a24 = auVar19._12_4_;
        local_a40 = auVar20._0_4_;
        fStack_a3c = auVar20._4_4_;
        fStack_a38 = auVar20._8_4_;
        fStack_a34 = auVar20._12_4_;
        local_a20 = auVar18._0_4_;
        fStack_a1c = auVar18._4_4_;
        fStack_a18 = auVar18._8_4_;
        fStack_a14 = auVar18._12_4_;
        if ((((((((auVar106 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar106 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar106 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar106 >> 0x7f,0) == '\0') &&
              (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar106 >> 0xbf,0) == '\0') &&
            (auVar106 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar106[0x1f]) {
          auVar193 = vshufps_avx(local_510,local_510,0);
          auVar113._16_16_ = auVar193;
          auVar113._0_16_ = auVar193;
          local_640._0_4_ = local_320._0_4_;
          local_640._4_4_ = local_320._4_4_;
          fStack_638 = local_320._8_4_;
          fStack_634 = local_320._12_4_;
          fStack_630 = local_320._16_4_;
          fStack_62c = local_320._20_4_;
          fStack_628 = local_320._24_4_;
          fStack_624 = local_320._28_4_;
          auVar217 = local_7c0._0_28_;
          fVar122 = (float)local_640._0_4_;
          fVar148 = (float)local_640._4_4_;
          fVar151 = fStack_638;
          fVar180 = fStack_634;
          fVar201 = fStack_630;
          fVar202 = fStack_62c;
          fVar203 = fStack_628;
          fVar205 = fStack_624;
          _local_640 = auVar26;
        }
        else {
          local_900._4_4_ = (float)local_600._4_4_ + (float)local_9c0._4_4_;
          local_900._0_4_ = (float)local_600._0_4_ + (float)local_9c0._0_4_;
          fStack_8f8 = fStack_5f8 + fStack_9b8;
          fStack_8f4 = fStack_5f4 + fStack_9b4;
          fStack_8f0 = fStack_5f0 + fStack_9b0;
          fStack_8ec = fStack_5ec + fStack_9ac;
          fStack_8e8 = fStack_5e8 + fStack_9a8;
          fStack_8e4 = fStack_5e4 + fStack_9a4;
          _local_600 = auVar24;
          do {
            auVar114._8_4_ = 0x7f800000;
            auVar114._0_8_ = 0x7f8000007f800000;
            auVar114._12_4_ = 0x7f800000;
            auVar114._16_4_ = 0x7f800000;
            auVar114._20_4_ = 0x7f800000;
            auVar114._24_4_ = 0x7f800000;
            auVar114._28_4_ = 0x7f800000;
            auVar106 = auVar313._0_32_;
            auVar107 = vblendvps_avx(auVar114,_local_600,auVar106);
            auVar26 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar26 = vminps_avx(auVar107,auVar26);
            auVar22 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar22 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar107 = vcmpps_avx(auVar107,auVar26,0);
            auVar26 = auVar106 & auVar107;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar106 = vandps_avx(auVar107,auVar106);
            }
            uVar82 = vmovmskps_avx(auVar106);
            uVar85 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
              }
            }
            uVar83 = (ulong)uVar85;
            *(undefined4 *)(local_540 + uVar83 * 4) = 0;
            fVar122 = local_1a0[uVar83];
            uVar85 = *(uint *)(local_360 + uVar83 * 4);
            fVar148 = auVar17._0_4_;
            if ((float)local_920._0_4_ < 0.0) {
              fVar148 = sqrtf((float)local_920._0_4_);
            }
            auVar190 = vminps_avx(auVar18,auVar20);
            auVar193 = vmaxps_avx(auVar18,auVar20);
            auVar133 = vminps_avx(auVar19,auVar21);
            auVar101 = vminps_avx(auVar190,auVar133);
            auVar190 = vmaxps_avx(auVar19,auVar21);
            auVar133 = vmaxps_avx(auVar193,auVar190);
            auVar184._8_4_ = 0x7fffffff;
            auVar184._0_8_ = 0x7fffffff7fffffff;
            auVar184._12_4_ = 0x7fffffff;
            auVar193 = vandps_avx(auVar101,auVar184);
            auVar190 = vandps_avx(auVar133,auVar184);
            auVar193 = vmaxps_avx(auVar193,auVar190);
            auVar190 = vmovshdup_avx(auVar193);
            auVar190 = vmaxss_avx(auVar190,auVar193);
            auVar193 = vshufpd_avx(auVar193,auVar193,1);
            auVar193 = vmaxss_avx(auVar193,auVar190);
            local_8e0 = auVar193._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar148 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar133,auVar133,0xff);
            auVar193 = vinsertps_avx(ZEXT416(uVar85),ZEXT416((uint)fVar122),0x10);
            auVar353 = ZEXT1664(auVar193);
            lVar90 = 5;
            do {
              auVar92 = auVar353._0_16_;
              auVar193 = vshufps_avx(auVar92,auVar92,0);
              auVar97._0_4_ = auVar193._0_4_ * (float)local_910._0_4_ + 0.0;
              auVar97._4_4_ = auVar193._4_4_ * (float)local_910._4_4_ + 0.0;
              auVar97._8_4_ = auVar193._8_4_ * fStack_908 + 0.0;
              auVar97._12_4_ = auVar193._12_4_ * fStack_904 + 0.0;
              auVar193 = vmovshdup_avx(auVar92);
              fVar201 = auVar193._0_4_;
              fVar151 = 1.0 - fVar201;
              fVar148 = fVar201 * 3.0;
              fVar122 = fVar148 + -5.0;
              auVar193 = ZEXT416((uint)(fVar201 * fVar201 * -fVar151 * 0.5));
              auVar193 = vshufps_avx(auVar193,auVar193,0);
              auVar190 = ZEXT416((uint)((fVar151 * fVar151 * (fVar151 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar190 = vshufps_avx(auVar190,auVar190,0);
              auVar133 = ZEXT416((uint)((fVar201 * fVar201 * fVar122 + 2.0) * 0.5));
              auVar133 = vshufps_avx(auVar133,auVar133,0);
              auVar101 = ZEXT416((uint)(fVar151 * fVar151 * -fVar201 * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar158._0_4_ =
                   auVar101._0_4_ * local_a20 +
                   auVar133._0_4_ * local_a40 +
                   auVar190._0_4_ * local_a30 + auVar193._0_4_ * local_a50;
              auVar158._4_4_ =
                   auVar101._4_4_ * fStack_a1c +
                   auVar133._4_4_ * fStack_a3c +
                   auVar190._4_4_ * fStack_a2c + auVar193._4_4_ * fStack_a4c;
              auVar158._8_4_ =
                   auVar101._8_4_ * fStack_a18 +
                   auVar133._8_4_ * fStack_a38 +
                   auVar190._8_4_ * fStack_a28 + auVar193._8_4_ * fStack_a48;
              auVar158._12_4_ =
                   auVar101._12_4_ * fStack_a14 +
                   auVar133._12_4_ * fStack_a34 +
                   auVar190._12_4_ * fStack_a24 + auVar193._12_4_ * fStack_a44;
              local_980._0_16_ = auVar158;
              auVar190 = vsubps_avx(auVar97,auVar158);
              auVar193 = vdpps_avx(auVar190,auVar190,0x7f);
              fVar180 = auVar193._0_4_;
              if (fVar180 < 0.0) {
                local_940._0_4_ = fVar148;
                local_9e0._0_4_ = fVar122;
                local_760._0_4_ = fVar151 * -2.0;
                fVar202 = sqrtf(fVar180);
                fVar122 = (float)local_9e0._0_4_;
                fVar203 = (float)local_760._0_4_;
                fVar205 = (float)local_940._0_4_;
              }
              else {
                auVar133 = vsqrtss_avx(auVar193,auVar193);
                fVar202 = auVar133._0_4_;
                fVar203 = fVar151 * -2.0;
                fVar205 = fVar148;
              }
              auVar133 = ZEXT416((uint)((fVar201 * fVar201 + fVar201 * fVar203) * 0.5));
              auVar133 = vshufps_avx(auVar133,auVar133,0);
              auVar101 = ZEXT416((uint)(((fVar151 + fVar151) * (fVar205 + 2.0) +
                                        fVar151 * fVar151 * -3.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar93 = ZEXT416((uint)((fVar122 * (fVar201 + fVar201) + fVar201 * fVar205) * 0.5));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar94 = ZEXT416((uint)((fVar201 * (fVar151 + fVar151) - fVar151 * fVar151) * 0.5));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar357._0_4_ =
                   local_a20 * auVar94._0_4_ +
                   local_a40 * auVar93._0_4_ +
                   local_a50 * auVar133._0_4_ + local_a30 * auVar101._0_4_;
              auVar357._4_4_ =
                   fStack_a1c * auVar94._4_4_ +
                   fStack_a3c * auVar93._4_4_ +
                   fStack_a4c * auVar133._4_4_ + fStack_a2c * auVar101._4_4_;
              auVar357._8_4_ =
                   fStack_a18 * auVar94._8_4_ +
                   fStack_a38 * auVar93._8_4_ +
                   fStack_a48 * auVar133._8_4_ + fStack_a28 * auVar101._8_4_;
              auVar357._12_4_ =
                   fStack_a14 * auVar94._12_4_ +
                   fStack_a34 * auVar93._12_4_ +
                   fStack_a44 * auVar133._12_4_ + fStack_a24 * auVar101._12_4_;
              auVar94 = vpermilps_avx(ZEXT416((uint)(fVar148 + -1.0)),0);
              auVar123 = vpermilps_avx(ZEXT416((uint)(fVar201 * -9.0 + 4.0)),0);
              auVar133 = ZEXT416((uint)(fVar201 * 9.0 + -5.0));
              auVar133 = vshufps_avx(auVar133,auVar133,0);
              auVar101 = ZEXT416((uint)(fVar201 * -3.0 + 2.0));
              auVar93 = vshufps_avx(auVar101,auVar101,0);
              auVar101 = vdpps_avx(auVar357,auVar357,0x7f);
              auVar128._0_4_ =
                   local_a20 * auVar93._0_4_ +
                   local_a40 * auVar133._0_4_ +
                   local_a30 * auVar123._0_4_ + local_a50 * auVar94._0_4_;
              auVar128._4_4_ =
                   fStack_a1c * auVar93._4_4_ +
                   fStack_a3c * auVar133._4_4_ +
                   fStack_a2c * auVar123._4_4_ + fStack_a4c * auVar94._4_4_;
              auVar128._8_4_ =
                   fStack_a18 * auVar93._8_4_ +
                   fStack_a38 * auVar133._8_4_ +
                   fStack_a28 * auVar123._8_4_ + fStack_a48 * auVar94._8_4_;
              auVar128._12_4_ =
                   fStack_a14 * auVar93._12_4_ +
                   fStack_a34 * auVar133._12_4_ +
                   fStack_a24 * auVar123._12_4_ + fStack_a44 * auVar94._12_4_;
              auVar133 = vblendps_avx(auVar101,_DAT_01f7aa10,0xe);
              auVar93 = vrsqrtss_avx(auVar133,auVar133);
              fVar148 = auVar93._0_4_;
              fVar122 = auVar101._0_4_;
              auVar93 = vdpps_avx(auVar357,auVar128,0x7f);
              auVar94 = vshufps_avx(auVar101,auVar101,0);
              auVar129._0_4_ = auVar128._0_4_ * auVar94._0_4_;
              auVar129._4_4_ = auVar128._4_4_ * auVar94._4_4_;
              auVar129._8_4_ = auVar128._8_4_ * auVar94._8_4_;
              auVar129._12_4_ = auVar128._12_4_ * auVar94._12_4_;
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar209._0_4_ = auVar357._0_4_ * auVar93._0_4_;
              auVar209._4_4_ = auVar357._4_4_ * auVar93._4_4_;
              auVar209._8_4_ = auVar357._8_4_ * auVar93._8_4_;
              auVar209._12_4_ = auVar357._12_4_ * auVar93._12_4_;
              auVar123 = vsubps_avx(auVar129,auVar209);
              auVar93 = vrcpss_avx(auVar133,auVar133);
              auVar133 = vmaxss_avx(ZEXT416((uint)local_8e0),
                                    ZEXT416((uint)(auVar353._0_4_ * (float)local_740._0_4_)));
              auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar122 * auVar93._0_4_)));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              uVar83 = CONCAT44(auVar357._4_4_,auVar357._0_4_);
              auVar230._0_8_ = uVar83 ^ 0x8000000080000000;
              auVar230._8_4_ = -auVar357._8_4_;
              auVar230._12_4_ = -auVar357._12_4_;
              auVar94 = ZEXT416((uint)(fVar148 * 1.5 + fVar122 * -0.5 * fVar148 * fVar148 * fVar148)
                               );
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar185._0_4_ = auVar94._0_4_ * auVar123._0_4_ * auVar93._0_4_;
              auVar185._4_4_ = auVar94._4_4_ * auVar123._4_4_ * auVar93._4_4_;
              auVar185._8_4_ = auVar94._8_4_ * auVar123._8_4_ * auVar93._8_4_;
              auVar185._12_4_ = auVar94._12_4_ * auVar123._12_4_ * auVar93._12_4_;
              auVar251._0_4_ = auVar357._0_4_ * auVar94._0_4_;
              auVar251._4_4_ = auVar357._4_4_ * auVar94._4_4_;
              auVar251._8_4_ = auVar357._8_4_ * auVar94._8_4_;
              auVar251._12_4_ = auVar357._12_4_ * auVar94._12_4_;
              if (fVar122 < 0.0) {
                fVar122 = sqrtf(fVar122);
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar122 = auVar101._0_4_;
              }
              auVar101 = vdpps_avx(auVar190,auVar251,0x7f);
              fVar122 = (local_8e0 / fVar122) * (fVar202 + 1.0) +
                        auVar133._0_4_ + fVar202 * local_8e0;
              auVar93 = vdpps_avx(auVar230,auVar251,0x7f);
              auVar94 = vdpps_avx(auVar190,auVar185,0x7f);
              auVar123 = vdpps_avx(_local_910,auVar251,0x7f);
              auVar124 = vdpps_avx(auVar190,auVar230,0x7f);
              fVar148 = auVar93._0_4_ + auVar94._0_4_;
              fVar201 = auVar101._0_4_;
              auVar98._0_4_ = fVar201 * fVar201;
              auVar98._4_4_ = auVar101._4_4_ * auVar101._4_4_;
              auVar98._8_4_ = auVar101._8_4_ * auVar101._8_4_;
              auVar98._12_4_ = auVar101._12_4_ * auVar101._12_4_;
              auVar125 = vsubps_avx(auVar193,auVar98);
              auVar93 = vdpps_avx(auVar190,_local_910,0x7f);
              fVar202 = auVar124._0_4_ - fVar201 * fVar148;
              auVar94 = vrsqrtss_avx(auVar125,auVar125);
              fVar203 = auVar125._0_4_;
              fVar151 = auVar94._0_4_;
              fVar151 = fVar151 * 1.5 + fVar203 * -0.5 * fVar151 * fVar151 * fVar151;
              if (fVar203 < 0.0) {
                local_940._0_4_ = fVar202;
                local_9e0._0_4_ = fVar151;
                fVar203 = sqrtf(fVar203);
                fVar151 = (float)local_9e0._0_4_;
                fVar202 = (float)local_940._0_4_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar125,auVar125);
                fVar203 = auVar94._0_4_;
              }
              auVar361 = ZEXT1664(auVar101);
              auVar124 = vpermilps_avx(local_980._0_16_,0xff);
              auVar125 = vshufps_avx(auVar357,auVar357,0xff);
              fVar202 = fVar202 * fVar151 - auVar125._0_4_;
              fVar151 = (auVar93._0_4_ - fVar201 * auVar123._0_4_) * fVar151;
              auVar210._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
              auVar210._8_4_ = auVar123._8_4_ ^ 0x80000000;
              auVar210._12_4_ = auVar123._12_4_ ^ 0x80000000;
              auVar231._0_4_ = -fVar202;
              auVar231._4_4_ = 0x80000000;
              auVar231._8_4_ = 0x80000000;
              auVar231._12_4_ = 0x80000000;
              auVar93 = vinsertps_avx(auVar231,ZEXT416((uint)fVar151),0x1c);
              auVar123 = vmovsldup_avx(ZEXT416((uint)(fVar148 * fVar151 - auVar123._0_4_ * fVar202))
                                      );
              auVar93 = vdivps_avx(auVar93,auVar123);
              auVar94 = vinsertps_avx(ZEXT416((uint)fVar148),auVar210,0x10);
              auVar94 = vdivps_avx(auVar94,auVar123);
              auVar123 = vmovsldup_avx(auVar101);
              auVar103 = ZEXT416((uint)(fVar203 - auVar124._0_4_));
              auVar124 = vmovsldup_avx(auVar103);
              auVar159._0_4_ = auVar123._0_4_ * auVar93._0_4_ + auVar124._0_4_ * auVar94._0_4_;
              auVar159._4_4_ = auVar123._4_4_ * auVar93._4_4_ + auVar124._4_4_ * auVar94._4_4_;
              auVar159._8_4_ = auVar123._8_4_ * auVar93._8_4_ + auVar124._8_4_ * auVar94._8_4_;
              auVar159._12_4_ = auVar123._12_4_ * auVar93._12_4_ + auVar124._12_4_ * auVar94._12_4_;
              auVar93 = vsubps_avx(auVar92,auVar159);
              auVar353 = ZEXT1664(auVar93);
              auVar160._8_4_ = 0x7fffffff;
              auVar160._0_8_ = 0x7fffffff7fffffff;
              auVar160._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx(auVar101,auVar160);
              auVar409 = ZEXT3264(_local_960);
              if (auVar92._0_4_ < fVar122) {
                auVar186._8_4_ = 0x7fffffff;
                auVar186._0_8_ = 0x7fffffff7fffffff;
                auVar186._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx(auVar103,auVar186);
                if (auVar92._0_4_ <
                    (float)local_780._0_4_ * 1.9073486e-06 + auVar133._0_4_ + fVar122) {
                  fVar122 = auVar93._0_4_ + (float)local_870._0_4_;
                  if ((fVar120 <= fVar122) &&
                     (fVar148 = *(float *)(ray + k * 4 + 0x80), fVar122 <= fVar148)) {
                    auVar133 = vmovshdup_avx(auVar93);
                    fVar151 = auVar133._0_4_;
                    if ((0.0 <= fVar151) && (fVar151 <= 1.0)) {
                      auVar193 = vrsqrtss_avx(auVar193,auVar193);
                      fVar201 = auVar193._0_4_;
                      pGVar11 = (context->scene->geometries).items[uVar86].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar193 = ZEXT416((uint)(fVar201 * 1.5 +
                                                 fVar180 * -0.5 * fVar201 * fVar201 * fVar201));
                        auVar193 = vshufps_avx(auVar193,auVar193,0);
                        local_b80._0_4_ = auVar190._0_4_;
                        local_b80._4_4_ = auVar190._4_4_;
                        fStack_b78 = auVar190._8_4_;
                        fStack_b74 = auVar190._12_4_;
                        auVar187._0_4_ = auVar193._0_4_ * (float)local_b80._0_4_;
                        auVar187._4_4_ = auVar193._4_4_ * (float)local_b80._4_4_;
                        auVar187._8_4_ = auVar193._8_4_ * fStack_b78;
                        auVar187._12_4_ = auVar193._12_4_ * fStack_b74;
                        auVar130._0_4_ = auVar357._0_4_ + auVar125._0_4_ * auVar187._0_4_;
                        auVar130._4_4_ = auVar357._4_4_ + auVar125._4_4_ * auVar187._4_4_;
                        auVar130._8_4_ = auVar357._8_4_ + auVar125._8_4_ * auVar187._8_4_;
                        auVar130._12_4_ = auVar357._12_4_ + auVar125._12_4_ * auVar187._12_4_;
                        auVar193 = vshufps_avx(auVar187,auVar187,0xc9);
                        auVar190 = vshufps_avx(auVar357,auVar357,0xc9);
                        auVar188._0_4_ = auVar190._0_4_ * auVar187._0_4_;
                        auVar188._4_4_ = auVar190._4_4_ * auVar187._4_4_;
                        auVar188._8_4_ = auVar190._8_4_ * auVar187._8_4_;
                        auVar188._12_4_ = auVar190._12_4_ * auVar187._12_4_;
                        auVar211._0_4_ = auVar357._0_4_ * auVar193._0_4_;
                        auVar211._4_4_ = auVar357._4_4_ * auVar193._4_4_;
                        auVar211._8_4_ = auVar357._8_4_ * auVar193._8_4_;
                        auVar211._12_4_ = auVar357._12_4_ * auVar193._12_4_;
                        auVar133 = vsubps_avx(auVar211,auVar188);
                        auVar193 = vshufps_avx(auVar133,auVar133,0xc9);
                        auVar190 = vshufps_avx(auVar130,auVar130,0xc9);
                        auVar212._0_4_ = auVar190._0_4_ * auVar193._0_4_;
                        auVar212._4_4_ = auVar190._4_4_ * auVar193._4_4_;
                        auVar212._8_4_ = auVar190._8_4_ * auVar193._8_4_;
                        auVar212._12_4_ = auVar190._12_4_ * auVar193._12_4_;
                        auVar193 = vshufps_avx(auVar133,auVar133,0xd2);
                        auVar131._0_4_ = auVar130._0_4_ * auVar193._0_4_;
                        auVar131._4_4_ = auVar130._4_4_ * auVar193._4_4_;
                        auVar131._8_4_ = auVar130._8_4_ * auVar193._8_4_;
                        auVar131._12_4_ = auVar130._12_4_ * auVar193._12_4_;
                        auVar193 = vsubps_avx(auVar212,auVar131);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar122;
                          uVar8 = vextractps_avx(auVar193,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                          uVar8 = vextractps_avx(auVar193,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                          *(int *)(ray + k * 4 + 0xe0) = auVar193._0_4_;
                          *(float *)(ray + k * 4 + 0xf0) = fVar151;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                          *(uint *)(ray + k * 4 + 0x120) = uVar86;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_6d0 = vshufps_avx(auVar93,auVar93,0x55);
                          auVar190 = vshufps_avx(auVar193,auVar193,0x55);
                          auStack_6f0 = vshufps_avx(auVar193,auVar193,0xaa);
                          local_6e0 = vshufps_avx(auVar193,auVar193,0);
                          local_700 = (RTCHitN  [16])auVar190;
                          local_6c0 = ZEXT816(0) << 0x20;
                          local_6b0 = local_720._0_8_;
                          uStack_6a8 = local_720._8_8_;
                          local_6a0 = local_710._0_8_;
                          uStack_698 = local_710._8_8_;
                          uVar85 = context->user->instID[0];
                          _local_690 = CONCAT44(uVar85,uVar85);
                          _uStack_688 = CONCAT44(uVar85,uVar85);
                          uVar85 = context->user->instPrimID[0];
                          auVar132._4_4_ = uVar85;
                          auVar132._0_4_ = uVar85;
                          auVar132._8_4_ = uVar85;
                          auVar132._12_4_ = uVar85;
                          auStack_680 = auVar132;
                          *(float *)(ray + k * 4 + 0x80) = fVar122;
                          local_8a0._0_16_ = *local_988;
                          local_a10.valid = (int *)local_8a0;
                          local_a10.geometryUserPtr = pGVar11->userPtr;
                          local_a10.context = context->user;
                          local_a10.hit = local_700;
                          local_a10.N = 4;
                          auVar193 = *local_988;
                          local_a10.ray = (RTCRayN *)ray;
                          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar353 = ZEXT1664(auVar93);
                            auVar361 = ZEXT1664(auVar101);
                            (*pGVar11->intersectionFilterN)(&local_a10);
                            auVar313._8_56_ = extraout_var;
                            auVar313._0_8_ = extraout_XMM1_Qa;
                            auVar132 = auVar313._0_16_;
                            auVar409 = ZEXT3264(_local_960);
                            auVar193 = local_8a0._0_16_;
                          }
                          if (auVar193 == (undefined1  [16])0x0) {
                            auVar190 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar193 = vpcmpeqd_avx(auVar132,auVar132);
                            auVar190 = auVar190 ^ auVar193;
                          }
                          else {
                            p_Var15 = context->args->filter;
                            auVar133 = vpcmpeqd_avx(auVar190,auVar190);
                            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar353 = ZEXT1664(auVar353._0_16_);
                              auVar361 = ZEXT1664(auVar361._0_16_);
                              (*p_Var15)(&local_a10);
                              auVar133 = vpcmpeqd_avx(auVar133,auVar133);
                              auVar409 = ZEXT3264(_local_960);
                              auVar193 = local_8a0._0_16_;
                            }
                            auVar101 = vpcmpeqd_avx(auVar193,_DAT_01f7aa10);
                            auVar190 = auVar101 ^ auVar133;
                            if (auVar193 != (undefined1  [16])0x0) {
                              auVar101 = auVar101 ^ auVar133;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])local_a10.hit
                                                       );
                              *(undefined1 (*) [16])(local_a10.ray + 0xc0) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x10));
                              *(undefined1 (*) [16])(local_a10.ray + 0xd0) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x20));
                              *(undefined1 (*) [16])(local_a10.ray + 0xe0) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x30));
                              *(undefined1 (*) [16])(local_a10.ray + 0xf0) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x40));
                              *(undefined1 (*) [16])(local_a10.ray + 0x100) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x50));
                              *(undefined1 (*) [16])(local_a10.ray + 0x110) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x60));
                              *(undefined1 (*) [16])(local_a10.ray + 0x120) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x70));
                              *(undefined1 (*) [16])(local_a10.ray + 0x130) = auVar193;
                              auVar193 = vmaskmovps_avx(auVar101,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x80));
                              *(undefined1 (*) [16])(local_a10.ray + 0x140) = auVar193;
                            }
                          }
                          auVar99._8_8_ = 0x100000001;
                          auVar99._0_8_ = 0x100000001;
                          if ((auVar99 & auVar190) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar148;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar90 = lVar90 + -1;
            } while (lVar90 != 0);
            auVar107 = local_540;
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar113._4_4_ = uVar8;
            auVar113._0_4_ = uVar8;
            auVar113._8_4_ = uVar8;
            auVar113._12_4_ = uVar8;
            auVar113._16_4_ = uVar8;
            auVar113._20_4_ = uVar8;
            auVar113._24_4_ = uVar8;
            auVar113._28_4_ = uVar8;
            auVar106 = vcmpps_avx(_local_900,auVar113,2);
            local_540 = vandps_avx(auVar106,local_540);
            auVar313 = ZEXT3264(local_540);
            auVar107 = auVar107 & auVar106;
            auVar217 = local_7c0._0_28_;
          } while ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar107 >> 0x7f,0) != '\0') ||
                     (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar107 >> 0xbf,0) != '\0') ||
                   (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar107[0x1f] < '\0');
          auVar313 = ZEXT3264(local_320);
          fVar122 = (float)local_640._0_4_;
          fVar148 = (float)local_640._4_4_;
          fVar151 = fStack_638;
          fVar180 = fStack_634;
          fVar201 = fStack_630;
          fVar202 = fStack_62c;
          fVar203 = fStack_628;
          fVar205 = fStack_624;
        }
        auVar145._0_4_ =
             auVar217._0_4_ * (float)local_800._0_4_ +
             (float)local_7e0._0_4_ * (float)local_820._0_4_ +
             (float)local_7a0._0_4_ * (float)local_840._0_4_;
        auVar145._4_4_ =
             auVar217._4_4_ * (float)local_800._4_4_ +
             (float)local_7e0._4_4_ * (float)local_820._4_4_ +
             (float)local_7a0._4_4_ * (float)local_840._4_4_;
        auVar145._8_4_ =
             auVar217._8_4_ * fStack_7f8 + fStack_7d8 * fStack_818 + fStack_798 * fStack_838;
        auVar145._12_4_ =
             auVar217._12_4_ * fStack_7f4 + fStack_7d4 * fStack_814 + fStack_794 * fStack_834;
        auVar145._16_4_ =
             auVar217._16_4_ * fStack_7f0 + fStack_7d0 * fStack_810 + fStack_790 * fStack_830;
        auVar145._20_4_ =
             auVar217._20_4_ * fStack_7ec + fStack_7cc * fStack_80c + fStack_78c * fStack_82c;
        auVar145._24_4_ =
             auVar217._24_4_ * fStack_7e8 + fStack_7c8 * fStack_808 + fStack_788 * fStack_828;
        auVar145._28_4_ = fStack_7c4 + fStack_7c4 + auVar313._28_4_;
        auVar168._8_4_ = 0x7fffffff;
        auVar168._0_8_ = 0x7fffffff7fffffff;
        auVar168._12_4_ = 0x7fffffff;
        auVar168._16_4_ = 0x7fffffff;
        auVar168._20_4_ = 0x7fffffff;
        auVar168._24_4_ = 0x7fffffff;
        auVar168._28_4_ = 0x7fffffff;
        auVar106 = vandps_avx(auVar145,auVar168);
        auVar169._8_4_ = 0x3e99999a;
        auVar169._0_8_ = 0x3e99999a3e99999a;
        auVar169._12_4_ = 0x3e99999a;
        auVar169._16_4_ = 0x3e99999a;
        auVar169._20_4_ = 0x3e99999a;
        auVar169._24_4_ = 0x3e99999a;
        auVar169._28_4_ = 0x3e99999a;
        auVar106 = vcmpps_avx(auVar106,auVar169,1);
        auVar107 = vorps_avx(auVar106,local_5c0);
        auVar170._0_4_ = (float)local_9c0._0_4_ + fVar122;
        auVar170._4_4_ = (float)local_9c0._4_4_ + fVar148;
        auVar170._8_4_ = fStack_9b8 + fVar151;
        auVar170._12_4_ = fStack_9b4 + fVar180;
        auVar170._16_4_ = fStack_9b0 + fVar201;
        auVar170._20_4_ = fStack_9ac + fVar202;
        auVar170._24_4_ = fStack_9a8 + fVar203;
        auVar170._28_4_ = fStack_9a4 + fVar205;
        auVar106 = vcmpps_avx(auVar170,auVar113,2);
        _local_840 = vandps_avx(auVar106,local_5a0);
        auVar171._8_4_ = 3;
        auVar171._0_8_ = 0x300000003;
        auVar171._12_4_ = 3;
        auVar171._16_4_ = 3;
        auVar171._20_4_ = 3;
        auVar171._24_4_ = 3;
        auVar171._28_4_ = 3;
        auVar200._8_4_ = 2;
        auVar200._0_8_ = 0x200000002;
        auVar200._12_4_ = 2;
        auVar200._16_4_ = 2;
        auVar200._20_4_ = 2;
        auVar200._24_4_ = 2;
        auVar200._28_4_ = 2;
        auVar106 = vblendvps_avx(auVar200,auVar171,auVar107);
        auVar79._4_4_ = fStack_61c;
        auVar79._0_4_ = local_620;
        auVar79._8_4_ = fStack_618;
        auVar79._12_4_ = fStack_614;
        auVar193 = vpcmpgtd_avx(auVar106._16_16_,auVar79);
        auVar190 = vpshufd_avx(local_5e0._0_16_,0);
        auVar190 = vpcmpgtd_avx(auVar106._0_16_,auVar190);
        auVar172._16_16_ = auVar193;
        auVar172._0_16_ = auVar113._0_16_;
        _local_820 = vblendps_avx(ZEXT1632(auVar190),auVar172,0xf0);
        auVar106 = vandnps_avx(_local_820,_local_840);
        auVar107 = _local_840 & ~_local_820;
        local_8a0 = auVar106;
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          local_800._4_4_ = (float)local_9c0._4_4_ + local_320._4_4_;
          local_800._0_4_ = (float)local_9c0._0_4_ + local_320._0_4_;
          fStack_7f8 = fStack_9b8 + local_320._8_4_;
          fStack_7f4 = fStack_9b4 + local_320._12_4_;
          fStack_7f0 = fStack_9b0 + local_320._16_4_;
          fStack_7ec = fStack_9ac + local_320._20_4_;
          fStack_7e8 = fStack_9a8 + local_320._24_4_;
          fStack_7e4 = fStack_9a4 + local_320._28_4_;
          _local_900 = local_320;
          do {
            auVar115._8_4_ = 0x7f800000;
            auVar115._0_8_ = 0x7f8000007f800000;
            auVar115._12_4_ = 0x7f800000;
            auVar115._16_4_ = 0x7f800000;
            auVar115._20_4_ = 0x7f800000;
            auVar115._24_4_ = 0x7f800000;
            auVar115._28_4_ = 0x7f800000;
            auVar107 = vblendvps_avx(auVar115,_local_900,auVar106);
            auVar26 = vshufps_avx(auVar107,auVar107,0xb1);
            auVar26 = vminps_avx(auVar107,auVar26);
            auVar22 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar22 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar22);
            auVar26 = vcmpps_avx(auVar107,auVar26,0);
            auVar22 = auVar106 & auVar26;
            auVar107 = auVar106;
            if ((((((((auVar22 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar22 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar22 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar22 >> 0x7f,0) != '\0') ||
                  (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar22 >> 0xbf,0) != '\0') ||
                (auVar22 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar22[0x1f] < '\0') {
              auVar107 = vandps_avx(auVar26,auVar106);
            }
            uVar82 = vmovmskps_avx(auVar107);
            uVar85 = 0;
            if (uVar82 != 0) {
              for (; (uVar82 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
              }
            }
            uVar83 = (ulong)uVar85;
            local_8a0 = auVar106;
            *(undefined4 *)(local_8a0 + uVar83 * 4) = 0;
            fVar122 = local_1c0[uVar83];
            uVar85 = *(uint *)(local_300 + uVar83 * 4);
            fVar148 = auVar127._0_4_;
            if ((float)local_920._0_4_ < 0.0) {
              fVar148 = sqrtf((float)local_920._0_4_);
            }
            auVar190 = vminps_avx(auVar18,auVar20);
            auVar193 = vmaxps_avx(auVar18,auVar20);
            auVar133 = vminps_avx(auVar19,auVar21);
            auVar101 = vminps_avx(auVar190,auVar133);
            auVar190 = vmaxps_avx(auVar19,auVar21);
            auVar133 = vmaxps_avx(auVar193,auVar190);
            auVar189._8_4_ = 0x7fffffff;
            auVar189._0_8_ = 0x7fffffff7fffffff;
            auVar189._12_4_ = 0x7fffffff;
            auVar193 = vandps_avx(auVar101,auVar189);
            auVar190 = vandps_avx(auVar133,auVar189);
            auVar193 = vmaxps_avx(auVar193,auVar190);
            auVar190 = vmovshdup_avx(auVar193);
            auVar190 = vmaxss_avx(auVar190,auVar193);
            auVar193 = vshufpd_avx(auVar193,auVar193,1);
            auVar193 = vmaxss_avx(auVar193,auVar190);
            local_8e0 = auVar193._0_4_ * 1.9073486e-06;
            local_740._0_4_ = fVar148 * 1.9073486e-06;
            local_780._0_16_ = vshufps_avx(auVar133,auVar133,0xff);
            auVar193 = vinsertps_avx(ZEXT416(uVar85),ZEXT416((uint)fVar122),0x10);
            auVar353 = ZEXT1664(auVar193);
            lVar90 = 5;
            do {
              auVar92 = auVar353._0_16_;
              auVar193 = vshufps_avx(auVar92,auVar92,0);
              auVar100._0_4_ = auVar193._0_4_ * (float)local_910._0_4_ + 0.0;
              auVar100._4_4_ = auVar193._4_4_ * (float)local_910._4_4_ + 0.0;
              auVar100._8_4_ = auVar193._8_4_ * fStack_908 + 0.0;
              auVar100._12_4_ = auVar193._12_4_ * fStack_904 + 0.0;
              auVar193 = vmovshdup_avx(auVar92);
              fVar201 = auVar193._0_4_;
              fVar151 = 1.0 - fVar201;
              fVar148 = fVar201 * 3.0;
              fVar122 = fVar148 + -5.0;
              auVar193 = ZEXT416((uint)(fVar201 * fVar201 * -fVar151 * 0.5));
              auVar193 = vshufps_avx(auVar193,auVar193,0);
              auVar190 = ZEXT416((uint)((fVar151 * fVar151 * (fVar151 * 3.0 + -5.0) + 2.0) * 0.5));
              auVar190 = vshufps_avx(auVar190,auVar190,0);
              auVar133 = ZEXT416((uint)((fVar201 * fVar201 * fVar122 + 2.0) * 0.5));
              auVar133 = vshufps_avx(auVar133,auVar133,0);
              auVar101 = ZEXT416((uint)(fVar151 * fVar151 * -fVar201 * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar161._0_4_ =
                   auVar101._0_4_ * local_a20 +
                   auVar133._0_4_ * local_a40 +
                   auVar190._0_4_ * local_a30 + auVar193._0_4_ * local_a50;
              auVar161._4_4_ =
                   auVar101._4_4_ * fStack_a1c +
                   auVar133._4_4_ * fStack_a3c +
                   auVar190._4_4_ * fStack_a2c + auVar193._4_4_ * fStack_a4c;
              auVar161._8_4_ =
                   auVar101._8_4_ * fStack_a18 +
                   auVar133._8_4_ * fStack_a38 +
                   auVar190._8_4_ * fStack_a28 + auVar193._8_4_ * fStack_a48;
              auVar161._12_4_ =
                   auVar101._12_4_ * fStack_a14 +
                   auVar133._12_4_ * fStack_a34 +
                   auVar190._12_4_ * fStack_a24 + auVar193._12_4_ * fStack_a44;
              local_980._0_16_ = auVar161;
              auVar190 = vsubps_avx(auVar100,auVar161);
              auVar193 = vdpps_avx(auVar190,auVar190,0x7f);
              fVar180 = auVar193._0_4_;
              if (fVar180 < 0.0) {
                local_940._0_4_ = fVar148;
                local_9e0._0_4_ = fVar122;
                local_760._0_4_ = fVar151 * -2.0;
                fVar202 = sqrtf(fVar180);
                fVar122 = (float)local_9e0._0_4_;
                fVar203 = (float)local_760._0_4_;
                fVar205 = (float)local_940._0_4_;
              }
              else {
                auVar133 = vsqrtss_avx(auVar193,auVar193);
                fVar202 = auVar133._0_4_;
                fVar203 = fVar151 * -2.0;
                fVar205 = fVar148;
              }
              auVar133 = ZEXT416((uint)((fVar201 * fVar201 + fVar201 * fVar203) * 0.5));
              auVar133 = vshufps_avx(auVar133,auVar133,0);
              auVar101 = ZEXT416((uint)(((fVar151 + fVar151) * (fVar205 + 2.0) +
                                        fVar151 * fVar151 * -3.0) * 0.5));
              auVar101 = vshufps_avx(auVar101,auVar101,0);
              auVar93 = ZEXT416((uint)((fVar122 * (fVar201 + fVar201) + fVar201 * fVar205) * 0.5));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar94 = ZEXT416((uint)((fVar201 * (fVar151 + fVar151) - fVar151 * fVar151) * 0.5));
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar358._0_4_ =
                   local_a20 * auVar94._0_4_ +
                   local_a40 * auVar93._0_4_ +
                   local_a50 * auVar133._0_4_ + local_a30 * auVar101._0_4_;
              auVar358._4_4_ =
                   fStack_a1c * auVar94._4_4_ +
                   fStack_a3c * auVar93._4_4_ +
                   fStack_a4c * auVar133._4_4_ + fStack_a2c * auVar101._4_4_;
              auVar358._8_4_ =
                   fStack_a18 * auVar94._8_4_ +
                   fStack_a38 * auVar93._8_4_ +
                   fStack_a48 * auVar133._8_4_ + fStack_a28 * auVar101._8_4_;
              auVar358._12_4_ =
                   fStack_a14 * auVar94._12_4_ +
                   fStack_a34 * auVar93._12_4_ +
                   fStack_a44 * auVar133._12_4_ + fStack_a24 * auVar101._12_4_;
              auVar94 = vpermilps_avx(ZEXT416((uint)(fVar148 + -1.0)),0);
              auVar123 = vpermilps_avx(ZEXT416((uint)(fVar201 * -9.0 + 4.0)),0);
              auVar133 = ZEXT416((uint)(fVar201 * 9.0 + -5.0));
              auVar133 = vshufps_avx(auVar133,auVar133,0);
              auVar101 = ZEXT416((uint)(fVar201 * -3.0 + 2.0));
              auVar93 = vshufps_avx(auVar101,auVar101,0);
              auVar101 = vdpps_avx(auVar358,auVar358,0x7f);
              auVar134._0_4_ =
                   local_a20 * auVar93._0_4_ +
                   local_a40 * auVar133._0_4_ +
                   local_a30 * auVar123._0_4_ + local_a50 * auVar94._0_4_;
              auVar134._4_4_ =
                   fStack_a1c * auVar93._4_4_ +
                   fStack_a3c * auVar133._4_4_ +
                   fStack_a2c * auVar123._4_4_ + fStack_a4c * auVar94._4_4_;
              auVar134._8_4_ =
                   fStack_a18 * auVar93._8_4_ +
                   fStack_a38 * auVar133._8_4_ +
                   fStack_a28 * auVar123._8_4_ + fStack_a48 * auVar94._8_4_;
              auVar134._12_4_ =
                   fStack_a14 * auVar93._12_4_ +
                   fStack_a34 * auVar133._12_4_ +
                   fStack_a24 * auVar123._12_4_ + fStack_a44 * auVar94._12_4_;
              auVar133 = vblendps_avx(auVar101,_DAT_01f7aa10,0xe);
              auVar93 = vrsqrtss_avx(auVar133,auVar133);
              fVar148 = auVar93._0_4_;
              fVar122 = auVar101._0_4_;
              auVar93 = vdpps_avx(auVar358,auVar134,0x7f);
              auVar94 = vshufps_avx(auVar101,auVar101,0);
              auVar135._0_4_ = auVar134._0_4_ * auVar94._0_4_;
              auVar135._4_4_ = auVar134._4_4_ * auVar94._4_4_;
              auVar135._8_4_ = auVar134._8_4_ * auVar94._8_4_;
              auVar135._12_4_ = auVar134._12_4_ * auVar94._12_4_;
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              auVar213._0_4_ = auVar358._0_4_ * auVar93._0_4_;
              auVar213._4_4_ = auVar358._4_4_ * auVar93._4_4_;
              auVar213._8_4_ = auVar358._8_4_ * auVar93._8_4_;
              auVar213._12_4_ = auVar358._12_4_ * auVar93._12_4_;
              auVar123 = vsubps_avx(auVar135,auVar213);
              auVar93 = vrcpss_avx(auVar133,auVar133);
              auVar133 = vmaxss_avx(ZEXT416((uint)local_8e0),
                                    ZEXT416((uint)(auVar353._0_4_ * (float)local_740._0_4_)));
              auVar93 = ZEXT416((uint)(auVar93._0_4_ * (2.0 - fVar122 * auVar93._0_4_)));
              auVar93 = vshufps_avx(auVar93,auVar93,0);
              uVar83 = CONCAT44(auVar358._4_4_,auVar358._0_4_);
              auVar232._0_8_ = uVar83 ^ 0x8000000080000000;
              auVar232._8_4_ = -auVar358._8_4_;
              auVar232._12_4_ = -auVar358._12_4_;
              auVar94 = ZEXT416((uint)(fVar148 * 1.5 + fVar122 * -0.5 * fVar148 * fVar148 * fVar148)
                               );
              auVar94 = vshufps_avx(auVar94,auVar94,0);
              auVar191._0_4_ = auVar94._0_4_ * auVar123._0_4_ * auVar93._0_4_;
              auVar191._4_4_ = auVar94._4_4_ * auVar123._4_4_ * auVar93._4_4_;
              auVar191._8_4_ = auVar94._8_4_ * auVar123._8_4_ * auVar93._8_4_;
              auVar191._12_4_ = auVar94._12_4_ * auVar123._12_4_ * auVar93._12_4_;
              auVar252._0_4_ = auVar358._0_4_ * auVar94._0_4_;
              auVar252._4_4_ = auVar358._4_4_ * auVar94._4_4_;
              auVar252._8_4_ = auVar358._8_4_ * auVar94._8_4_;
              auVar252._12_4_ = auVar358._12_4_ * auVar94._12_4_;
              if (fVar122 < 0.0) {
                fVar122 = sqrtf(fVar122);
              }
              else {
                auVar101 = vsqrtss_avx(auVar101,auVar101);
                fVar122 = auVar101._0_4_;
              }
              auVar101 = vdpps_avx(auVar190,auVar252,0x7f);
              fVar122 = (local_8e0 / fVar122) * (fVar202 + 1.0) +
                        auVar133._0_4_ + fVar202 * local_8e0;
              auVar93 = vdpps_avx(auVar232,auVar252,0x7f);
              auVar94 = vdpps_avx(auVar190,auVar191,0x7f);
              auVar123 = vdpps_avx(_local_910,auVar252,0x7f);
              auVar124 = vdpps_avx(auVar190,auVar232,0x7f);
              fVar148 = auVar93._0_4_ + auVar94._0_4_;
              fVar201 = auVar101._0_4_;
              auVar102._0_4_ = fVar201 * fVar201;
              auVar102._4_4_ = auVar101._4_4_ * auVar101._4_4_;
              auVar102._8_4_ = auVar101._8_4_ * auVar101._8_4_;
              auVar102._12_4_ = auVar101._12_4_ * auVar101._12_4_;
              auVar125 = vsubps_avx(auVar193,auVar102);
              auVar93 = vdpps_avx(auVar190,_local_910,0x7f);
              fVar202 = auVar124._0_4_ - fVar201 * fVar148;
              auVar94 = vrsqrtss_avx(auVar125,auVar125);
              fVar203 = auVar125._0_4_;
              fVar151 = auVar94._0_4_;
              fVar151 = fVar151 * 1.5 + fVar203 * -0.5 * fVar151 * fVar151 * fVar151;
              if (fVar203 < 0.0) {
                local_940._0_4_ = fVar202;
                local_9e0._0_4_ = fVar151;
                fVar203 = sqrtf(fVar203);
                fVar151 = (float)local_9e0._0_4_;
                fVar202 = (float)local_940._0_4_;
              }
              else {
                auVar94 = vsqrtss_avx(auVar125,auVar125);
                fVar203 = auVar94._0_4_;
              }
              auVar361 = ZEXT1664(auVar101);
              auVar124 = vpermilps_avx(local_980._0_16_,0xff);
              auVar125 = vshufps_avx(auVar358,auVar358,0xff);
              fVar202 = fVar202 * fVar151 - auVar125._0_4_;
              fVar151 = (auVar93._0_4_ - fVar201 * auVar123._0_4_) * fVar151;
              auVar214._0_8_ = auVar123._0_8_ ^ 0x8000000080000000;
              auVar214._8_4_ = auVar123._8_4_ ^ 0x80000000;
              auVar214._12_4_ = auVar123._12_4_ ^ 0x80000000;
              auVar233._0_4_ = -fVar202;
              auVar233._4_4_ = 0x80000000;
              auVar233._8_4_ = 0x80000000;
              auVar233._12_4_ = 0x80000000;
              auVar93 = vinsertps_avx(auVar233,ZEXT416((uint)fVar151),0x1c);
              auVar123 = vmovsldup_avx(ZEXT416((uint)(fVar148 * fVar151 - auVar123._0_4_ * fVar202))
                                      );
              auVar93 = vdivps_avx(auVar93,auVar123);
              auVar94 = vinsertps_avx(ZEXT416((uint)fVar148),auVar214,0x10);
              auVar94 = vdivps_avx(auVar94,auVar123);
              auVar123 = vmovsldup_avx(auVar101);
              auVar103 = ZEXT416((uint)(fVar203 - auVar124._0_4_));
              auVar124 = vmovsldup_avx(auVar103);
              auVar162._0_4_ = auVar123._0_4_ * auVar93._0_4_ + auVar124._0_4_ * auVar94._0_4_;
              auVar162._4_4_ = auVar123._4_4_ * auVar93._4_4_ + auVar124._4_4_ * auVar94._4_4_;
              auVar162._8_4_ = auVar123._8_4_ * auVar93._8_4_ + auVar124._8_4_ * auVar94._8_4_;
              auVar162._12_4_ = auVar123._12_4_ * auVar93._12_4_ + auVar124._12_4_ * auVar94._12_4_;
              auVar93 = vsubps_avx(auVar92,auVar162);
              auVar353 = ZEXT1664(auVar93);
              auVar163._8_4_ = 0x7fffffff;
              auVar163._0_8_ = 0x7fffffff7fffffff;
              auVar163._12_4_ = 0x7fffffff;
              auVar92 = vandps_avx(auVar101,auVar163);
              auVar409 = ZEXT3264(_local_960);
              if (auVar92._0_4_ < fVar122) {
                auVar192._8_4_ = 0x7fffffff;
                auVar192._0_8_ = 0x7fffffff7fffffff;
                auVar192._12_4_ = 0x7fffffff;
                auVar92 = vandps_avx(auVar103,auVar192);
                if (auVar92._0_4_ <
                    (float)local_780._0_4_ * 1.9073486e-06 + auVar133._0_4_ + fVar122) {
                  fVar122 = auVar93._0_4_ + (float)local_870._0_4_;
                  if ((fVar120 <= fVar122) &&
                     (fVar148 = *(float *)(ray + k * 4 + 0x80), fVar122 <= fVar148)) {
                    auVar133 = vmovshdup_avx(auVar93);
                    fVar151 = auVar133._0_4_;
                    if ((0.0 <= fVar151) && (fVar151 <= 1.0)) {
                      auVar193 = vrsqrtss_avx(auVar193,auVar193);
                      fVar201 = auVar193._0_4_;
                      pGVar11 = (context->scene->geometries).items[uVar86].ptr;
                      if ((pGVar11->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                        auVar193 = ZEXT416((uint)(fVar201 * 1.5 +
                                                 fVar180 * -0.5 * fVar201 * fVar201 * fVar201));
                        auVar193 = vshufps_avx(auVar193,auVar193,0);
                        local_b80._0_4_ = auVar190._0_4_;
                        local_b80._4_4_ = auVar190._4_4_;
                        fStack_b78 = auVar190._8_4_;
                        fStack_b74 = auVar190._12_4_;
                        auVar194._0_4_ = auVar193._0_4_ * (float)local_b80._0_4_;
                        auVar194._4_4_ = auVar193._4_4_ * (float)local_b80._4_4_;
                        auVar194._8_4_ = auVar193._8_4_ * fStack_b78;
                        auVar194._12_4_ = auVar193._12_4_ * fStack_b74;
                        auVar136._0_4_ = auVar358._0_4_ + auVar125._0_4_ * auVar194._0_4_;
                        auVar136._4_4_ = auVar358._4_4_ + auVar125._4_4_ * auVar194._4_4_;
                        auVar136._8_4_ = auVar358._8_4_ + auVar125._8_4_ * auVar194._8_4_;
                        auVar136._12_4_ = auVar358._12_4_ + auVar125._12_4_ * auVar194._12_4_;
                        auVar193 = vshufps_avx(auVar194,auVar194,0xc9);
                        auVar190 = vshufps_avx(auVar358,auVar358,0xc9);
                        auVar195._0_4_ = auVar190._0_4_ * auVar194._0_4_;
                        auVar195._4_4_ = auVar190._4_4_ * auVar194._4_4_;
                        auVar195._8_4_ = auVar190._8_4_ * auVar194._8_4_;
                        auVar195._12_4_ = auVar190._12_4_ * auVar194._12_4_;
                        auVar215._0_4_ = auVar358._0_4_ * auVar193._0_4_;
                        auVar215._4_4_ = auVar358._4_4_ * auVar193._4_4_;
                        auVar215._8_4_ = auVar358._8_4_ * auVar193._8_4_;
                        auVar215._12_4_ = auVar358._12_4_ * auVar193._12_4_;
                        auVar133 = vsubps_avx(auVar215,auVar195);
                        auVar193 = vshufps_avx(auVar133,auVar133,0xc9);
                        auVar190 = vshufps_avx(auVar136,auVar136,0xc9);
                        auVar216._0_4_ = auVar190._0_4_ * auVar193._0_4_;
                        auVar216._4_4_ = auVar190._4_4_ * auVar193._4_4_;
                        auVar216._8_4_ = auVar190._8_4_ * auVar193._8_4_;
                        auVar216._12_4_ = auVar190._12_4_ * auVar193._12_4_;
                        auVar193 = vshufps_avx(auVar133,auVar133,0xd2);
                        auVar137._0_4_ = auVar136._0_4_ * auVar193._0_4_;
                        auVar137._4_4_ = auVar136._4_4_ * auVar193._4_4_;
                        auVar137._8_4_ = auVar136._8_4_ * auVar193._8_4_;
                        auVar137._12_4_ = auVar136._12_4_ * auVar193._12_4_;
                        auVar193 = vsubps_avx(auVar216,auVar137);
                        if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                           (pGVar11->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                          *(float *)(ray + k * 4 + 0x80) = fVar122;
                          uVar8 = vextractps_avx(auVar193,1);
                          *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                          uVar8 = vextractps_avx(auVar193,2);
                          *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                          *(int *)(ray + k * 4 + 0xe0) = auVar193._0_4_;
                          *(float *)(ray + k * 4 + 0xf0) = fVar151;
                          *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                          *(int *)(ray + k * 4 + 0x110) = (int)local_8c0;
                          *(uint *)(ray + k * 4 + 0x120) = uVar86;
                          *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                          *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                        }
                        else {
                          local_6d0 = vshufps_avx(auVar93,auVar93,0x55);
                          auVar190 = vshufps_avx(auVar193,auVar193,0x55);
                          auStack_6f0 = vshufps_avx(auVar193,auVar193,0xaa);
                          local_6e0 = vshufps_avx(auVar193,auVar193,0);
                          local_700 = (RTCHitN  [16])auVar190;
                          local_6c0 = ZEXT816(0) << 0x20;
                          local_6b0 = local_720._0_8_;
                          uStack_6a8 = local_720._8_8_;
                          local_6a0 = local_710._0_8_;
                          uStack_698 = local_710._8_8_;
                          uVar85 = context->user->instID[0];
                          _local_690 = CONCAT44(uVar85,uVar85);
                          _uStack_688 = CONCAT44(uVar85,uVar85);
                          uVar85 = context->user->instPrimID[0];
                          auVar138._4_4_ = uVar85;
                          auVar138._0_4_ = uVar85;
                          auVar138._8_4_ = uVar85;
                          auVar138._12_4_ = uVar85;
                          auStack_680 = auVar138;
                          *(float *)(ray + k * 4 + 0x80) = fVar122;
                          local_860 = *local_988;
                          local_a10.valid = (int *)local_860;
                          local_a10.geometryUserPtr = pGVar11->userPtr;
                          local_a10.context = context->user;
                          local_a10.hit = local_700;
                          local_a10.N = 4;
                          local_a10.ray = (RTCRayN *)ray;
                          if (pGVar11->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                            auVar353 = ZEXT1664(auVar93);
                            auVar361 = ZEXT1664(auVar101);
                            (*pGVar11->intersectionFilterN)(&local_a10);
                            auVar409._8_56_ = extraout_var_00;
                            auVar409._0_8_ = extraout_XMM1_Qa_00;
                            auVar138 = auVar409._0_16_;
                            auVar409 = ZEXT3264(_local_960);
                          }
                          if (local_860 == (undefined1  [16])0x0) {
                            auVar193 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                            auVar190 = vpcmpeqd_avx(auVar138,auVar138);
                            auVar193 = auVar193 ^ auVar190;
                          }
                          else {
                            p_Var15 = context->args->filter;
                            auVar190 = vpcmpeqd_avx(auVar190,auVar190);
                            if ((p_Var15 != (RTCFilterFunctionN)0x0) &&
                               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                (((pGVar11->field_8).field_0x2 & 0x40) != 0)))) {
                              auVar353 = ZEXT1664(auVar353._0_16_);
                              auVar361 = ZEXT1664(auVar361._0_16_);
                              (*p_Var15)(&local_a10);
                              auVar190 = vpcmpeqd_avx(auVar190,auVar190);
                              auVar409 = ZEXT3264(_local_960);
                            }
                            auVar133 = vpcmpeqd_avx(local_860,_DAT_01f7aa10);
                            auVar193 = auVar133 ^ auVar190;
                            if (local_860 != (undefined1  [16])0x0) {
                              auVar133 = auVar133 ^ auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])local_a10.hit
                                                       );
                              *(undefined1 (*) [16])(local_a10.ray + 0xc0) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x10));
                              *(undefined1 (*) [16])(local_a10.ray + 0xd0) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x20));
                              *(undefined1 (*) [16])(local_a10.ray + 0xe0) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x30));
                              *(undefined1 (*) [16])(local_a10.ray + 0xf0) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x40));
                              *(undefined1 (*) [16])(local_a10.ray + 0x100) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x50));
                              *(undefined1 (*) [16])(local_a10.ray + 0x110) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x60));
                              *(undefined1 (*) [16])(local_a10.ray + 0x120) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x70));
                              *(undefined1 (*) [16])(local_a10.ray + 0x130) = auVar190;
                              auVar190 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                                  (local_a10.hit + 0x80));
                              *(undefined1 (*) [16])(local_a10.ray + 0x140) = auVar190;
                            }
                          }
                          auVar104._8_8_ = 0x100000001;
                          auVar104._0_8_ = 0x100000001;
                          if ((auVar104 & auVar193) == (undefined1  [16])0x0) {
                            *(float *)(ray + k * 4 + 0x80) = fVar148;
                          }
                        }
                      }
                    }
                  }
                  break;
                }
              }
              lVar90 = lVar90 + -1;
            } while (lVar90 != 0);
            uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar113._4_4_ = uVar8;
            auVar113._0_4_ = uVar8;
            auVar113._8_4_ = uVar8;
            auVar113._12_4_ = uVar8;
            auVar113._16_4_ = uVar8;
            auVar113._20_4_ = uVar8;
            auVar113._24_4_ = uVar8;
            auVar113._28_4_ = uVar8;
            auVar107 = vcmpps_avx(_local_800,auVar113,2);
            auVar106 = vandps_avx(auVar107,local_8a0);
            auVar107 = local_8a0 & auVar107;
          } while ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar107 >> 0x7f,0) != '\0') ||
                     (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar107 >> 0xbf,0) != '\0') ||
                   (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar107[0x1f] < '\0');
          local_8a0 = auVar106;
        }
        auVar313 = ZEXT3264(local_320);
        auVar106 = vandps_avx(_local_580,local_560);
        auVar107 = vandps_avx(_local_840,_local_820);
        auVar221._0_4_ = (float)local_9c0._0_4_ + local_360._0_4_;
        auVar221._4_4_ = (float)local_9c0._4_4_ + local_360._4_4_;
        auVar221._8_4_ = fStack_9b8 + local_360._8_4_;
        auVar221._12_4_ = fStack_9b4 + local_360._12_4_;
        auVar221._16_4_ = fStack_9b0 + local_360._16_4_;
        auVar221._20_4_ = fStack_9ac + local_360._20_4_;
        auVar221._24_4_ = fStack_9a8 + local_360._24_4_;
        auVar221._28_4_ = fStack_9a4 + local_360._28_4_;
        auVar26 = vcmpps_avx(auVar221,auVar113,2);
        auVar106 = vandps_avx(auVar26,auVar106);
        auVar222._0_4_ = local_320._0_4_ + (float)local_9c0._0_4_;
        auVar222._4_4_ = local_320._4_4_ + (float)local_9c0._4_4_;
        auVar222._8_4_ = local_320._8_4_ + fStack_9b8;
        auVar222._12_4_ = local_320._12_4_ + fStack_9b4;
        auVar222._16_4_ = local_320._16_4_ + fStack_9b0;
        auVar222._20_4_ = local_320._20_4_ + fStack_9ac;
        auVar222._24_4_ = local_320._24_4_ + fStack_9a8;
        auVar222._28_4_ = local_320._28_4_ + fStack_9a4;
        auVar26 = vcmpps_avx(auVar222,auVar113,2);
        auVar107 = vandps_avx(auVar26,auVar107);
        auVar107 = vorps_avx(auVar106,auVar107);
        if ((((((((auVar107 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar107 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar107 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar107 >> 0x7f,0) != '\0') ||
              (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar107 >> 0xbf,0) != '\0') ||
            (auVar107 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar107[0x1f] < '\0') {
          uVar83 = (ulong)uVar88;
          *(undefined1 (*) [32])(auStack_180 + uVar83 * 0x60) = auVar107;
          auVar106 = vblendvps_avx(local_320,_local_360,auVar106);
          *(undefined1 (*) [32])(auStack_160 + uVar83 * 0x60) = auVar106;
          uVar9 = vmovlps_avx(local_4f0);
          (&uStack_140)[uVar83 * 0xc] = uVar9;
          aiStack_138[uVar83 * 0x18] = local_c28 + 1;
          uVar88 = uVar88 + 1;
        }
        goto LAB_00f965b2;
      }
    }
    if (uVar88 == 0) break;
    uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
    auVar110._4_4_ = uVar8;
    auVar110._0_4_ = uVar8;
    auVar110._8_4_ = uVar8;
    auVar110._12_4_ = uVar8;
    auVar110._16_4_ = uVar8;
    auVar110._20_4_ = uVar8;
    auVar110._24_4_ = uVar8;
    auVar110._28_4_ = uVar8;
    uVar85 = -uVar88;
    pauVar84 = (undefined1 (*) [32])(auStack_180 + (ulong)(uVar88 - 1) * 0x60);
    fVar122 = (float)local_9c0._0_4_;
    fVar148 = (float)local_9c0._4_4_;
    fVar151 = fStack_9b8;
    fVar180 = fStack_9b4;
    fVar201 = fStack_9b0;
    fVar202 = fStack_9ac;
    fVar203 = fStack_9a8;
    fVar205 = fStack_9a4;
    while( true ) {
      auVar106 = pauVar84[1];
      auVar139._0_4_ = fVar122 + auVar106._0_4_;
      auVar139._4_4_ = fVar148 + auVar106._4_4_;
      auVar139._8_4_ = fVar151 + auVar106._8_4_;
      auVar139._12_4_ = fVar180 + auVar106._12_4_;
      auVar139._16_4_ = fVar201 + auVar106._16_4_;
      auVar139._20_4_ = fVar202 + auVar106._20_4_;
      auVar139._24_4_ = fVar203 + auVar106._24_4_;
      auVar139._28_4_ = fVar205 + auVar106._28_4_;
      auVar26 = vcmpps_avx(auVar139,auVar110,2);
      auVar107 = vandps_avx(auVar26,*pauVar84);
      _local_700 = auVar107;
      auVar26 = *pauVar84 & auVar26;
      if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar26 >> 0x7f,0) != '\0') ||
            (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0xbf,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar26[0x1f] < '\0') break;
      pauVar84 = pauVar84 + -3;
      uVar85 = uVar85 + 1;
      fVar122 = (float)local_9c0._0_4_;
      fVar148 = (float)local_9c0._4_4_;
      fVar151 = fStack_9b8;
      fVar180 = fStack_9b4;
      fVar201 = fStack_9b0;
      fVar202 = fStack_9ac;
      fVar203 = fStack_9a8;
      fVar205 = fStack_9a4;
      if (uVar85 == 0) goto LAB_00f986e4;
    }
    auVar111._8_4_ = 0x7f800000;
    auVar111._0_8_ = 0x7f8000007f800000;
    auVar111._12_4_ = 0x7f800000;
    auVar111._16_4_ = 0x7f800000;
    auVar111._20_4_ = 0x7f800000;
    auVar111._24_4_ = 0x7f800000;
    auVar111._28_4_ = 0x7f800000;
    auVar106 = vblendvps_avx(auVar111,auVar106,auVar107);
    auVar26 = vshufps_avx(auVar106,auVar106,0xb1);
    auVar26 = vminps_avx(auVar106,auVar26);
    auVar22 = vshufpd_avx(auVar26,auVar26,5);
    auVar26 = vminps_avx(auVar26,auVar22);
    auVar22 = vperm2f128_avx(auVar26,auVar26,1);
    auVar26 = vminps_avx(auVar26,auVar22);
    auVar106 = vcmpps_avx(auVar106,auVar26,0);
    auVar26 = auVar107 & auVar106;
    if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar26 >> 0x7f,0) != '\0') ||
          (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar26 >> 0xbf,0) != '\0') ||
        (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar26[0x1f] < '\0')
    {
      auVar107 = vandps_avx(auVar106,auVar107);
    }
    auVar96._8_8_ = 0;
    auVar96._0_8_ = *(ulong *)pauVar84[2];
    local_c28 = *(uint *)(pauVar84[2] + 8);
    uVar88 = vmovmskps_avx(auVar107);
    uVar82 = 0;
    if (uVar88 != 0) {
      for (; (uVar88 >> uVar82 & 1) == 0; uVar82 = uVar82 + 1) {
      }
    }
    *(undefined4 *)(local_700 + (ulong)uVar82 * 4) = 0;
    *pauVar84 = _local_700;
    uVar88 = ~uVar85;
    if ((((((((_local_700 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_700 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_700 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_700 >> 0x7f,0) != '\0') ||
          (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_700 >> 0xbf,0) != '\0') ||
        (_local_700 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_700[0x1f] < '\0') {
      uVar88 = -uVar85;
    }
    auVar193 = vshufps_avx(auVar96,auVar96,0);
    auVar190 = vshufps_avx(auVar96,auVar96,0x55);
    auVar190 = vsubps_avx(auVar190,auVar193);
    local_360._4_4_ = auVar193._4_4_ + auVar190._4_4_ * 0.14285715;
    local_360._0_4_ = auVar193._0_4_ + auVar190._0_4_ * 0.0;
    fStack_358 = auVar193._8_4_ + auVar190._8_4_ * 0.2857143;
    fStack_354 = auVar193._12_4_ + auVar190._12_4_ * 0.42857146;
    fStack_350 = auVar193._0_4_ + auVar190._0_4_ * 0.5714286;
    fStack_34c = auVar193._4_4_ + auVar190._4_4_ * 0.71428573;
    fStack_348 = auVar193._8_4_ + auVar190._8_4_ * 0.8571429;
    fStack_344 = auVar193._12_4_ + auVar190._12_4_;
    local_4f0._8_8_ = 0;
    local_4f0._0_8_ = *(ulong *)(local_360 + (ulong)uVar82 * 4);
  } while( true );
LAB_00f986e4:
  uVar8 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar105._4_4_ = uVar8;
  auVar105._0_4_ = uVar8;
  auVar105._8_4_ = uVar8;
  auVar105._12_4_ = uVar8;
  auVar248 = vcmpps_avx(local_500,auVar105,2);
  uVar86 = vmovmskps_avx(auVar248);
  uVar81 = uVar81 - 1 & uVar81 & uVar86;
  if (uVar81 == 0) {
    return;
  }
  goto LAB_00f9576f;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }